

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_16_0_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  ushort *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  short sVar20;
  short sVar21;
  ulong uVar22;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar41;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar58;
  short sVar59;
  ushort uVar60;
  ushort uVar81;
  ushort uVar83;
  ushort uVar85;
  ushort uVar87;
  ushort uVar89;
  ushort uVar91;
  undefined1 in_XMM2 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar92;
  ushort uVar94;
  ushort uVar95;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ushort uVar127;
  ushort uVar134;
  ushort uVar141;
  ushort uVar148;
  undefined1 in_XMM3 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ushort uVar128;
  ushort uVar135;
  ushort uVar142;
  ushort uVar149;
  ushort uVar155;
  ushort uVar156;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  short sVar160;
  ushort uVar161;
  short sVar181;
  short sVar185;
  short sVar189;
  short sVar194;
  short sVar199;
  ushort uVar202;
  short sVar205;
  ushort uVar208;
  undefined1 in_XMM4 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  short sVar211;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  short sVar190;
  short sVar195;
  short sVar200;
  short sVar206;
  short sVar212;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  ushort uVar182;
  ushort uVar186;
  ushort uVar191;
  ushort uVar196;
  ushort uVar201;
  ushort uVar207;
  ushort uVar213;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  ushort uVar214;
  ushort uVar215;
  ushort uVar220;
  ushort uVar244;
  ushort uVar250;
  ushort uVar258;
  ushort uVar266;
  ushort uVar274;
  ushort uVar283;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  ushort uVar216;
  ushort uVar245;
  ushort uVar251;
  ushort uVar259;
  ushort uVar267;
  ushort uVar275;
  ushort uVar284;
  ushort uVar291;
  ushort uVar292;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  ushort uVar249;
  ushort uVar257;
  ushort uVar265;
  ushort uVar273;
  ushort uVar281;
  ushort uVar282;
  ushort uVar290;
  ushort uVar298;
  ushort uVar299;
  undefined1 auVar243 [16];
  ushort uVar326;
  ushort uVar331;
  ushort uVar336;
  ushort uVar341;
  ushort uVar346;
  ushort uVar347;
  undefined1 in_XMM6 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  ushort uVar352;
  ushort uVar353;
  undefined1 in_XMM7 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  ushort uVar364;
  ushort uVar369;
  ushort uVar388;
  ushort uVar393;
  ushort uVar395;
  ushort uVar401;
  ushort uVar407;
  ushort uVar412;
  ushort uVar414;
  ushort uVar419;
  ushort uVar421;
  ushort uVar426;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  ushort uVar365;
  ushort uVar389;
  ushort uVar396;
  ushort uVar402;
  ushort uVar408;
  ushort uVar415;
  ushort uVar422;
  ushort uVar428;
  ushort uVar429;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  ushort uVar433;
  ushort uVar435;
  ushort uVar445;
  ushort uVar447;
  ushort uVar449;
  ushort uVar451;
  ushort uVar453;
  ushort uVar455;
  undefined1 in_XMM9 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  ushort uVar457;
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  ushort uVar458;
  ushort uVar469;
  ushort uVar471;
  ushort uVar473;
  ushort uVar474;
  ushort uVar476;
  ushort uVar477;
  ushort uVar479;
  ushort uVar481;
  undefined1 auVar460 [16];
  ushort uVar483;
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  ushort uVar486;
  ushort uVar487;
  ushort uVar488;
  ushort uVar489;
  ushort uVar490;
  ushort uVar491;
  undefined1 auVar485 [16];
  short sVar493;
  short sVar494;
  short sVar506;
  short sVar509;
  short sVar512;
  short sVar515;
  short sVar518;
  short sVar521;
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  short sVar524;
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  short sVar507;
  short sVar510;
  short sVar513;
  short sVar516;
  short sVar519;
  short sVar522;
  short sVar525;
  undefined1 auVar504 [16];
  ushort uVar526;
  ushort uVar529;
  ushort uVar530;
  ushort uVar531;
  ushort uVar532;
  ushort uVar533;
  ushort uVar534;
  undefined1 in_XMM13 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  ushort uVar535;
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  ushort uVar540;
  ushort uVar544;
  ushort uVar545;
  ushort uVar546;
  ushort uVar547;
  ushort uVar548;
  ushort uVar549;
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  ushort uVar550;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  ulong local_1a8;
  short local_198;
  short sStack_196;
  short local_188;
  short sStack_186;
  undefined1 local_178 [16];
  short local_168;
  short sStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  short local_158;
  short sStack_156;
  undefined8 local_148;
  undefined1 local_138 [16];
  ushort local_128;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  short sVar34;
  short sVar35;
  short sVar61;
  short sVar82;
  short sVar84;
  short sVar86;
  short sVar88;
  short sVar90;
  short sVar93;
  short sVar96;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  ushort uVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  ushort uVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  ushort uVar143;
  short sVar144;
  short sVar145;
  short sVar146;
  short sVar147;
  ushort uVar150;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  ushort uVar157;
  short sVar158;
  short sVar159;
  short sVar179;
  short sVar180;
  short sVar183;
  short sVar184;
  short sVar187;
  short sVar188;
  short sVar192;
  short sVar193;
  short sVar197;
  short sVar198;
  short sVar203;
  short sVar204;
  short sVar209;
  short sVar210;
  short sVar217;
  short sVar218;
  ushort uVar219;
  short sVar246;
  short sVar247;
  ushort uVar248;
  short sVar252;
  short sVar253;
  ushort uVar254;
  ushort uVar255;
  ushort uVar256;
  short sVar260;
  short sVar261;
  ushort uVar262;
  ushort uVar263;
  ushort uVar264;
  short sVar268;
  short sVar269;
  ushort uVar270;
  ushort uVar271;
  ushort uVar272;
  short sVar276;
  short sVar277;
  ushort uVar278;
  ushort uVar279;
  ushort uVar280;
  short sVar285;
  short sVar286;
  ushort uVar287;
  ushort uVar288;
  ushort uVar289;
  short sVar293;
  short sVar294;
  ushort uVar295;
  ushort uVar296;
  ushort uVar297;
  short sVar300;
  short sVar301;
  short sVar302;
  ushort uVar303;
  short sVar318;
  short sVar319;
  short sVar320;
  ushort uVar321;
  short sVar322;
  short sVar323;
  short sVar324;
  ushort uVar325;
  short sVar327;
  short sVar328;
  short sVar329;
  ushort uVar330;
  short sVar332;
  short sVar333;
  short sVar334;
  ushort uVar335;
  short sVar337;
  short sVar338;
  short sVar339;
  ushort uVar340;
  short sVar342;
  short sVar343;
  short sVar344;
  ushort uVar345;
  short sVar348;
  short sVar349;
  short sVar350;
  ushort uVar351;
  short sVar363;
  short sVar366;
  ushort uVar367;
  ushort uVar368;
  short sVar387;
  short sVar390;
  ushort uVar391;
  ushort uVar392;
  short sVar394;
  short sVar397;
  ushort uVar398;
  ushort uVar399;
  short sVar400;
  short sVar403;
  ushort uVar404;
  ushort uVar405;
  short sVar406;
  short sVar409;
  ushort uVar410;
  ushort uVar411;
  short sVar413;
  short sVar416;
  ushort uVar417;
  ushort uVar418;
  short sVar420;
  short sVar423;
  ushort uVar424;
  ushort uVar425;
  short sVar427;
  short sVar430;
  ushort uVar431;
  ushort uVar432;
  short sVar434;
  short sVar444;
  short sVar446;
  short sVar448;
  short sVar450;
  short sVar452;
  short sVar454;
  short sVar456;
  ushort uVar459;
  ushort uVar470;
  ushort uVar472;
  ushort uVar475;
  ushort uVar478;
  ushort uVar480;
  ushort uVar482;
  ushort uVar484;
  short sVar492;
  short sVar505;
  short sVar508;
  short sVar511;
  short sVar514;
  short sVar517;
  short sVar520;
  short sVar523;
  
  bVar19 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar16 = (long)dir;
  lVar12 = (long)cdef_directions_padded[lVar16 + 2][0];
  lVar13 = (long)cdef_directions_padded[lVar16 + 2][1];
  lVar14 = (long)cdef_directions_padded[lVar16 + 4][0];
  lVar15 = (long)cdef_directions_padded[lVar16 + 4][1];
  lVar11 = (long)cdef_directions_padded[lVar16][0];
  lVar16 = (long)cdef_directions_padded[lVar16][1];
  if (block_width == 8) {
    local_138._0_4_ = pri_damping;
    if (pri_strength != 0) {
      iVar6 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_138._0_4_ = pri_damping - iVar6;
      if (pri_damping < iVar6) {
        local_138._0_4_ = 0;
      }
    }
    uVar17 = sec_damping;
    if (sec_strength != 0) {
      iVar6 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar17 = sec_damping - iVar6;
      if (sec_damping < iVar6) {
        uVar17 = 0;
      }
    }
    if (0 < block_height) {
      auVar23 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      uStack_124 = auVar23._0_2_;
      uStack_122 = auVar23._2_2_;
      auVar24 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar19][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar19][0]),0);
      auVar25 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar19][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar19][1]),0);
      auVar26 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      uStack_164 = auVar26._0_2_;
      uStack_162 = auVar26._2_2_;
      auVar27 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      auVar28 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      uVar9 = 0;
      do {
        auVar232 = *(undefined1 (*) [16])in;
        auVar45 = *(undefined1 (*) [16])((long)in + 0x120);
        auVar62 = lddqu(in_XMM2,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar12 * 2));
        auVar97 = lddqu(in_XMM3,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar12 * 2));
        auVar162 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar12 * -2));
        auVar436 = lddqu(in_XMM9,*(undefined1 (*) [16])((long)in + lVar12 * -2 + 0x120));
        sVar160 = auVar232._0_2_;
        sVar41 = auVar62._0_2_;
        auVar63._0_2_ = sVar41 - sVar160;
        sVar181 = auVar232._2_2_;
        sVar46 = auVar62._2_2_;
        auVar63._2_2_ = sVar46 - sVar181;
        sVar185 = auVar232._4_2_;
        sVar47 = auVar62._4_2_;
        auVar63._4_2_ = sVar47 - sVar185;
        sVar190 = auVar232._6_2_;
        sVar48 = auVar62._6_2_;
        auVar63._6_2_ = sVar48 - sVar190;
        sVar195 = auVar232._8_2_;
        sVar49 = auVar62._8_2_;
        auVar63._8_2_ = sVar49 - sVar195;
        sVar200 = auVar232._10_2_;
        sVar50 = auVar62._10_2_;
        auVar63._10_2_ = sVar50 - sVar200;
        sVar206 = auVar232._12_2_;
        sVar51 = auVar62._12_2_;
        sVar52 = auVar62._14_2_;
        auVar63._12_2_ = sVar51 - sVar206;
        sVar212 = auVar232._14_2_;
        auVar63._14_2_ = sVar52 - sVar212;
        sVar494 = auVar45._0_2_;
        sVar116 = auVar97._0_2_;
        auVar221._0_2_ = sVar116 - sVar494;
        sVar507 = auVar45._2_2_;
        sVar118 = auVar97._2_2_;
        auVar221._2_2_ = sVar118 - sVar507;
        sVar510 = auVar45._4_2_;
        sVar120 = auVar97._4_2_;
        auVar221._4_2_ = sVar120 - sVar510;
        sVar513 = auVar45._6_2_;
        sVar122 = auVar97._6_2_;
        auVar221._6_2_ = sVar122 - sVar513;
        sVar516 = auVar45._8_2_;
        sVar124 = auVar97._8_2_;
        auVar221._8_2_ = sVar124 - sVar516;
        sVar519 = auVar45._10_2_;
        sVar126 = auVar97._10_2_;
        auVar221._10_2_ = sVar126 - sVar519;
        sVar522 = auVar45._12_2_;
        sVar131 = auVar97._12_2_;
        sVar133 = auVar97._14_2_;
        auVar221._12_2_ = sVar131 - sVar522;
        sVar525 = auVar45._14_2_;
        auVar221._14_2_ = sVar133 - sVar525;
        auVar304 = pabsw(in_XMM6,auVar63);
        auVar64 = psraw(auVar63,0xf);
        auVar354 = pabsw(in_XMM7,auVar221);
        local_138._4_4_ = 0;
        uVar60 = auVar304._0_2_;
        auVar29._0_2_ = uVar60 >> local_138._0_8_;
        uVar81 = auVar304._2_2_;
        auVar29._2_2_ = uVar81 >> local_138._0_8_;
        uVar83 = auVar304._4_2_;
        auVar29._4_2_ = uVar83 >> local_138._0_8_;
        uVar85 = auVar304._6_2_;
        auVar29._6_2_ = uVar85 >> local_138._0_8_;
        uVar87 = auVar304._8_2_;
        auVar29._8_2_ = uVar87 >> local_138._0_8_;
        uVar89 = auVar304._10_2_;
        auVar29._10_2_ = uVar89 >> local_138._0_8_;
        uVar91 = auVar304._12_2_;
        uVar94 = auVar304._14_2_;
        auVar29._12_2_ = uVar91 >> local_138._0_8_;
        auVar29._14_2_ = uVar94 >> local_138._0_8_;
        auVar222 = psraw(auVar221,0xf);
        uVar215 = auVar354._0_2_;
        auVar370._0_2_ = uVar215 >> local_138._0_8_;
        uVar244 = auVar354._2_2_;
        auVar370._2_2_ = uVar244 >> local_138._0_8_;
        uVar250 = auVar354._4_2_;
        auVar370._4_2_ = uVar250 >> local_138._0_8_;
        uVar364 = auVar354._6_2_;
        auVar370._6_2_ = uVar364 >> local_138._0_8_;
        uVar258 = auVar354._8_2_;
        auVar370._8_2_ = uVar258 >> local_138._0_8_;
        uVar266 = auVar354._10_2_;
        auVar370._10_2_ = uVar266 >> local_138._0_8_;
        uVar388 = auVar354._12_2_;
        uVar274 = auVar354._14_2_;
        auVar370._12_2_ = uVar388 >> local_138._0_8_;
        auVar370._14_2_ = uVar274 >> local_138._0_8_;
        auVar8._4_2_ = uStack_124;
        auVar8._0_4_ = auVar23._0_4_;
        auVar8._6_2_ = uStack_122;
        auVar8._8_2_ = uStack_124;
        auVar8._10_2_ = uStack_122;
        auVar8._12_2_ = uStack_124;
        auVar8._14_2_ = uStack_122;
        auVar354 = psubusw(auVar8,auVar29);
        auVar304 = psubusw(auVar8,auVar370);
        sVar40 = auVar354._0_2_;
        sVar53 = auVar354._2_2_;
        sVar54 = auVar354._4_2_;
        sVar55 = auVar354._6_2_;
        sVar56 = auVar354._8_2_;
        sVar57 = auVar354._10_2_;
        sVar58 = auVar354._12_2_;
        sVar59 = auVar354._14_2_;
        sVar20 = auVar304._0_2_;
        sVar21 = auVar304._2_2_;
        sVar34 = auVar304._4_2_;
        sVar35 = auVar304._6_2_;
        sVar36 = auVar304._8_2_;
        sVar37 = auVar304._10_2_;
        sVar38 = auVar304._12_2_;
        sVar39 = auVar304._14_2_;
        auVar98._0_2_ =
             (((short)uVar60 < sVar40) * uVar60 | (ushort)((short)uVar60 >= sVar40) * sVar40) +
             auVar64._0_2_;
        auVar98._2_2_ =
             (((short)uVar81 < sVar53) * uVar81 | (ushort)((short)uVar81 >= sVar53) * sVar53) +
             auVar64._2_2_;
        auVar98._4_2_ =
             (((short)uVar83 < sVar54) * uVar83 | (ushort)((short)uVar83 >= sVar54) * sVar54) +
             auVar64._4_2_;
        auVar98._6_2_ =
             (((short)uVar85 < sVar55) * uVar85 | (ushort)((short)uVar85 >= sVar55) * sVar55) +
             auVar64._6_2_;
        auVar98._8_2_ =
             (((short)uVar87 < sVar56) * uVar87 | (ushort)((short)uVar87 >= sVar56) * sVar56) +
             auVar64._8_2_;
        auVar98._10_2_ =
             (((short)uVar89 < sVar57) * uVar89 | (ushort)((short)uVar89 >= sVar57) * sVar57) +
             auVar64._10_2_;
        auVar98._12_2_ =
             (((short)uVar91 < sVar58) * uVar91 | (ushort)((short)uVar91 >= sVar58) * sVar58) +
             auVar64._12_2_;
        auVar98._14_2_ =
             (((short)uVar94 < sVar59) * uVar94 | (ushort)((short)uVar94 >= sVar59) * sVar59) +
             auVar64._14_2_;
        auVar30._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar222._0_2_;
        auVar30._2_2_ =
             (((short)uVar244 < sVar21) * uVar244 | (ushort)((short)uVar244 >= sVar21) * sVar21) +
             auVar222._2_2_;
        auVar30._4_2_ =
             (((short)uVar250 < sVar34) * uVar250 | (ushort)((short)uVar250 >= sVar34) * sVar34) +
             auVar222._4_2_;
        auVar30._6_2_ =
             (((short)uVar364 < sVar35) * uVar364 | (ushort)((short)uVar364 >= sVar35) * sVar35) +
             auVar222._6_2_;
        auVar30._8_2_ =
             (((short)uVar258 < sVar36) * uVar258 | (ushort)((short)uVar258 >= sVar36) * sVar36) +
             auVar222._8_2_;
        auVar30._10_2_ =
             (((short)uVar266 < sVar37) * uVar266 | (ushort)((short)uVar266 >= sVar37) * sVar37) +
             auVar222._10_2_;
        auVar30._12_2_ =
             (((short)uVar388 < sVar38) * uVar388 | (ushort)((short)uVar388 >= sVar38) * sVar38) +
             auVar222._12_2_;
        auVar30._14_2_ =
             (((short)uVar274 < sVar39) * uVar274 | (ushort)((short)uVar274 >= sVar39) * sVar39) +
             auVar222._14_2_;
        auVar98 = auVar98 ^ auVar64;
        auVar30 = auVar30 ^ auVar222;
        sVar117 = auVar162._0_2_;
        auVar223._0_2_ = sVar117 - sVar160;
        sVar119 = auVar162._2_2_;
        auVar223._2_2_ = sVar119 - sVar181;
        sVar121 = auVar162._4_2_;
        auVar223._4_2_ = sVar121 - sVar185;
        sVar123 = auVar162._6_2_;
        auVar223._6_2_ = sVar123 - sVar190;
        sVar125 = auVar162._8_2_;
        auVar223._8_2_ = sVar125 - sVar195;
        sVar130 = auVar162._10_2_;
        auVar223._10_2_ = sVar130 - sVar200;
        sVar132 = auVar162._12_2_;
        sVar137 = auVar162._14_2_;
        auVar223._12_2_ = sVar132 - sVar206;
        auVar223._14_2_ = sVar137 - sVar212;
        sVar138 = auVar436._0_2_;
        auVar355._0_2_ = sVar138 - sVar494;
        sVar140 = auVar436._2_2_;
        auVar355._2_2_ = sVar140 - sVar507;
        sVar145 = auVar436._4_2_;
        auVar355._4_2_ = sVar145 - sVar510;
        sVar147 = auVar436._6_2_;
        auVar355._6_2_ = sVar147 - sVar513;
        sVar152 = auVar436._8_2_;
        auVar355._8_2_ = sVar152 - sVar516;
        sVar154 = auVar436._10_2_;
        auVar355._10_2_ = sVar154 - sVar519;
        sVar159 = auVar436._12_2_;
        sVar180 = auVar436._14_2_;
        auVar355._12_2_ = sVar159 - sVar522;
        auVar355._14_2_ = sVar180 - sVar525;
        auVar371 = pabsw(auVar370,auVar223);
        auVar64 = psraw(auVar223,0xf);
        auVar437 = pabsw(auVar436,auVar355);
        uVar60 = auVar371._0_2_;
        auVar65._0_2_ = uVar60 >> local_138._0_8_;
        uVar81 = auVar371._2_2_;
        auVar65._2_2_ = uVar81 >> local_138._0_8_;
        uVar83 = auVar371._4_2_;
        auVar65._4_2_ = uVar83 >> local_138._0_8_;
        uVar85 = auVar371._6_2_;
        auVar65._6_2_ = uVar85 >> local_138._0_8_;
        uVar87 = auVar371._8_2_;
        auVar65._8_2_ = uVar87 >> local_138._0_8_;
        uVar89 = auVar371._10_2_;
        auVar65._10_2_ = uVar89 >> local_138._0_8_;
        uVar91 = auVar371._12_2_;
        uVar94 = auVar371._14_2_;
        auVar65._12_2_ = uVar91 >> local_138._0_8_;
        auVar65._14_2_ = uVar94 >> local_138._0_8_;
        auVar222 = psraw(auVar355,0xf);
        uVar215 = auVar437._0_2_;
        auVar495._0_2_ = uVar215 >> local_138._0_8_;
        uVar244 = auVar437._2_2_;
        auVar495._2_2_ = uVar244 >> local_138._0_8_;
        uVar250 = auVar437._4_2_;
        auVar495._4_2_ = uVar250 >> local_138._0_8_;
        uVar364 = auVar437._6_2_;
        auVar495._6_2_ = uVar364 >> local_138._0_8_;
        uVar258 = auVar437._8_2_;
        auVar495._8_2_ = uVar258 >> local_138._0_8_;
        uVar266 = auVar437._10_2_;
        auVar495._10_2_ = uVar266 >> local_138._0_8_;
        uVar388 = auVar437._12_2_;
        uVar274 = auVar437._14_2_;
        auVar495._12_2_ = uVar388 >> local_138._0_8_;
        auVar495._14_2_ = uVar274 >> local_138._0_8_;
        auVar354 = psubusw(auVar8,auVar65);
        auVar304 = psubusw(auVar8,auVar495);
        sVar40 = auVar354._0_2_;
        sVar53 = auVar354._2_2_;
        sVar54 = auVar354._4_2_;
        sVar55 = auVar354._6_2_;
        sVar56 = auVar354._8_2_;
        sVar57 = auVar354._10_2_;
        sVar58 = auVar354._12_2_;
        sVar59 = auVar354._14_2_;
        sVar20 = auVar304._0_2_;
        sVar21 = auVar304._2_2_;
        sVar34 = auVar304._4_2_;
        sVar35 = auVar304._6_2_;
        sVar36 = auVar304._8_2_;
        sVar37 = auVar304._10_2_;
        sVar38 = auVar304._12_2_;
        sVar39 = auVar304._14_2_;
        auVar305._0_2_ =
             (((short)uVar60 < sVar40) * uVar60 | (ushort)((short)uVar60 >= sVar40) * sVar40) +
             auVar64._0_2_;
        auVar305._2_2_ =
             (((short)uVar81 < sVar53) * uVar81 | (ushort)((short)uVar81 >= sVar53) * sVar53) +
             auVar64._2_2_;
        auVar305._4_2_ =
             (((short)uVar83 < sVar54) * uVar83 | (ushort)((short)uVar83 >= sVar54) * sVar54) +
             auVar64._4_2_;
        auVar305._6_2_ =
             (((short)uVar85 < sVar55) * uVar85 | (ushort)((short)uVar85 >= sVar55) * sVar55) +
             auVar64._6_2_;
        auVar305._8_2_ =
             (((short)uVar87 < sVar56) * uVar87 | (ushort)((short)uVar87 >= sVar56) * sVar56) +
             auVar64._8_2_;
        auVar305._10_2_ =
             (((short)uVar89 < sVar57) * uVar89 | (ushort)((short)uVar89 >= sVar57) * sVar57) +
             auVar64._10_2_;
        auVar305._12_2_ =
             (((short)uVar91 < sVar58) * uVar91 | (ushort)((short)uVar91 >= sVar58) * sVar58) +
             auVar64._12_2_;
        auVar305._14_2_ =
             (((short)uVar94 < sVar59) * uVar94 | (ushort)((short)uVar94 >= sVar59) * sVar59) +
             auVar64._14_2_;
        auVar66._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar222._0_2_;
        auVar66._2_2_ =
             (((short)uVar244 < sVar21) * uVar244 | (ushort)((short)uVar244 >= sVar21) * sVar21) +
             auVar222._2_2_;
        auVar66._4_2_ =
             (((short)uVar250 < sVar34) * uVar250 | (ushort)((short)uVar250 >= sVar34) * sVar34) +
             auVar222._4_2_;
        auVar66._6_2_ =
             (((short)uVar364 < sVar35) * uVar364 | (ushort)((short)uVar364 >= sVar35) * sVar35) +
             auVar222._6_2_;
        auVar66._8_2_ =
             (((short)uVar258 < sVar36) * uVar258 | (ushort)((short)uVar258 >= sVar36) * sVar36) +
             auVar222._8_2_;
        auVar66._10_2_ =
             (((short)uVar266 < sVar37) * uVar266 | (ushort)((short)uVar266 >= sVar37) * sVar37) +
             auVar222._10_2_;
        auVar66._12_2_ =
             (((short)uVar388 < sVar38) * uVar388 | (ushort)((short)uVar388 >= sVar38) * sVar38) +
             auVar222._12_2_;
        auVar66._14_2_ =
             (((short)uVar274 < sVar39) * uVar274 | (ushort)((short)uVar274 >= sVar39) * sVar39) +
             auVar222._14_2_;
        auVar305 = auVar305 ^ auVar64;
        auVar66 = auVar66 ^ auVar222;
        auVar354 = lddqu(auVar98,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar13 * 2));
        auVar304 = lddqu(auVar30,*(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])((long)in + 0x120) + lVar13 * 2));
        sVar54 = auVar354._0_2_;
        auVar99._0_2_ = sVar54 - sVar160;
        sVar55 = auVar354._2_2_;
        auVar99._2_2_ = sVar55 - sVar181;
        sVar56 = auVar354._4_2_;
        auVar99._4_2_ = sVar56 - sVar185;
        sVar58 = auVar354._6_2_;
        auVar99._6_2_ = sVar58 - sVar190;
        sVar61 = auVar354._8_2_;
        auVar99._8_2_ = sVar61 - sVar195;
        sVar84 = auVar354._10_2_;
        auVar99._10_2_ = sVar84 - sVar200;
        sVar88 = auVar354._12_2_;
        sVar93 = auVar354._14_2_;
        auVar99._12_2_ = sVar88 - sVar206;
        auVar99._14_2_ = sVar93 - sVar212;
        sVar21 = auVar304._0_2_;
        auVar31._0_2_ = sVar21 - sVar494;
        sVar34 = auVar304._2_2_;
        auVar31._2_2_ = sVar34 - sVar507;
        sVar35 = auVar304._4_2_;
        auVar31._4_2_ = sVar35 - sVar510;
        sVar36 = auVar304._6_2_;
        auVar31._6_2_ = sVar36 - sVar513;
        sVar37 = auVar304._8_2_;
        auVar31._8_2_ = sVar37 - sVar516;
        sVar38 = auVar304._10_2_;
        auVar31._10_2_ = sVar38 - sVar519;
        sVar39 = auVar304._12_2_;
        sVar40 = auVar304._14_2_;
        auVar31._12_2_ = sVar39 - sVar522;
        auVar31._14_2_ = sVar40 - sVar525;
        auVar222 = pabsw(auVar371,auVar99);
        auVar437 = pabsw(auVar437,auVar31);
        uVar60 = auVar222._0_2_;
        auVar356._0_2_ = uVar60 >> local_138._0_8_;
        uVar81 = auVar222._2_2_;
        auVar356._2_2_ = uVar81 >> local_138._0_8_;
        uVar83 = auVar222._4_2_;
        auVar356._4_2_ = uVar83 >> local_138._0_8_;
        uVar85 = auVar222._6_2_;
        auVar356._6_2_ = uVar85 >> local_138._0_8_;
        uVar87 = auVar222._8_2_;
        auVar356._8_2_ = uVar87 >> local_138._0_8_;
        uVar89 = auVar222._10_2_;
        auVar356._10_2_ = uVar89 >> local_138._0_8_;
        uVar91 = auVar222._12_2_;
        uVar94 = auVar222._14_2_;
        auVar356._12_2_ = uVar91 >> local_138._0_8_;
        auVar356._14_2_ = uVar94 >> local_138._0_8_;
        auVar64 = psubusw(auVar8,auVar356);
        uVar215 = auVar437._0_2_;
        auVar496._0_2_ = uVar215 >> local_138._0_8_;
        uVar244 = auVar437._2_2_;
        auVar496._2_2_ = uVar244 >> local_138._0_8_;
        uVar250 = auVar437._4_2_;
        auVar496._4_2_ = uVar250 >> local_138._0_8_;
        uVar364 = auVar437._6_2_;
        auVar496._6_2_ = uVar364 >> local_138._0_8_;
        uVar258 = auVar437._8_2_;
        auVar496._8_2_ = uVar258 >> local_138._0_8_;
        uVar266 = auVar437._10_2_;
        auVar496._10_2_ = uVar266 >> local_138._0_8_;
        uVar388 = auVar437._12_2_;
        uVar274 = auVar437._14_2_;
        auVar496._12_2_ = uVar388 >> local_138._0_8_;
        auVar496._14_2_ = uVar274 >> local_138._0_8_;
        auVar371 = psubusw(auVar8,auVar496);
        sVar20 = auVar64._0_2_;
        sVar53 = auVar64._2_2_;
        sVar57 = auVar64._4_2_;
        sVar59 = auVar64._6_2_;
        sVar82 = auVar64._8_2_;
        sVar86 = auVar64._10_2_;
        sVar90 = auVar64._12_2_;
        sVar96 = auVar64._14_2_;
        auVar372 = lddqu(auVar222,*(undefined1 (*) [16])((long)in + lVar13 * -2));
        auVar222 = psraw(auVar99,0xf);
        auVar64 = psraw(auVar31,0xf);
        sVar139 = auVar371._0_2_;
        sVar144 = auVar371._2_2_;
        sVar146 = auVar371._4_2_;
        sVar151 = auVar371._6_2_;
        sVar153 = auVar371._8_2_;
        sVar158 = auVar371._10_2_;
        sVar179 = auVar371._12_2_;
        sVar183 = auVar371._14_2_;
        auVar224._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar222._0_2_;
        auVar224._2_2_ =
             (((short)uVar81 < sVar53) * uVar81 | (ushort)((short)uVar81 >= sVar53) * sVar53) +
             auVar222._2_2_;
        auVar224._4_2_ =
             (((short)uVar83 < sVar57) * uVar83 | (ushort)((short)uVar83 >= sVar57) * sVar57) +
             auVar222._4_2_;
        auVar224._6_2_ =
             (((short)uVar85 < sVar59) * uVar85 | (ushort)((short)uVar85 >= sVar59) * sVar59) +
             auVar222._6_2_;
        auVar224._8_2_ =
             (((short)uVar87 < sVar82) * uVar87 | (ushort)((short)uVar87 >= sVar82) * sVar82) +
             auVar222._8_2_;
        auVar224._10_2_ =
             (((short)uVar89 < sVar86) * uVar89 | (ushort)((short)uVar89 >= sVar86) * sVar86) +
             auVar222._10_2_;
        auVar224._12_2_ =
             (((short)uVar91 < sVar90) * uVar91 | (ushort)((short)uVar91 >= sVar90) * sVar90) +
             auVar222._12_2_;
        auVar224._14_2_ =
             (((short)uVar94 < sVar96) * uVar94 | (ushort)((short)uVar94 >= sVar96) * sVar96) +
             auVar222._14_2_;
        auVar357._0_2_ =
             (((short)uVar215 < sVar139) * uVar215 | (ushort)((short)uVar215 >= sVar139) * sVar139)
             + auVar64._0_2_;
        auVar357._2_2_ =
             (((short)uVar244 < sVar144) * uVar244 | (ushort)((short)uVar244 >= sVar144) * sVar144)
             + auVar64._2_2_;
        auVar357._4_2_ =
             (((short)uVar250 < sVar146) * uVar250 | (ushort)((short)uVar250 >= sVar146) * sVar146)
             + auVar64._4_2_;
        auVar357._6_2_ =
             (((short)uVar364 < sVar151) * uVar364 | (ushort)((short)uVar364 >= sVar151) * sVar151)
             + auVar64._6_2_;
        auVar357._8_2_ =
             (((short)uVar258 < sVar153) * uVar258 | (ushort)((short)uVar258 >= sVar153) * sVar153)
             + auVar64._8_2_;
        auVar357._10_2_ =
             (((short)uVar266 < sVar158) * uVar266 | (ushort)((short)uVar266 >= sVar158) * sVar158)
             + auVar64._10_2_;
        auVar357._12_2_ =
             (((short)uVar388 < sVar179) * uVar388 | (ushort)((short)uVar388 >= sVar179) * sVar179)
             + auVar64._12_2_;
        auVar357._14_2_ =
             (((short)uVar274 < sVar183) * uVar274 | (ushort)((short)uVar274 >= sVar183) * sVar183)
             + auVar64._14_2_;
        auVar224 = auVar224 ^ auVar222;
        sVar363 = auVar372._0_2_;
        auVar373._0_2_ = sVar363 - sVar160;
        sVar387 = auVar372._2_2_;
        auVar373._2_2_ = sVar387 - sVar181;
        sVar394 = auVar372._4_2_;
        auVar373._4_2_ = sVar394 - sVar185;
        sVar400 = auVar372._6_2_;
        auVar373._6_2_ = sVar400 - sVar190;
        sVar406 = auVar372._8_2_;
        auVar373._8_2_ = sVar406 - sVar195;
        sVar413 = auVar372._10_2_;
        auVar373._10_2_ = sVar413 - sVar200;
        sVar420 = auVar372._12_2_;
        sVar427 = auVar372._14_2_;
        auVar373._12_2_ = sVar420 - sVar206;
        auVar373._14_2_ = sVar427 - sVar212;
        auVar222 = pabsw(auVar437,auVar373);
        uVar60 = auVar222._0_2_;
        auVar100._0_2_ = uVar60 >> local_138._0_8_;
        uVar81 = auVar222._2_2_;
        auVar100._2_2_ = uVar81 >> local_138._0_8_;
        uVar83 = auVar222._4_2_;
        auVar100._4_2_ = uVar83 >> local_138._0_8_;
        uVar85 = auVar222._6_2_;
        auVar100._6_2_ = uVar85 >> local_138._0_8_;
        uVar87 = auVar222._8_2_;
        auVar100._8_2_ = uVar87 >> local_138._0_8_;
        uVar89 = auVar222._10_2_;
        auVar100._10_2_ = uVar89 >> local_138._0_8_;
        uVar91 = auVar222._12_2_;
        uVar94 = auVar222._14_2_;
        auVar100._12_2_ = uVar91 >> local_138._0_8_;
        auVar100._14_2_ = uVar94 >> local_138._0_8_;
        auVar357 = auVar357 ^ auVar64;
        auVar222 = psubusw(auVar8,auVar100);
        auVar371 = lddqu(auVar496,*(undefined1 (*) [16])((long)in + lVar13 * -2 + 0x120));
        sVar492 = auVar371._0_2_;
        auVar497._0_2_ = sVar492 - sVar494;
        sVar505 = auVar371._2_2_;
        auVar497._2_2_ = sVar505 - sVar507;
        sVar508 = auVar371._4_2_;
        auVar497._4_2_ = sVar508 - sVar510;
        sVar511 = auVar371._6_2_;
        auVar497._6_2_ = sVar511 - sVar513;
        sVar514 = auVar371._8_2_;
        auVar497._8_2_ = sVar514 - sVar516;
        sVar517 = auVar371._10_2_;
        auVar497._10_2_ = sVar517 - sVar519;
        sVar520 = auVar371._12_2_;
        sVar523 = auVar371._14_2_;
        auVar497._12_2_ = sVar520 - sVar522;
        auVar497._14_2_ = sVar523 - sVar525;
        auVar64 = pabsw(in_XMM13,auVar497);
        uVar215 = auVar64._0_2_;
        auVar536._0_2_ = uVar215 >> local_138._0_8_;
        uVar244 = auVar64._2_2_;
        auVar536._2_2_ = uVar244 >> local_138._0_8_;
        uVar250 = auVar64._4_2_;
        auVar536._4_2_ = uVar250 >> local_138._0_8_;
        uVar364 = auVar64._6_2_;
        auVar536._6_2_ = uVar364 >> local_138._0_8_;
        uVar258 = auVar64._8_2_;
        auVar536._8_2_ = uVar258 >> local_138._0_8_;
        uVar266 = auVar64._10_2_;
        auVar536._10_2_ = uVar266 >> local_138._0_8_;
        uVar388 = auVar64._12_2_;
        uVar274 = auVar64._14_2_;
        auVar536._12_2_ = uVar388 >> local_138._0_8_;
        auVar536._14_2_ = uVar274 >> local_138._0_8_;
        auVar64 = psubusw(auVar8,auVar536);
        sVar139 = auVar222._0_2_;
        sVar144 = auVar222._2_2_;
        sVar146 = auVar222._4_2_;
        sVar151 = auVar222._6_2_;
        sVar153 = auVar222._8_2_;
        sVar158 = auVar222._10_2_;
        sVar179 = auVar222._12_2_;
        sVar183 = auVar222._14_2_;
        sVar20 = auVar64._0_2_;
        sVar53 = auVar64._2_2_;
        sVar57 = auVar64._4_2_;
        sVar59 = auVar64._6_2_;
        sVar82 = auVar64._8_2_;
        sVar86 = auVar64._10_2_;
        sVar90 = auVar64._12_2_;
        sVar96 = auVar64._14_2_;
        auVar64 = psraw(auVar373,0xf);
        auVar460._0_2_ =
             (((short)uVar60 < sVar139) * uVar60 | (ushort)((short)uVar60 >= sVar139) * sVar139) +
             auVar64._0_2_;
        auVar460._2_2_ =
             (((short)uVar81 < sVar144) * uVar81 | (ushort)((short)uVar81 >= sVar144) * sVar144) +
             auVar64._2_2_;
        auVar460._4_2_ =
             (((short)uVar83 < sVar146) * uVar83 | (ushort)((short)uVar83 >= sVar146) * sVar146) +
             auVar64._4_2_;
        auVar460._6_2_ =
             (((short)uVar85 < sVar151) * uVar85 | (ushort)((short)uVar85 >= sVar151) * sVar151) +
             auVar64._6_2_;
        auVar460._8_2_ =
             (((short)uVar87 < sVar153) * uVar87 | (ushort)((short)uVar87 >= sVar153) * sVar153) +
             auVar64._8_2_;
        auVar460._10_2_ =
             (((short)uVar89 < sVar158) * uVar89 | (ushort)((short)uVar89 >= sVar158) * sVar158) +
             auVar64._10_2_;
        auVar460._12_2_ =
             (((short)uVar91 < sVar179) * uVar91 | (ushort)((short)uVar91 >= sVar179) * sVar179) +
             auVar64._12_2_;
        auVar460._14_2_ =
             (((short)uVar94 < sVar183) * uVar94 | (ushort)((short)uVar94 >= sVar183) * sVar183) +
             auVar64._14_2_;
        auVar460 = auVar460 ^ auVar64;
        local_148._0_2_ = auVar24._0_2_;
        local_148._2_2_ = auVar24._2_2_;
        auVar64 = psraw(auVar497,0xf);
        auVar101._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar64._0_2_;
        auVar101._2_2_ =
             (((short)uVar244 < sVar53) * uVar244 | (ushort)((short)uVar244 >= sVar53) * sVar53) +
             auVar64._2_2_;
        auVar101._4_2_ =
             (((short)uVar250 < sVar57) * uVar250 | (ushort)((short)uVar250 >= sVar57) * sVar57) +
             auVar64._4_2_;
        auVar101._6_2_ =
             (((short)uVar364 < sVar59) * uVar364 | (ushort)((short)uVar364 >= sVar59) * sVar59) +
             auVar64._6_2_;
        auVar101._8_2_ =
             (((short)uVar258 < sVar82) * uVar258 | (ushort)((short)uVar258 >= sVar82) * sVar82) +
             auVar64._8_2_;
        auVar101._10_2_ =
             (((short)uVar266 < sVar86) * uVar266 | (ushort)((short)uVar266 >= sVar86) * sVar86) +
             auVar64._10_2_;
        auVar101._12_2_ =
             (((short)uVar388 < sVar90) * uVar388 | (ushort)((short)uVar388 >= sVar90) * sVar90) +
             auVar64._12_2_;
        auVar101._14_2_ =
             (((short)uVar274 < sVar96) * uVar274 | (ushort)((short)uVar274 >= sVar96) * sVar96) +
             auVar64._14_2_;
        auVar101 = auVar101 ^ auVar64;
        local_158 = auVar25._0_2_;
        sStack_156 = auVar25._2_2_;
        auVar102._0_2_ =
             (auVar101._0_2_ + auVar357._0_2_) * local_158 +
             (auVar66._0_2_ + auVar30._0_2_) * (short)local_148;
        auVar102._2_2_ =
             (auVar101._2_2_ + auVar357._2_2_) * sStack_156 +
             (auVar66._2_2_ + auVar30._2_2_) * local_148._2_2_;
        auVar102._4_2_ =
             (auVar101._4_2_ + auVar357._4_2_) * local_158 +
             (auVar66._4_2_ + auVar30._4_2_) * (short)local_148;
        auVar102._6_2_ =
             (auVar101._6_2_ + auVar357._6_2_) * sStack_156 +
             (auVar66._6_2_ + auVar30._6_2_) * local_148._2_2_;
        auVar102._8_2_ =
             (auVar101._8_2_ + auVar357._8_2_) * local_158 +
             (auVar66._8_2_ + auVar30._8_2_) * (short)local_148;
        auVar102._10_2_ =
             (auVar101._10_2_ + auVar357._10_2_) * sStack_156 +
             (auVar66._10_2_ + auVar30._10_2_) * local_148._2_2_;
        auVar102._12_2_ =
             (auVar101._12_2_ + auVar357._12_2_) * local_158 +
             (auVar66._12_2_ + auVar30._12_2_) * (short)local_148;
        auVar102._14_2_ =
             (auVar101._14_2_ + auVar357._14_2_) * sStack_156 +
             (auVar66._14_2_ + auVar30._14_2_) * local_148._2_2_;
        auVar62 = auVar62 & _DAT_00566860;
        sVar20 = auVar62._0_2_;
        uVar60 = (ushort)(sVar20 < sVar160) * sVar160 | (ushort)(sVar20 >= sVar160) * sVar20;
        sVar20 = auVar62._2_2_;
        uVar81 = (ushort)(sVar20 < sVar181) * sVar181 | (ushort)(sVar20 >= sVar181) * sVar20;
        sVar20 = auVar62._4_2_;
        uVar83 = (ushort)(sVar20 < sVar185) * sVar185 | (ushort)(sVar20 >= sVar185) * sVar20;
        sVar20 = auVar62._6_2_;
        uVar85 = (ushort)(sVar20 < sVar190) * sVar190 | (ushort)(sVar20 >= sVar190) * sVar20;
        sVar20 = auVar62._8_2_;
        uVar87 = (ushort)(sVar20 < sVar195) * sVar195 | (ushort)(sVar20 >= sVar195) * sVar20;
        sVar20 = auVar62._10_2_;
        uVar89 = (ushort)(sVar20 < sVar200) * sVar200 | (ushort)(sVar20 >= sVar200) * sVar20;
        sVar20 = auVar62._12_2_;
        sVar53 = auVar62._14_2_;
        uVar91 = (ushort)(sVar20 < sVar206) * sVar206 | (ushort)(sVar20 >= sVar206) * sVar20;
        uVar94 = (ushort)(sVar53 < sVar212) * sVar212 | (ushort)(sVar53 >= sVar212) * sVar53;
        auVar97 = auVar97 & _DAT_00566860;
        sVar20 = auVar97._0_2_;
        uVar215 = (ushort)(sVar20 < sVar494) * sVar494 | (ushort)(sVar20 >= sVar494) * sVar20;
        sVar20 = auVar97._2_2_;
        uVar244 = (ushort)(sVar20 < sVar507) * sVar507 | (ushort)(sVar20 >= sVar507) * sVar20;
        sVar20 = auVar97._4_2_;
        uVar250 = (ushort)(sVar20 < sVar510) * sVar510 | (ushort)(sVar20 >= sVar510) * sVar20;
        sVar20 = auVar97._6_2_;
        uVar258 = (ushort)(sVar20 < sVar513) * sVar513 | (ushort)(sVar20 >= sVar513) * sVar20;
        sVar20 = auVar97._8_2_;
        uVar266 = (ushort)(sVar20 < sVar516) * sVar516 | (ushort)(sVar20 >= sVar516) * sVar20;
        sVar20 = auVar97._10_2_;
        uVar274 = (ushort)(sVar20 < sVar519) * sVar519 | (ushort)(sVar20 >= sVar519) * sVar20;
        sVar20 = auVar97._12_2_;
        sVar53 = auVar97._14_2_;
        uVar283 = (ushort)(sVar20 < sVar522) * sVar522 | (ushort)(sVar20 >= sVar522) * sVar20;
        uVar291 = (ushort)(sVar53 < sVar525) * sVar525 | (ushort)(sVar53 >= sVar525) * sVar53;
        auVar162 = auVar162 & _DAT_00566860;
        auVar436 = auVar436 & _DAT_00566860;
        auVar163._0_2_ = (ushort)(sVar54 < sVar117) * sVar54 | (ushort)(sVar54 >= sVar117) * sVar117
        ;
        auVar163._2_2_ = (ushort)(sVar55 < sVar119) * sVar55 | (ushort)(sVar55 >= sVar119) * sVar119
        ;
        auVar163._4_2_ = (ushort)(sVar56 < sVar121) * sVar56 | (ushort)(sVar56 >= sVar121) * sVar121
        ;
        auVar163._6_2_ = (ushort)(sVar58 < sVar123) * sVar58 | (ushort)(sVar58 >= sVar123) * sVar123
        ;
        auVar163._8_2_ = (ushort)(sVar61 < sVar125) * sVar61 | (ushort)(sVar61 >= sVar125) * sVar125
        ;
        auVar163._10_2_ =
             (ushort)(sVar84 < sVar130) * sVar84 | (ushort)(sVar84 >= sVar130) * sVar130;
        auVar163._12_2_ =
             (ushort)(sVar88 < sVar132) * sVar88 | (ushort)(sVar88 >= sVar132) * sVar132;
        auVar163._14_2_ =
             (ushort)(sVar93 < sVar137) * sVar93 | (ushort)(sVar93 >= sVar137) * sVar137;
        auVar354 = auVar354 & _DAT_00566860;
        sVar20 = auVar162._0_2_;
        sVar53 = auVar354._0_2_;
        uVar364 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._2_2_;
        sVar53 = auVar354._2_2_;
        uVar388 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._4_2_;
        sVar53 = auVar354._4_2_;
        uVar395 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._6_2_;
        sVar53 = auVar354._6_2_;
        uVar401 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._8_2_;
        sVar53 = auVar354._8_2_;
        uVar407 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._10_2_;
        sVar53 = auVar354._10_2_;
        uVar414 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._12_2_;
        sVar53 = auVar354._12_2_;
        sVar54 = auVar354._14_2_;
        uVar421 = (ushort)(sVar53 < sVar20) * sVar20 | (ushort)(sVar53 >= sVar20) * sVar53;
        sVar20 = auVar162._14_2_;
        uVar428 = (ushort)(sVar54 < sVar20) * sVar20 | (ushort)(sVar54 >= sVar20) * sVar54;
        uVar365 = ((short)uVar364 < (short)uVar60) * uVar60 |
                  ((short)uVar364 >= (short)uVar60) * uVar364;
        uVar389 = ((short)uVar388 < (short)uVar81) * uVar81 |
                  ((short)uVar388 >= (short)uVar81) * uVar388;
        uVar396 = ((short)uVar395 < (short)uVar83) * uVar83 |
                  ((short)uVar395 >= (short)uVar83) * uVar395;
        uVar402 = ((short)uVar401 < (short)uVar85) * uVar85 |
                  ((short)uVar401 >= (short)uVar85) * uVar401;
        uVar408 = ((short)uVar407 < (short)uVar87) * uVar87 |
                  ((short)uVar407 >= (short)uVar87) * uVar407;
        uVar415 = ((short)uVar414 < (short)uVar89) * uVar89 |
                  ((short)uVar414 >= (short)uVar89) * uVar414;
        uVar422 = ((short)uVar421 < (short)uVar91) * uVar91 |
                  ((short)uVar421 >= (short)uVar91) * uVar421;
        uVar429 = ((short)uVar428 < (short)uVar94) * uVar94 |
                  ((short)uVar428 >= (short)uVar94) * uVar428;
        uVar414 = (ushort)(sVar21 < sVar138) * sVar21 | (ushort)(sVar21 >= sVar138) * sVar138;
        uVar421 = (ushort)(sVar34 < sVar140) * sVar34 | (ushort)(sVar34 >= sVar140) * sVar140;
        uVar486 = (ushort)(sVar35 < sVar145) * sVar35 | (ushort)(sVar35 >= sVar145) * sVar145;
        uVar487 = (ushort)(sVar36 < sVar147) * sVar36 | (ushort)(sVar36 >= sVar147) * sVar147;
        uVar488 = (ushort)(sVar37 < sVar152) * sVar37 | (ushort)(sVar37 >= sVar152) * sVar152;
        uVar489 = (ushort)(sVar38 < sVar154) * sVar38 | (ushort)(sVar38 >= sVar154) * sVar154;
        uVar490 = (ushort)(sVar39 < sVar159) * sVar39 | (ushort)(sVar39 >= sVar159) * sVar159;
        uVar491 = (ushort)(sVar40 < sVar180) * sVar40 | (ushort)(sVar40 >= sVar180) * sVar180;
        auVar304 = auVar304 & _DAT_00566860;
        sVar20 = auVar436._0_2_;
        sVar21 = auVar304._0_2_;
        uVar60 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._2_2_;
        sVar21 = auVar304._2_2_;
        uVar81 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._4_2_;
        sVar21 = auVar304._4_2_;
        uVar83 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._6_2_;
        sVar21 = auVar304._6_2_;
        uVar85 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._8_2_;
        sVar21 = auVar304._8_2_;
        uVar87 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._10_2_;
        sVar21 = auVar304._10_2_;
        uVar89 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._12_2_;
        sVar21 = auVar304._12_2_;
        sVar34 = auVar304._14_2_;
        uVar91 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar436._14_2_;
        uVar94 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        uVar215 = ((short)uVar60 < (short)uVar215) * uVar215 |
                  ((short)uVar60 >= (short)uVar215) * uVar60;
        uVar364 = ((short)uVar81 < (short)uVar244) * uVar244 |
                  ((short)uVar81 >= (short)uVar244) * uVar81;
        uVar388 = ((short)uVar83 < (short)uVar250) * uVar250 |
                  ((short)uVar83 >= (short)uVar250) * uVar83;
        uVar395 = ((short)uVar85 < (short)uVar258) * uVar258 |
                  ((short)uVar85 >= (short)uVar258) * uVar85;
        uVar407 = ((short)uVar87 < (short)uVar266) * uVar266 |
                  ((short)uVar87 >= (short)uVar266) * uVar87;
        uVar428 = ((short)uVar89 < (short)uVar274) * uVar274 |
                  ((short)uVar89 >= (short)uVar274) * uVar89;
        uVar92 = ((short)uVar91 < (short)uVar283) * uVar283 |
                 ((short)uVar91 >= (short)uVar283) * uVar91;
        uVar95 = ((short)uVar94 < (short)uVar291) * uVar291 |
                 ((short)uVar94 >= (short)uVar291) * uVar94;
        uVar60 = (ushort)(sVar160 < sVar41) * sVar160 | (ushort)(sVar160 >= sVar41) * sVar41;
        uVar81 = (ushort)(sVar181 < sVar46) * sVar181 | (ushort)(sVar181 >= sVar46) * sVar46;
        uVar83 = (ushort)(sVar185 < sVar47) * sVar185 | (ushort)(sVar185 >= sVar47) * sVar47;
        uVar85 = (ushort)(sVar190 < sVar48) * sVar190 | (ushort)(sVar190 >= sVar48) * sVar48;
        uVar87 = (ushort)(sVar195 < sVar49) * sVar195 | (ushort)(sVar195 >= sVar49) * sVar49;
        uVar89 = (ushort)(sVar200 < sVar50) * sVar200 | (ushort)(sVar200 >= sVar50) * sVar50;
        uVar91 = (ushort)(sVar206 < sVar51) * sVar206 | (ushort)(sVar206 >= sVar51) * sVar51;
        uVar94 = (ushort)(sVar212 < sVar52) * sVar212 | (ushort)(sVar212 >= sVar52) * sVar52;
        uVar244 = (ushort)(sVar494 < sVar116) * sVar494 | (ushort)(sVar494 >= sVar116) * sVar116;
        uVar250 = (ushort)(sVar507 < sVar118) * sVar507 | (ushort)(sVar507 >= sVar118) * sVar118;
        uVar258 = (ushort)(sVar510 < sVar120) * sVar510 | (ushort)(sVar510 >= sVar120) * sVar120;
        uVar266 = (ushort)(sVar513 < sVar122) * sVar513 | (ushort)(sVar513 >= sVar122) * sVar122;
        uVar274 = (ushort)(sVar516 < sVar124) * sVar516 | (ushort)(sVar516 >= sVar124) * sVar124;
        uVar283 = (ushort)(sVar519 < sVar126) * sVar519 | (ushort)(sVar519 >= sVar126) * sVar126;
        uVar291 = (ushort)(sVar522 < sVar131) * sVar522 | (ushort)(sVar522 >= sVar131) * sVar131;
        uVar401 = (ushort)(sVar525 < sVar133) * sVar525 | (ushort)(sVar525 >= sVar133) * sVar133;
        auVar67._0_2_ =
             ((short)auVar163._0_2_ < (short)uVar60) * auVar163._0_2_ |
             ((short)auVar163._0_2_ >= (short)uVar60) * uVar60;
        auVar67._2_2_ =
             ((short)auVar163._2_2_ < (short)uVar81) * auVar163._2_2_ |
             ((short)auVar163._2_2_ >= (short)uVar81) * uVar81;
        auVar67._4_2_ =
             ((short)auVar163._4_2_ < (short)uVar83) * auVar163._4_2_ |
             ((short)auVar163._4_2_ >= (short)uVar83) * uVar83;
        auVar67._6_2_ =
             ((short)auVar163._6_2_ < (short)uVar85) * auVar163._6_2_ |
             ((short)auVar163._6_2_ >= (short)uVar85) * uVar85;
        auVar67._8_2_ =
             ((short)auVar163._8_2_ < (short)uVar87) * auVar163._8_2_ |
             ((short)auVar163._8_2_ >= (short)uVar87) * uVar87;
        auVar67._10_2_ =
             ((short)auVar163._10_2_ < (short)uVar89) * auVar163._10_2_ |
             ((short)auVar163._10_2_ >= (short)uVar89) * uVar89;
        auVar67._12_2_ =
             ((short)auVar163._12_2_ < (short)uVar91) * auVar163._12_2_ |
             ((short)auVar163._12_2_ >= (short)uVar91) * uVar91;
        auVar67._14_2_ =
             ((short)auVar163._14_2_ < (short)uVar94) * auVar163._14_2_ |
             ((short)auVar163._14_2_ >= (short)uVar94) * uVar94;
        uVar216 = ((short)uVar414 < (short)uVar244) * uVar414 |
                  ((short)uVar414 >= (short)uVar244) * uVar244;
        uVar245 = ((short)uVar421 < (short)uVar250) * uVar421 |
                  ((short)uVar421 >= (short)uVar250) * uVar250;
        uVar251 = ((short)uVar486 < (short)uVar258) * uVar486 |
                  ((short)uVar486 >= (short)uVar258) * uVar258;
        uVar259 = ((short)uVar487 < (short)uVar266) * uVar487 |
                  ((short)uVar487 >= (short)uVar266) * uVar266;
        uVar267 = ((short)uVar488 < (short)uVar274) * uVar488 |
                  ((short)uVar488 >= (short)uVar274) * uVar274;
        uVar275 = ((short)uVar489 < (short)uVar283) * uVar489 |
                  ((short)uVar489 >= (short)uVar283) * uVar283;
        uVar284 = ((short)uVar490 < (short)uVar291) * uVar490 |
                  ((short)uVar490 >= (short)uVar291) * uVar291;
        uVar292 = ((short)uVar491 < (short)uVar401) * uVar491 |
                  ((short)uVar491 >= (short)uVar401) * uVar401;
        auVar62 = lddqu(auVar67,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar14 * 2));
        auVar306 = lddqu(auVar162,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar14 * 2));
        sVar40 = auVar62._0_2_;
        auVar68._0_2_ = sVar40 - sVar160;
        sVar46 = auVar62._2_2_;
        auVar68._2_2_ = sVar46 - sVar181;
        sVar48 = auVar62._4_2_;
        auVar68._4_2_ = sVar48 - sVar185;
        sVar50 = auVar62._6_2_;
        auVar68._6_2_ = sVar50 - sVar190;
        sVar52 = auVar62._8_2_;
        auVar68._8_2_ = sVar52 - sVar195;
        sVar54 = auVar62._10_2_;
        auVar68._10_2_ = sVar54 - sVar200;
        sVar57 = auVar62._12_2_;
        sVar61 = auVar62._14_2_;
        auVar68._12_2_ = sVar57 - sVar206;
        auVar68._14_2_ = sVar61 - sVar212;
        auVar304 = pabsw(auVar163,auVar68);
        uVar22 = (ulong)uVar17;
        uVar60 = auVar304._0_2_;
        auVar225._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar304._2_2_;
        auVar225._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar304._4_2_;
        auVar225._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar304._6_2_;
        auVar225._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar304._8_2_;
        auVar225._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar304._10_2_;
        auVar225._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar304._12_2_;
        uVar94 = auVar304._14_2_;
        auVar225._12_2_ = uVar91 >> uVar22;
        auVar225._14_2_ = uVar94 >> uVar22;
        auVar7._4_2_ = uStack_164;
        auVar7._0_4_ = auVar26._0_4_;
        auVar7._6_2_ = uStack_162;
        auVar7._8_2_ = uStack_164;
        auVar7._10_2_ = uStack_162;
        auVar7._12_2_ = uStack_164;
        auVar7._14_2_ = uStack_162;
        auVar304 = psubusw(auVar7,auVar225);
        sVar300 = auVar306._0_2_;
        auVar307._0_2_ = sVar300 - sVar494;
        sVar318 = auVar306._2_2_;
        auVar307._2_2_ = sVar318 - sVar507;
        sVar322 = auVar306._4_2_;
        auVar307._4_2_ = sVar322 - sVar510;
        sVar327 = auVar306._6_2_;
        auVar307._6_2_ = sVar327 - sVar513;
        sVar332 = auVar306._8_2_;
        auVar307._8_2_ = sVar332 - sVar516;
        sVar337 = auVar306._10_2_;
        auVar307._10_2_ = sVar337 - sVar519;
        sVar342 = auVar306._12_2_;
        sVar348 = auVar306._14_2_;
        auVar307._12_2_ = sVar342 - sVar522;
        auVar307._14_2_ = sVar348 - sVar525;
        auVar97 = pabsw(auVar436,auVar307);
        uVar244 = auVar97._0_2_;
        auVar374._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar97._2_2_;
        auVar374._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar97._4_2_;
        auVar374._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar97._6_2_;
        auVar374._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar97._8_2_;
        auVar374._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar97._10_2_;
        auVar374._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar97._12_2_;
        uVar401 = auVar97._14_2_;
        auVar374._12_2_ = uVar291 >> uVar22;
        auVar374._14_2_ = uVar401 >> uVar22;
        auVar64 = psubusw(auVar7,auVar374);
        sVar20 = auVar304._0_2_;
        sVar21 = auVar304._2_2_;
        sVar34 = auVar304._4_2_;
        sVar35 = auVar304._6_2_;
        sVar36 = auVar304._8_2_;
        sVar37 = auVar304._10_2_;
        sVar38 = auVar304._12_2_;
        sVar39 = auVar304._14_2_;
        sVar41 = auVar64._0_2_;
        sVar47 = auVar64._2_2_;
        sVar49 = auVar64._4_2_;
        sVar51 = auVar64._6_2_;
        sVar53 = auVar64._8_2_;
        sVar55 = auVar64._10_2_;
        sVar56 = auVar64._12_2_;
        sVar58 = auVar64._14_2_;
        auVar304 = psraw(auVar68,0xf);
        auVar42._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar304._0_2_;
        auVar42._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar304._2_2_;
        auVar42._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar304._4_2_;
        auVar42._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar304._6_2_;
        auVar42._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar304._8_2_;
        auVar42._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar304._10_2_;
        auVar42._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar304._12_2_;
        auVar42._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar304._14_2_;
        auVar42 = auVar42 ^ auVar304;
        auVar304 = lddqu(ZEXT416(uVar17),*(undefined1 (*) [16])((long)in + lVar14 * -2));
        auVar64 = psraw(auVar307,0xf);
        auVar226._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar64._0_2_;
        auVar226._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar64._2_2_;
        auVar226._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar64._4_2_;
        auVar226._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar64._6_2_;
        auVar226._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar64._8_2_;
        auVar226._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar64._10_2_;
        auVar226._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar64._12_2_;
        auVar226._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar64._14_2_;
        auVar226 = auVar226 ^ auVar64;
        sVar301 = auVar304._0_2_;
        auVar308._0_2_ = sVar301 - sVar160;
        sVar319 = auVar304._2_2_;
        auVar308._2_2_ = sVar319 - sVar181;
        sVar323 = auVar304._4_2_;
        auVar308._4_2_ = sVar323 - sVar185;
        sVar328 = auVar304._6_2_;
        auVar308._6_2_ = sVar328 - sVar190;
        sVar333 = auVar304._8_2_;
        auVar308._8_2_ = sVar333 - sVar195;
        sVar338 = auVar304._10_2_;
        auVar308._10_2_ = sVar338 - sVar200;
        sVar343 = auVar304._12_2_;
        sVar349 = auVar304._14_2_;
        auVar308._12_2_ = sVar343 - sVar206;
        auVar308._14_2_ = sVar349 - sVar212;
        auVar64 = pabsw(auVar97,auVar308);
        uVar60 = auVar64._0_2_;
        auVar164._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar64._2_2_;
        auVar164._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar64._4_2_;
        auVar164._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar64._6_2_;
        auVar164._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar64._8_2_;
        auVar164._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar64._10_2_;
        auVar164._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar64._12_2_;
        uVar94 = auVar64._14_2_;
        auVar164._12_2_ = uVar91 >> uVar22;
        auVar164._14_2_ = uVar94 >> uVar22;
        auVar64 = psubusw(auVar7,auVar164);
        auVar375 = lddqu(auVar374,*(undefined1 (*) [16])((long)in + lVar14 * -2 + 0x120));
        sVar366 = auVar375._0_2_;
        auVar376._0_2_ = sVar366 - sVar494;
        sVar390 = auVar375._2_2_;
        auVar376._2_2_ = sVar390 - sVar507;
        sVar397 = auVar375._4_2_;
        auVar376._4_2_ = sVar397 - sVar510;
        sVar403 = auVar375._6_2_;
        auVar376._6_2_ = sVar403 - sVar513;
        sVar409 = auVar375._8_2_;
        auVar376._8_2_ = sVar409 - sVar516;
        sVar416 = auVar375._10_2_;
        auVar376._10_2_ = sVar416 - sVar519;
        sVar423 = auVar375._12_2_;
        sVar430 = auVar375._14_2_;
        auVar376._12_2_ = sVar423 - sVar522;
        auVar376._14_2_ = sVar430 - sVar525;
        auVar354 = pabsw(_DAT_00566860,auVar376);
        uVar244 = auVar354._0_2_;
        auVar498._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar354._2_2_;
        auVar498._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar354._4_2_;
        auVar498._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar354._6_2_;
        auVar498._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar354._8_2_;
        auVar498._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar354._10_2_;
        auVar498._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar354._12_2_;
        uVar401 = auVar354._14_2_;
        auVar498._12_2_ = uVar291 >> uVar22;
        auVar498._14_2_ = uVar401 >> uVar22;
        auVar97 = psubusw(auVar7,auVar498);
        sVar20 = auVar64._0_2_;
        sVar21 = auVar64._2_2_;
        sVar34 = auVar64._4_2_;
        sVar35 = auVar64._6_2_;
        sVar36 = auVar64._8_2_;
        sVar37 = auVar64._10_2_;
        sVar38 = auVar64._12_2_;
        sVar39 = auVar64._14_2_;
        sVar41 = auVar97._0_2_;
        sVar47 = auVar97._2_2_;
        sVar49 = auVar97._4_2_;
        sVar51 = auVar97._6_2_;
        sVar53 = auVar97._8_2_;
        sVar55 = auVar97._10_2_;
        sVar56 = auVar97._12_2_;
        sVar58 = auVar97._14_2_;
        auVar64 = psraw(auVar308,0xf);
        auVar69._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar64._0_2_;
        auVar69._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar64._2_2_;
        auVar69._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar64._4_2_;
        auVar69._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar64._6_2_;
        auVar69._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar64._8_2_;
        auVar69._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar64._10_2_;
        auVar69._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar64._12_2_;
        auVar69._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar64._14_2_;
        auVar69 = auVar69 ^ auVar64;
        auVar97 = psraw(auVar376,0xf);
        auVar165._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar97._0_2_;
        auVar165._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar97._2_2_;
        auVar165._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar97._4_2_;
        auVar165._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar97._6_2_;
        auVar165._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar97._8_2_;
        auVar165._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar97._10_2_;
        auVar165._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar97._12_2_;
        auVar165._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar97._14_2_;
        auVar165 = auVar165 ^ auVar97;
        auVar166._0_2_ = auVar165._0_2_ + auVar226._0_2_;
        auVar166._2_2_ = auVar165._2_2_ + auVar226._2_2_;
        auVar166._4_2_ = auVar165._4_2_ + auVar226._4_2_;
        auVar166._6_2_ = auVar165._6_2_ + auVar226._6_2_;
        auVar166._8_2_ = auVar165._8_2_ + auVar226._8_2_;
        auVar166._10_2_ = auVar165._10_2_ + auVar226._10_2_;
        auVar166._12_2_ = auVar165._12_2_ + auVar226._12_2_;
        auVar166._14_2_ = auVar165._14_2_ + auVar226._14_2_;
        auVar97 = lddqu(auVar64,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar11 * 2));
        sVar302 = auVar97._0_2_;
        auVar309._0_2_ = sVar302 - sVar160;
        sVar320 = auVar97._2_2_;
        auVar309._2_2_ = sVar320 - sVar181;
        sVar324 = auVar97._4_2_;
        auVar309._4_2_ = sVar324 - sVar185;
        sVar329 = auVar97._6_2_;
        auVar309._6_2_ = sVar329 - sVar190;
        sVar334 = auVar97._8_2_;
        auVar309._8_2_ = sVar334 - sVar195;
        sVar339 = auVar97._10_2_;
        auVar309._10_2_ = sVar339 - sVar200;
        sVar344 = auVar97._12_2_;
        sVar350 = auVar97._14_2_;
        auVar309._12_2_ = sVar344 - sVar206;
        auVar309._14_2_ = sVar350 - sVar212;
        auVar222 = pabsw(auVar354,auVar309);
        uVar60 = auVar222._0_2_;
        auVar43._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar222._2_2_;
        auVar43._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar222._4_2_;
        auVar43._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar222._6_2_;
        auVar43._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar222._8_2_;
        auVar43._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar222._10_2_;
        auVar43._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar222._12_2_;
        uVar94 = auVar222._14_2_;
        auVar43._12_2_ = uVar91 >> uVar22;
        auVar43._14_2_ = uVar94 >> uVar22;
        auVar64 = psubusw(auVar7,auVar43);
        auVar354 = lddqu(auVar226,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar11 * 2));
        sVar217 = auVar354._0_2_;
        auVar227._0_2_ = sVar217 - sVar494;
        sVar246 = auVar354._2_2_;
        auVar227._2_2_ = sVar246 - sVar507;
        sVar252 = auVar354._4_2_;
        auVar227._4_2_ = sVar252 - sVar510;
        sVar260 = auVar354._6_2_;
        auVar227._6_2_ = sVar260 - sVar513;
        sVar268 = auVar354._8_2_;
        auVar227._8_2_ = sVar268 - sVar516;
        sVar276 = auVar354._10_2_;
        auVar227._10_2_ = sVar276 - sVar519;
        sVar285 = auVar354._12_2_;
        sVar293 = auVar354._14_2_;
        auVar227._12_2_ = sVar285 - sVar522;
        auVar227._14_2_ = sVar293 - sVar525;
        auVar162 = pabsw(auVar45,auVar227);
        uVar244 = auVar162._0_2_;
        auVar537._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar162._2_2_;
        auVar537._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar162._4_2_;
        auVar537._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar162._6_2_;
        auVar537._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar162._8_2_;
        auVar537._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar162._10_2_;
        auVar537._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar162._12_2_;
        uVar401 = auVar162._14_2_;
        auVar537._12_2_ = uVar291 >> uVar22;
        auVar537._14_2_ = uVar401 >> uVar22;
        auVar162 = psubusw(auVar7,auVar537);
        sVar20 = auVar64._0_2_;
        sVar21 = auVar64._2_2_;
        sVar34 = auVar64._4_2_;
        sVar35 = auVar64._6_2_;
        sVar36 = auVar64._8_2_;
        sVar37 = auVar64._10_2_;
        sVar38 = auVar64._12_2_;
        sVar39 = auVar64._14_2_;
        sVar41 = auVar162._0_2_;
        sVar47 = auVar162._2_2_;
        sVar49 = auVar162._4_2_;
        sVar51 = auVar162._6_2_;
        sVar53 = auVar162._8_2_;
        sVar55 = auVar162._10_2_;
        sVar56 = auVar162._12_2_;
        sVar58 = auVar162._14_2_;
        auVar64 = psraw(auVar309,0xf);
        auVar377._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar64._0_2_;
        auVar377._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar64._2_2_;
        auVar377._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar64._4_2_;
        auVar377._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar64._6_2_;
        auVar377._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar64._8_2_;
        auVar377._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar64._10_2_;
        auVar377._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar64._12_2_;
        auVar377._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar64._14_2_;
        auVar377 = auVar377 ^ auVar64;
        auVar64 = psraw(auVar227,0xf);
        auVar499._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar64._0_2_;
        auVar499._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar64._2_2_;
        auVar499._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar64._4_2_;
        auVar499._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar64._6_2_;
        auVar499._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar64._8_2_;
        auVar499._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar64._10_2_;
        auVar499._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar64._12_2_;
        auVar499._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar64._14_2_;
        auVar162 = lddqu(auVar222,*(undefined1 (*) [16])((long)in + lVar11 * -2));
        sVar434 = auVar162._0_2_;
        auVar438._0_2_ = sVar434 - sVar160;
        sVar444 = auVar162._2_2_;
        auVar438._2_2_ = sVar444 - sVar181;
        sVar446 = auVar162._4_2_;
        auVar438._4_2_ = sVar446 - sVar185;
        sVar448 = auVar162._6_2_;
        auVar438._6_2_ = sVar448 - sVar190;
        sVar450 = auVar162._8_2_;
        auVar438._8_2_ = sVar450 - sVar195;
        sVar452 = auVar162._10_2_;
        auVar438._10_2_ = sVar452 - sVar200;
        sVar454 = auVar162._12_2_;
        sVar456 = auVar162._14_2_;
        auVar438._12_2_ = sVar454 - sVar206;
        auVar438._14_2_ = sVar456 - sVar212;
        auVar222 = pabsw(auVar537,auVar438);
        uVar60 = auVar222._0_2_;
        auVar527._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar222._2_2_;
        auVar527._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar222._4_2_;
        auVar527._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar222._6_2_;
        auVar527._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar222._8_2_;
        auVar527._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar222._10_2_;
        auVar527._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar222._12_2_;
        uVar94 = auVar222._14_2_;
        auVar527._12_2_ = uVar91 >> uVar22;
        auVar527._14_2_ = uVar94 >> uVar22;
        auVar499 = auVar499 ^ auVar64;
        auVar222 = psubusw(auVar7,auVar527);
        auVar228 = lddqu(auVar64,*(undefined1 (*) [16])((long)in + lVar11 * -2 + 0x120));
        sVar218 = auVar228._0_2_;
        auVar229._0_2_ = sVar218 - sVar494;
        sVar247 = auVar228._2_2_;
        auVar229._2_2_ = sVar247 - sVar507;
        sVar253 = auVar228._4_2_;
        auVar229._4_2_ = sVar253 - sVar510;
        sVar261 = auVar228._6_2_;
        auVar229._6_2_ = sVar261 - sVar513;
        sVar269 = auVar228._8_2_;
        auVar229._8_2_ = sVar269 - sVar516;
        sVar277 = auVar228._10_2_;
        auVar229._10_2_ = sVar277 - sVar519;
        sVar286 = auVar228._12_2_;
        sVar294 = auVar228._14_2_;
        auVar229._12_2_ = sVar286 - sVar522;
        auVar229._14_2_ = sVar294 - sVar525;
        auVar64 = pabsw(auVar232,auVar229);
        uVar244 = auVar64._0_2_;
        auVar541._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar64._2_2_;
        auVar541._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar64._4_2_;
        auVar541._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar64._6_2_;
        auVar541._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar64._8_2_;
        auVar541._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar64._10_2_;
        auVar541._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar64._12_2_;
        uVar401 = auVar64._14_2_;
        auVar541._12_2_ = uVar291 >> uVar22;
        auVar541._14_2_ = uVar401 >> uVar22;
        auVar64 = psubusw(auVar7,auVar541);
        sVar20 = auVar222._0_2_;
        sVar21 = auVar222._2_2_;
        sVar34 = auVar222._4_2_;
        sVar35 = auVar222._6_2_;
        sVar36 = auVar222._8_2_;
        sVar37 = auVar222._10_2_;
        sVar38 = auVar222._12_2_;
        sVar39 = auVar222._14_2_;
        sVar41 = auVar64._0_2_;
        sVar47 = auVar64._2_2_;
        sVar49 = auVar64._4_2_;
        sVar51 = auVar64._6_2_;
        sVar53 = auVar64._8_2_;
        sVar55 = auVar64._10_2_;
        sVar56 = auVar64._12_2_;
        sVar58 = auVar64._14_2_;
        auVar64 = psraw(auVar438,0xf);
        auVar310._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar64._0_2_;
        auVar310._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar64._2_2_;
        auVar310._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar64._4_2_;
        auVar310._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar64._6_2_;
        auVar310._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar64._8_2_;
        auVar310._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar64._10_2_;
        auVar310._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar64._12_2_;
        auVar310._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar64._14_2_;
        auVar310 = auVar310 ^ auVar64;
        auVar64 = psraw(auVar229,0xf);
        auVar528._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar64._0_2_;
        auVar528._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar64._2_2_;
        auVar528._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar64._4_2_;
        auVar528._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar64._6_2_;
        auVar528._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar64._8_2_;
        auVar528._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar64._10_2_;
        auVar528._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar64._12_2_;
        auVar528._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar64._14_2_;
        auVar528 = auVar528 ^ auVar64;
        local_188 = auVar27._0_2_;
        sStack_186 = auVar27._2_2_;
        auVar222 = lddqu(auVar166,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar15 * 2));
        sVar158 = auVar222._0_2_;
        auVar167._0_2_ = sVar158 - sVar160;
        sVar179 = auVar222._2_2_;
        auVar167._2_2_ = sVar179 - sVar181;
        sVar183 = auVar222._4_2_;
        auVar167._4_2_ = sVar183 - sVar185;
        sVar187 = auVar222._6_2_;
        auVar167._6_2_ = sVar187 - sVar190;
        sVar192 = auVar222._8_2_;
        auVar167._8_2_ = sVar192 - sVar195;
        sVar197 = auVar222._10_2_;
        auVar167._10_2_ = sVar197 - sVar200;
        sVar203 = auVar222._12_2_;
        sVar209 = auVar222._14_2_;
        auVar167._12_2_ = sVar203 - sVar206;
        auVar167._14_2_ = sVar209 - sVar212;
        auVar230 = pabsw(auVar64,auVar167);
        uVar60 = auVar230._0_2_;
        auVar70._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar230._2_2_;
        auVar70._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar230._4_2_;
        auVar70._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar230._6_2_;
        auVar70._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar230._8_2_;
        auVar70._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar230._10_2_;
        auVar70._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar230._12_2_;
        uVar94 = auVar230._14_2_;
        auVar70._12_2_ = uVar91 >> uVar22;
        auVar70._14_2_ = uVar94 >> uVar22;
        auVar64 = psubusw(auVar7,auVar70);
        auVar436 = lddqu(auVar102,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar15 * 2));
        sVar86 = auVar436._0_2_;
        auVar103._0_2_ = sVar86 - sVar494;
        sVar96 = auVar436._2_2_;
        auVar103._2_2_ = sVar96 - sVar507;
        sVar119 = auVar436._4_2_;
        auVar103._4_2_ = sVar119 - sVar510;
        sVar123 = auVar436._6_2_;
        auVar103._6_2_ = sVar123 - sVar513;
        sVar130 = auVar436._8_2_;
        auVar103._8_2_ = sVar130 - sVar516;
        sVar137 = auVar436._10_2_;
        auVar103._10_2_ = sVar137 - sVar519;
        sVar144 = auVar436._12_2_;
        sVar151 = auVar436._14_2_;
        auVar103._12_2_ = sVar144 - sVar522;
        auVar103._14_2_ = sVar151 - sVar525;
        auVar437 = pabsw(auVar377,auVar103);
        uVar244 = auVar437._0_2_;
        auVar439._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar437._2_2_;
        auVar439._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar437._4_2_;
        auVar439._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar437._6_2_;
        auVar439._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar437._8_2_;
        auVar439._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar437._10_2_;
        auVar439._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar437._12_2_;
        uVar401 = auVar437._14_2_;
        auVar439._12_2_ = uVar291 >> uVar22;
        auVar439._14_2_ = uVar401 >> uVar22;
        auVar437 = psubusw(auVar7,auVar439);
        sVar20 = auVar64._0_2_;
        sVar21 = auVar64._2_2_;
        sVar34 = auVar64._4_2_;
        sVar35 = auVar64._6_2_;
        sVar36 = auVar64._8_2_;
        sVar37 = auVar64._10_2_;
        sVar38 = auVar64._12_2_;
        sVar39 = auVar64._14_2_;
        sVar41 = auVar437._0_2_;
        sVar47 = auVar437._2_2_;
        sVar49 = auVar437._4_2_;
        sVar51 = auVar437._6_2_;
        sVar53 = auVar437._8_2_;
        sVar55 = auVar437._10_2_;
        sVar56 = auVar437._12_2_;
        sVar58 = auVar437._14_2_;
        auVar437 = psraw(auVar167,0xf);
        auVar32._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar437._0_2_;
        auVar32._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar437._2_2_;
        auVar32._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar437._4_2_;
        auVar32._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar437._6_2_;
        auVar32._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar437._8_2_;
        auVar32._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar437._10_2_;
        auVar32._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar437._12_2_;
        auVar32._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar437._14_2_;
        auVar32 = auVar32 ^ auVar437;
        auVar64 = psraw(auVar103,0xf);
        auVar71._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar64._0_2_;
        auVar71._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar64._2_2_;
        auVar71._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar64._4_2_;
        auVar71._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar64._6_2_;
        auVar71._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar64._8_2_;
        auVar71._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar64._10_2_;
        auVar71._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar64._12_2_;
        auVar71._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar64._14_2_;
        auVar168 = lddqu(auVar437,*(undefined1 (*) [16])((long)in + lVar15 * -2));
        sVar159 = auVar168._0_2_;
        auVar169._0_2_ = sVar159 - sVar160;
        sVar180 = auVar168._2_2_;
        auVar169._2_2_ = sVar180 - sVar181;
        sVar184 = auVar168._4_2_;
        auVar169._4_2_ = sVar184 - sVar185;
        sVar188 = auVar168._6_2_;
        auVar169._6_2_ = sVar188 - sVar190;
        sVar193 = auVar168._8_2_;
        auVar169._8_2_ = sVar193 - sVar195;
        sVar198 = auVar168._10_2_;
        auVar169._10_2_ = sVar198 - sVar200;
        sVar204 = auVar168._12_2_;
        sVar210 = auVar168._14_2_;
        auVar169._12_2_ = sVar204 - sVar206;
        auVar169._14_2_ = sVar210 - sVar212;
        auVar437 = pabsw(auVar230,auVar169);
        uVar60 = auVar437._0_2_;
        auVar378._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar437._2_2_;
        auVar378._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar437._4_2_;
        auVar378._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar437._6_2_;
        auVar378._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar437._8_2_;
        auVar378._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar437._10_2_;
        auVar378._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar437._12_2_;
        uVar94 = auVar437._14_2_;
        auVar378._12_2_ = uVar91 >> uVar22;
        auVar378._14_2_ = uVar94 >> uVar22;
        auVar71 = auVar71 ^ auVar64;
        auVar437 = psubusw(auVar7,auVar378);
        auVar64 = lddqu(auVar64,*(undefined1 (*) [16])((long)in + lVar15 * -2 + 0x120));
        sVar88 = auVar64._0_2_;
        auVar104._0_2_ = sVar88 - sVar494;
        sVar116 = auVar64._2_2_;
        auVar104._2_2_ = sVar116 - sVar507;
        sVar120 = auVar64._4_2_;
        auVar104._4_2_ = sVar120 - sVar510;
        sVar124 = auVar64._6_2_;
        auVar104._6_2_ = sVar124 - sVar513;
        sVar131 = auVar64._8_2_;
        auVar104._8_2_ = sVar131 - sVar516;
        sVar138 = auVar64._10_2_;
        auVar104._10_2_ = sVar138 - sVar519;
        sVar145 = auVar64._12_2_;
        sVar152 = auVar64._14_2_;
        auVar104._12_2_ = sVar145 - sVar522;
        auVar104._14_2_ = sVar152 - sVar525;
        auVar379 = pabsw(auVar378,auVar104);
        uVar244 = auVar379._0_2_;
        auVar440._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar379._2_2_;
        auVar440._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar379._4_2_;
        auVar440._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar379._6_2_;
        auVar440._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar379._8_2_;
        auVar440._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar379._10_2_;
        auVar440._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar379._12_2_;
        uVar401 = auVar379._14_2_;
        auVar440._12_2_ = uVar291 >> uVar22;
        auVar440._14_2_ = uVar401 >> uVar22;
        auVar230 = psubusw(auVar7,auVar440);
        sVar20 = auVar437._0_2_;
        sVar21 = auVar437._2_2_;
        sVar34 = auVar437._4_2_;
        sVar35 = auVar437._6_2_;
        sVar36 = auVar437._8_2_;
        sVar37 = auVar437._10_2_;
        sVar38 = auVar437._12_2_;
        sVar39 = auVar437._14_2_;
        sVar41 = auVar230._0_2_;
        sVar47 = auVar230._2_2_;
        sVar49 = auVar230._4_2_;
        sVar51 = auVar230._6_2_;
        sVar53 = auVar230._8_2_;
        sVar55 = auVar230._10_2_;
        sVar56 = auVar230._12_2_;
        sVar58 = auVar230._14_2_;
        auVar230 = psraw(auVar169,0xf);
        auVar538._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar230._0_2_;
        auVar538._2_2_ =
             (((short)uVar81 < sVar21) * uVar81 | (ushort)((short)uVar81 >= sVar21) * sVar21) +
             auVar230._2_2_;
        auVar538._4_2_ =
             (((short)uVar83 < sVar34) * uVar83 | (ushort)((short)uVar83 >= sVar34) * sVar34) +
             auVar230._4_2_;
        auVar538._6_2_ =
             (((short)uVar85 < sVar35) * uVar85 | (ushort)((short)uVar85 >= sVar35) * sVar35) +
             auVar230._6_2_;
        auVar538._8_2_ =
             (((short)uVar87 < sVar36) * uVar87 | (ushort)((short)uVar87 >= sVar36) * sVar36) +
             auVar230._8_2_;
        auVar538._10_2_ =
             (((short)uVar89 < sVar37) * uVar89 | (ushort)((short)uVar89 >= sVar37) * sVar37) +
             auVar230._10_2_;
        auVar538._12_2_ =
             (((short)uVar91 < sVar38) * uVar91 | (ushort)((short)uVar91 >= sVar38) * sVar38) +
             auVar230._12_2_;
        auVar538._14_2_ =
             (((short)uVar94 < sVar39) * uVar94 | (ushort)((short)uVar94 >= sVar39) * sVar39) +
             auVar230._14_2_;
        auVar538 = auVar538 ^ auVar230;
        auVar437 = psraw(auVar104,0xf);
        auVar542._0_2_ =
             (((short)uVar244 < sVar41) * uVar244 | (ushort)((short)uVar244 >= sVar41) * sVar41) +
             auVar437._0_2_;
        auVar542._2_2_ =
             (((short)uVar250 < sVar47) * uVar250 | (ushort)((short)uVar250 >= sVar47) * sVar47) +
             auVar437._2_2_;
        auVar542._4_2_ =
             (((short)uVar258 < sVar49) * uVar258 | (ushort)((short)uVar258 >= sVar49) * sVar49) +
             auVar437._4_2_;
        auVar542._6_2_ =
             (((short)uVar266 < sVar51) * uVar266 | (ushort)((short)uVar266 >= sVar51) * sVar51) +
             auVar437._6_2_;
        auVar542._8_2_ =
             (((short)uVar274 < sVar53) * uVar274 | (ushort)((short)uVar274 >= sVar53) * sVar53) +
             auVar437._8_2_;
        auVar542._10_2_ =
             (((short)uVar283 < sVar55) * uVar283 | (ushort)((short)uVar283 >= sVar55) * sVar55) +
             auVar437._10_2_;
        auVar542._12_2_ =
             (((short)uVar291 < sVar56) * uVar291 | (ushort)((short)uVar291 >= sVar56) * sVar56) +
             auVar437._12_2_;
        auVar542._14_2_ =
             (((short)uVar401 < sVar58) * uVar401 | (ushort)((short)uVar401 >= sVar58) * sVar58) +
             auVar437._14_2_;
        auVar542 = auVar542 ^ auVar437;
        auVar437 = lddqu(auVar437,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar16 * 2));
        sVar90 = auVar437._0_2_;
        auVar105._0_2_ = sVar90 - sVar160;
        sVar117 = auVar437._2_2_;
        auVar105._2_2_ = sVar117 - sVar181;
        sVar121 = auVar437._4_2_;
        auVar105._4_2_ = sVar121 - sVar185;
        sVar125 = auVar437._6_2_;
        auVar105._6_2_ = sVar125 - sVar190;
        sVar132 = auVar437._8_2_;
        auVar105._8_2_ = sVar132 - sVar195;
        sVar139 = auVar437._10_2_;
        auVar105._10_2_ = sVar139 - sVar200;
        sVar146 = auVar437._12_2_;
        sVar153 = auVar437._14_2_;
        auVar105._12_2_ = sVar146 - sVar206;
        auVar105._14_2_ = sVar153 - sVar212;
        auVar230 = pabsw(auVar230,auVar105);
        uVar60 = auVar230._0_2_;
        auVar231._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar230._2_2_;
        auVar231._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar230._4_2_;
        auVar231._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar230._6_2_;
        auVar231._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar230._8_2_;
        auVar231._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar230._10_2_;
        auVar231._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar230._12_2_;
        uVar94 = auVar230._14_2_;
        auVar231._12_2_ = uVar91 >> uVar22;
        auVar231._14_2_ = uVar94 >> uVar22;
        auVar230 = psubusw(auVar7,auVar231);
        auVar380 = lddqu(auVar379,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)in + 0x120) + lVar16 * 2));
        sVar35 = auVar380._0_2_;
        auVar72._0_2_ = sVar35 - sVar494;
        sVar37 = auVar380._2_2_;
        auVar72._2_2_ = sVar37 - sVar507;
        sVar39 = auVar380._4_2_;
        auVar72._4_2_ = sVar39 - sVar510;
        sVar47 = auVar380._6_2_;
        auVar72._6_2_ = sVar47 - sVar513;
        sVar51 = auVar380._8_2_;
        auVar72._8_2_ = sVar51 - sVar516;
        sVar55 = auVar380._10_2_;
        auVar72._10_2_ = sVar55 - sVar519;
        sVar58 = auVar380._12_2_;
        sVar82 = auVar380._14_2_;
        auVar72._12_2_ = sVar58 - sVar522;
        auVar72._14_2_ = sVar82 - sVar525;
        auVar379 = pabsw(auVar232,auVar72);
        uVar244 = auVar379._0_2_;
        auVar500._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar379._2_2_;
        auVar500._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar379._4_2_;
        auVar500._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar379._6_2_;
        auVar500._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar379._8_2_;
        auVar500._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar379._10_2_;
        auVar500._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar379._12_2_;
        uVar401 = auVar379._14_2_;
        auVar500._12_2_ = uVar291 >> uVar22;
        auVar500._14_2_ = uVar401 >> uVar22;
        auVar232 = psubusw(auVar7,auVar500);
        sVar56 = auVar230._0_2_;
        sVar59 = auVar230._2_2_;
        sVar84 = auVar230._4_2_;
        sVar93 = auVar230._6_2_;
        sVar118 = auVar230._8_2_;
        sVar122 = auVar230._10_2_;
        sVar126 = auVar230._12_2_;
        sVar133 = auVar230._14_2_;
        sVar20 = auVar232._0_2_;
        sVar21 = auVar232._2_2_;
        sVar34 = auVar232._4_2_;
        sVar36 = auVar232._6_2_;
        sVar38 = auVar232._8_2_;
        sVar41 = auVar232._10_2_;
        sVar49 = auVar232._12_2_;
        sVar53 = auVar232._14_2_;
        auVar230 = psraw(auVar105,0xf);
        auVar441._0_2_ =
             (((short)uVar60 < sVar56) * uVar60 | (ushort)((short)uVar60 >= sVar56) * sVar56) +
             auVar230._0_2_;
        auVar441._2_2_ =
             (((short)uVar81 < sVar59) * uVar81 | (ushort)((short)uVar81 >= sVar59) * sVar59) +
             auVar230._2_2_;
        auVar441._4_2_ =
             (((short)uVar83 < sVar84) * uVar83 | (ushort)((short)uVar83 >= sVar84) * sVar84) +
             auVar230._4_2_;
        auVar441._6_2_ =
             (((short)uVar85 < sVar93) * uVar85 | (ushort)((short)uVar85 >= sVar93) * sVar93) +
             auVar230._6_2_;
        auVar441._8_2_ =
             (((short)uVar87 < sVar118) * uVar87 | (ushort)((short)uVar87 >= sVar118) * sVar118) +
             auVar230._8_2_;
        auVar441._10_2_ =
             (((short)uVar89 < sVar122) * uVar89 | (ushort)((short)uVar89 >= sVar122) * sVar122) +
             auVar230._10_2_;
        auVar441._12_2_ =
             (((short)uVar91 < sVar126) * uVar91 | (ushort)((short)uVar91 >= sVar126) * sVar126) +
             auVar230._12_2_;
        auVar441._14_2_ =
             (((short)uVar94 < sVar133) * uVar94 | (ushort)((short)uVar94 >= sVar133) * sVar133) +
             auVar230._14_2_;
        auVar441 = auVar441 ^ auVar230;
        auVar232 = psraw(auVar72,0xf);
        auVar233._0_2_ =
             (((short)uVar244 < sVar20) * uVar244 | (ushort)((short)uVar244 >= sVar20) * sVar20) +
             auVar232._0_2_;
        auVar233._2_2_ =
             (((short)uVar250 < sVar21) * uVar250 | (ushort)((short)uVar250 >= sVar21) * sVar21) +
             auVar232._2_2_;
        auVar233._4_2_ =
             (((short)uVar258 < sVar34) * uVar258 | (ushort)((short)uVar258 >= sVar34) * sVar34) +
             auVar232._4_2_;
        auVar233._6_2_ =
             (((short)uVar266 < sVar36) * uVar266 | (ushort)((short)uVar266 >= sVar36) * sVar36) +
             auVar232._6_2_;
        auVar233._8_2_ =
             (((short)uVar274 < sVar38) * uVar274 | (ushort)((short)uVar274 >= sVar38) * sVar38) +
             auVar232._8_2_;
        auVar233._10_2_ =
             (((short)uVar283 < sVar41) * uVar283 | (ushort)((short)uVar283 >= sVar41) * sVar41) +
             auVar232._10_2_;
        auVar233._12_2_ =
             (((short)uVar291 < sVar49) * uVar291 | (ushort)((short)uVar291 >= sVar49) * sVar49) +
             auVar232._12_2_;
        auVar233._14_2_ =
             (((short)uVar401 < sVar53) * uVar401 | (ushort)((short)uVar401 >= sVar53) * sVar53) +
             auVar232._14_2_;
        auVar233 = auVar233 ^ auVar232;
        in_XMM6 = lddqu(auVar230,*(undefined1 (*) [16])((long)in + lVar16 * -2));
        sVar93 = in_XMM6._0_2_;
        auVar106._0_2_ = sVar93 - sVar160;
        sVar118 = in_XMM6._2_2_;
        auVar106._2_2_ = sVar118 - sVar181;
        sVar122 = in_XMM6._4_2_;
        auVar106._4_2_ = sVar122 - sVar185;
        sVar126 = in_XMM6._6_2_;
        auVar106._6_2_ = sVar126 - sVar190;
        sVar133 = in_XMM6._8_2_;
        auVar106._8_2_ = sVar133 - sVar195;
        sVar140 = in_XMM6._10_2_;
        auVar106._10_2_ = sVar140 - sVar200;
        sVar147 = in_XMM6._12_2_;
        sVar154 = in_XMM6._14_2_;
        auVar106._12_2_ = sVar147 - sVar206;
        auVar106._14_2_ = sVar154 - sVar212;
        auVar232 = pabsw(auVar379,auVar106);
        uVar244 = auVar232._0_2_;
        auVar73._0_2_ = uVar244 >> uVar22;
        uVar250 = auVar232._2_2_;
        auVar73._2_2_ = uVar250 >> uVar22;
        uVar258 = auVar232._4_2_;
        auVar73._4_2_ = uVar258 >> uVar22;
        uVar266 = auVar232._6_2_;
        auVar73._6_2_ = uVar266 >> uVar22;
        uVar274 = auVar232._8_2_;
        auVar73._8_2_ = uVar274 >> uVar22;
        uVar283 = auVar232._10_2_;
        auVar73._10_2_ = uVar283 >> uVar22;
        uVar291 = auVar232._12_2_;
        uVar401 = auVar232._14_2_;
        auVar73._12_2_ = uVar291 >> uVar22;
        auVar73._14_2_ = uVar401 >> uVar22;
        auVar379 = psubusw(auVar7,auVar73);
        auVar230 = lddqu(auVar73,*(undefined1 (*) [16])((long)in + lVar16 * -2 + 0x120));
        sVar36 = auVar230._0_2_;
        auVar74._0_2_ = sVar36 - sVar494;
        sVar38 = auVar230._2_2_;
        auVar74._2_2_ = sVar38 - sVar507;
        sVar41 = auVar230._4_2_;
        auVar74._4_2_ = sVar41 - sVar510;
        sVar49 = auVar230._6_2_;
        auVar74._6_2_ = sVar49 - sVar513;
        sVar53 = auVar230._8_2_;
        auVar74._8_2_ = sVar53 - sVar516;
        sVar56 = auVar230._10_2_;
        auVar74._10_2_ = sVar56 - sVar519;
        sVar59 = auVar230._12_2_;
        sVar84 = auVar230._14_2_;
        auVar74._12_2_ = sVar59 - sVar522;
        auVar74._14_2_ = sVar84 - sVar525;
        auVar232 = pabsw(auVar45,auVar74);
        uVar60 = auVar232._0_2_;
        auVar33._0_2_ = uVar60 >> uVar22;
        uVar81 = auVar232._2_2_;
        auVar33._2_2_ = uVar81 >> uVar22;
        uVar83 = auVar232._4_2_;
        auVar33._4_2_ = uVar83 >> uVar22;
        uVar85 = auVar232._6_2_;
        auVar33._6_2_ = uVar85 >> uVar22;
        uVar87 = auVar232._8_2_;
        auVar33._8_2_ = uVar87 >> uVar22;
        uVar89 = auVar232._10_2_;
        auVar33._10_2_ = uVar89 >> uVar22;
        uVar91 = auVar232._12_2_;
        uVar94 = auVar232._14_2_;
        auVar33._12_2_ = uVar91 >> uVar22;
        auVar33._14_2_ = uVar94 >> uVar22;
        auVar232 = psubusw(auVar7,auVar33);
        sVar20 = auVar379._0_2_;
        sVar21 = auVar379._2_2_;
        sVar34 = auVar379._4_2_;
        sVar189 = auVar379._6_2_;
        sVar194 = auVar379._8_2_;
        sVar199 = auVar379._10_2_;
        sVar205 = auVar379._12_2_;
        sVar211 = auVar379._14_2_;
        sVar493 = auVar232._0_2_;
        sVar506 = auVar232._2_2_;
        sVar509 = auVar232._4_2_;
        sVar512 = auVar232._6_2_;
        sVar515 = auVar232._8_2_;
        sVar518 = auVar232._10_2_;
        sVar521 = auVar232._12_2_;
        sVar524 = auVar232._14_2_;
        auVar232 = psraw(auVar106,0xf);
        auVar170._0_2_ =
             (((short)uVar244 < sVar20) * uVar244 | (ushort)((short)uVar244 >= sVar20) * sVar20) +
             auVar232._0_2_;
        auVar170._2_2_ =
             (((short)uVar250 < sVar21) * uVar250 | (ushort)((short)uVar250 >= sVar21) * sVar21) +
             auVar232._2_2_;
        auVar170._4_2_ =
             (((short)uVar258 < sVar34) * uVar258 | (ushort)((short)uVar258 >= sVar34) * sVar34) +
             auVar232._4_2_;
        auVar170._6_2_ =
             (((short)uVar266 < sVar189) * uVar266 | (ushort)((short)uVar266 >= sVar189) * sVar189)
             + auVar232._6_2_;
        auVar170._8_2_ =
             (((short)uVar274 < sVar194) * uVar274 | (ushort)((short)uVar274 >= sVar194) * sVar194)
             + auVar232._8_2_;
        auVar170._10_2_ =
             (((short)uVar283 < sVar199) * uVar283 | (ushort)((short)uVar283 >= sVar199) * sVar199)
             + auVar232._10_2_;
        auVar170._12_2_ =
             (((short)uVar291 < sVar205) * uVar291 | (ushort)((short)uVar291 >= sVar205) * sVar205)
             + auVar232._12_2_;
        auVar170._14_2_ =
             (((short)uVar401 < sVar211) * uVar401 | (ushort)((short)uVar401 >= sVar211) * sVar211)
             + auVar232._14_2_;
        auVar170 = auVar170 ^ auVar232;
        auVar232 = psraw(auVar74,0xf);
        auVar501._0_2_ =
             (((short)uVar60 < sVar493) * uVar60 | (ushort)((short)uVar60 >= sVar493) * sVar493) +
             auVar232._0_2_;
        auVar501._2_2_ =
             (((short)uVar81 < sVar506) * uVar81 | (ushort)((short)uVar81 >= sVar506) * sVar506) +
             auVar232._2_2_;
        auVar501._4_2_ =
             (((short)uVar83 < sVar509) * uVar83 | (ushort)((short)uVar83 >= sVar509) * sVar509) +
             auVar232._4_2_;
        auVar501._6_2_ =
             (((short)uVar85 < sVar512) * uVar85 | (ushort)((short)uVar85 >= sVar512) * sVar512) +
             auVar232._6_2_;
        auVar501._8_2_ =
             (((short)uVar87 < sVar515) * uVar87 | (ushort)((short)uVar87 >= sVar515) * sVar515) +
             auVar232._8_2_;
        auVar501._10_2_ =
             (((short)uVar89 < sVar518) * uVar89 | (ushort)((short)uVar89 >= sVar518) * sVar518) +
             auVar232._10_2_;
        auVar501._12_2_ =
             (((short)uVar91 < sVar521) * uVar91 | (ushort)((short)uVar91 >= sVar521) * sVar521) +
             auVar232._12_2_;
        auVar501._14_2_ =
             (((short)uVar94 < sVar524) * uVar94 | (ushort)((short)uVar94 >= sVar524) * sVar524) +
             auVar232._14_2_;
        auVar501 = auVar501 ^ auVar232;
        local_198 = auVar28._0_2_;
        sStack_196 = auVar28._2_2_;
        auVar171._0_2_ =
             (auVar170._0_2_ + auVar441._0_2_ + auVar538._0_2_ + auVar32._0_2_) * local_198 +
             (auVar310._0_2_ + auVar377._0_2_ + auVar69._0_2_ + auVar42._0_2_) * local_188 +
             (auVar460._0_2_ + auVar224._0_2_) * local_158 +
             (auVar305._0_2_ + auVar98._0_2_) * (short)local_148;
        auVar171._2_2_ =
             (auVar170._2_2_ + auVar441._2_2_ + auVar538._2_2_ + auVar32._2_2_) * sStack_196 +
             (auVar310._2_2_ + auVar377._2_2_ + auVar69._2_2_ + auVar42._2_2_) * sStack_186 +
             (auVar460._2_2_ + auVar224._2_2_) * sStack_156 +
             (auVar305._2_2_ + auVar98._2_2_) * local_148._2_2_;
        auVar171._4_2_ =
             (auVar170._4_2_ + auVar441._4_2_ + auVar538._4_2_ + auVar32._4_2_) * local_198 +
             (auVar310._4_2_ + auVar377._4_2_ + auVar69._4_2_ + auVar42._4_2_) * local_188 +
             (auVar460._4_2_ + auVar224._4_2_) * local_158 +
             (auVar305._4_2_ + auVar98._4_2_) * (short)local_148;
        auVar171._6_2_ =
             (auVar170._6_2_ + auVar441._6_2_ + auVar538._6_2_ + auVar32._6_2_) * sStack_196 +
             (auVar310._6_2_ + auVar377._6_2_ + auVar69._6_2_ + auVar42._6_2_) * sStack_186 +
             (auVar460._6_2_ + auVar224._6_2_) * sStack_156 +
             (auVar305._6_2_ + auVar98._6_2_) * local_148._2_2_;
        auVar171._8_2_ =
             (auVar170._8_2_ + auVar441._8_2_ + auVar538._8_2_ + auVar32._8_2_) * local_198 +
             (auVar310._8_2_ + auVar377._8_2_ + auVar69._8_2_ + auVar42._8_2_) * local_188 +
             (auVar460._8_2_ + auVar224._8_2_) * local_158 +
             (auVar305._8_2_ + auVar98._8_2_) * (short)local_148;
        auVar171._10_2_ =
             (auVar170._10_2_ + auVar441._10_2_ + auVar538._10_2_ + auVar32._10_2_) * sStack_196 +
             (auVar310._10_2_ + auVar377._10_2_ + auVar69._10_2_ + auVar42._10_2_) * sStack_186 +
             (auVar460._10_2_ + auVar224._10_2_) * sStack_156 +
             (auVar305._10_2_ + auVar98._10_2_) * local_148._2_2_;
        auVar171._12_2_ =
             (auVar170._12_2_ + auVar441._12_2_ + auVar538._12_2_ + auVar32._12_2_) * local_198 +
             (auVar310._12_2_ + auVar377._12_2_ + auVar69._12_2_ + auVar42._12_2_) * local_188 +
             (auVar460._12_2_ + auVar224._12_2_) * local_158 +
             (auVar305._12_2_ + auVar98._12_2_) * (short)local_148;
        auVar171._14_2_ =
             (auVar170._14_2_ + auVar441._14_2_ + auVar538._14_2_ + auVar32._14_2_) * sStack_196 +
             (auVar310._14_2_ + auVar377._14_2_ + auVar69._14_2_ + auVar42._14_2_) * sStack_186 +
             (auVar460._14_2_ + auVar224._14_2_) * sStack_156 +
             (auVar305._14_2_ + auVar98._14_2_) * local_148._2_2_;
        auVar502._0_2_ =
             (auVar501._0_2_ + auVar233._0_2_ + auVar542._0_2_ + auVar71._0_2_) * local_198 +
             (auVar528._0_2_ + auVar499._0_2_ + auVar166._0_2_) * local_188 + auVar102._0_2_;
        auVar502._2_2_ =
             (auVar501._2_2_ + auVar233._2_2_ + auVar542._2_2_ + auVar71._2_2_) * sStack_196 +
             (auVar528._2_2_ + auVar499._2_2_ + auVar166._2_2_) * sStack_186 + auVar102._2_2_;
        auVar502._4_2_ =
             (auVar501._4_2_ + auVar233._4_2_ + auVar542._4_2_ + auVar71._4_2_) * local_198 +
             (auVar528._4_2_ + auVar499._4_2_ + auVar166._4_2_) * local_188 + auVar102._4_2_;
        auVar502._6_2_ =
             (auVar501._6_2_ + auVar233._6_2_ + auVar542._6_2_ + auVar71._6_2_) * sStack_196 +
             (auVar528._6_2_ + auVar499._6_2_ + auVar166._6_2_) * sStack_186 + auVar102._6_2_;
        auVar502._8_2_ =
             (auVar501._8_2_ + auVar233._8_2_ + auVar542._8_2_ + auVar71._8_2_) * local_198 +
             (auVar528._8_2_ + auVar499._8_2_ + auVar166._8_2_) * local_188 + auVar102._8_2_;
        auVar502._10_2_ =
             (auVar501._10_2_ + auVar233._10_2_ + auVar542._10_2_ + auVar71._10_2_) * sStack_196 +
             (auVar528._10_2_ + auVar499._10_2_ + auVar166._10_2_) * sStack_186 + auVar102._10_2_;
        auVar502._12_2_ =
             (auVar501._12_2_ + auVar233._12_2_ + auVar542._12_2_ + auVar71._12_2_) * local_198 +
             (auVar528._12_2_ + auVar499._12_2_ + auVar166._12_2_) * local_188 + auVar102._12_2_;
        auVar502._14_2_ =
             (auVar501._14_2_ + auVar233._14_2_ + auVar542._14_2_ + auVar71._14_2_) * sStack_196 +
             (auVar528._14_2_ + auVar499._14_2_ + auVar166._14_2_) * sStack_186 + auVar102._14_2_;
        uVar435 = (ushort)(sVar40 < sVar363) * sVar40 | (ushort)(sVar40 >= sVar363) * sVar363;
        uVar445 = (ushort)(sVar46 < sVar387) * sVar46 | (ushort)(sVar46 >= sVar387) * sVar387;
        uVar447 = (ushort)(sVar48 < sVar394) * sVar48 | (ushort)(sVar48 >= sVar394) * sVar394;
        uVar449 = (ushort)(sVar50 < sVar400) * sVar50 | (ushort)(sVar50 >= sVar400) * sVar400;
        uVar451 = (ushort)(sVar52 < sVar406) * sVar52 | (ushort)(sVar52 >= sVar406) * sVar406;
        uVar453 = (ushort)(sVar54 < sVar413) * sVar54 | (ushort)(sVar54 >= sVar413) * sVar413;
        uVar455 = (ushort)(sVar57 < sVar420) * sVar57 | (ushort)(sVar57 >= sVar420) * sVar420;
        uVar457 = (ushort)(sVar61 < sVar427) * sVar61 | (ushort)(sVar61 >= sVar427) * sVar427;
        auVar372 = auVar372 & _DAT_00566860;
        auVar62 = auVar62 & _DAT_00566860;
        sVar20 = auVar372._0_2_;
        sVar21 = auVar62._0_2_;
        uVar60 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._2_2_;
        sVar21 = auVar62._2_2_;
        uVar81 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._4_2_;
        sVar21 = auVar62._4_2_;
        uVar83 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._6_2_;
        sVar21 = auVar62._6_2_;
        uVar85 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._8_2_;
        sVar21 = auVar62._8_2_;
        uVar87 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._10_2_;
        sVar21 = auVar62._10_2_;
        uVar89 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._12_2_;
        sVar21 = auVar62._12_2_;
        sVar34 = auVar62._14_2_;
        uVar91 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar372._14_2_;
        uVar94 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        uVar244 = (ushort)(sVar300 < sVar492) * sVar300 | (ushort)(sVar300 >= sVar492) * sVar492;
        uVar258 = (ushort)(sVar318 < sVar505) * sVar318 | (ushort)(sVar318 >= sVar505) * sVar505;
        uVar274 = (ushort)(sVar322 < sVar508) * sVar322 | (ushort)(sVar322 >= sVar508) * sVar508;
        uVar291 = (ushort)(sVar327 < sVar511) * sVar327 | (ushort)(sVar327 >= sVar511) * sVar511;
        uVar414 = (ushort)(sVar332 < sVar514) * sVar332 | (ushort)(sVar332 >= sVar514) * sVar514;
        uVar486 = (ushort)(sVar337 < sVar517) * sVar337 | (ushort)(sVar337 >= sVar517) * sVar517;
        uVar488 = (ushort)(sVar342 < sVar520) * sVar342 | (ushort)(sVar342 >= sVar520) * sVar520;
        uVar490 = (ushort)(sVar348 < sVar523) * sVar348 | (ushort)(sVar348 >= sVar523) * sVar523;
        auVar371 = auVar371 & _DAT_00566860;
        auVar306 = auVar306 & _DAT_00566860;
        sVar20 = auVar371._0_2_;
        sVar21 = auVar306._0_2_;
        uVar250 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._2_2_;
        sVar21 = auVar306._2_2_;
        uVar266 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._4_2_;
        sVar21 = auVar306._4_2_;
        uVar283 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._6_2_;
        sVar21 = auVar306._6_2_;
        uVar401 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._8_2_;
        sVar21 = auVar306._8_2_;
        uVar421 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._10_2_;
        sVar21 = auVar306._10_2_;
        uVar487 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._12_2_;
        sVar21 = auVar306._12_2_;
        sVar34 = auVar306._14_2_;
        uVar489 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar371._14_2_;
        uVar491 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        in_XMM9._0_2_ =
             (ushort)(sVar301 < (short)uVar435) * sVar301 | (sVar301 >= (short)uVar435) * uVar435;
        in_XMM9._2_2_ =
             (ushort)(sVar319 < (short)uVar445) * sVar319 | (sVar319 >= (short)uVar445) * uVar445;
        in_XMM9._4_2_ =
             (ushort)(sVar323 < (short)uVar447) * sVar323 | (sVar323 >= (short)uVar447) * uVar447;
        in_XMM9._6_2_ =
             (ushort)(sVar328 < (short)uVar449) * sVar328 | (sVar328 >= (short)uVar449) * uVar449;
        in_XMM9._8_2_ =
             (ushort)(sVar333 < (short)uVar451) * sVar333 | (sVar333 >= (short)uVar451) * uVar451;
        in_XMM9._10_2_ =
             (ushort)(sVar338 < (short)uVar453) * sVar338 | (sVar338 >= (short)uVar453) * uVar453;
        in_XMM9._12_2_ =
             (ushort)(sVar343 < (short)uVar455) * sVar343 | (sVar343 >= (short)uVar455) * uVar455;
        in_XMM9._14_2_ =
             (ushort)(sVar349 < (short)uVar457) * sVar349 | (sVar349 >= (short)uVar457) * uVar457;
        auVar304 = auVar304 & _DAT_00566860;
        sVar20 = auVar304._0_2_;
        uVar60 = (sVar20 < (short)uVar60) * uVar60 | (ushort)(sVar20 >= (short)uVar60) * sVar20;
        sVar20 = auVar304._2_2_;
        uVar81 = (sVar20 < (short)uVar81) * uVar81 | (ushort)(sVar20 >= (short)uVar81) * sVar20;
        sVar20 = auVar304._4_2_;
        uVar83 = (sVar20 < (short)uVar83) * uVar83 | (ushort)(sVar20 >= (short)uVar83) * sVar20;
        sVar20 = auVar304._6_2_;
        uVar85 = (sVar20 < (short)uVar85) * uVar85 | (ushort)(sVar20 >= (short)uVar85) * sVar20;
        sVar20 = auVar304._8_2_;
        uVar87 = (sVar20 < (short)uVar87) * uVar87 | (ushort)(sVar20 >= (short)uVar87) * sVar20;
        sVar20 = auVar304._10_2_;
        uVar89 = (sVar20 < (short)uVar89) * uVar89 | (ushort)(sVar20 >= (short)uVar89) * sVar20;
        sVar20 = auVar304._12_2_;
        sVar21 = auVar304._14_2_;
        uVar91 = (sVar20 < (short)uVar91) * uVar91 | (ushort)(sVar20 >= (short)uVar91) * sVar20;
        uVar94 = (sVar21 < (short)uVar94) * uVar94 | (ushort)(sVar21 >= (short)uVar94) * sVar21;
        uVar365 = ((short)uVar60 < (short)uVar365) * uVar365 |
                  ((short)uVar60 >= (short)uVar365) * uVar60;
        uVar389 = ((short)uVar81 < (short)uVar389) * uVar389 |
                  ((short)uVar81 >= (short)uVar389) * uVar81;
        uVar396 = ((short)uVar83 < (short)uVar396) * uVar396 |
                  ((short)uVar83 >= (short)uVar396) * uVar83;
        uVar402 = ((short)uVar85 < (short)uVar402) * uVar402 |
                  ((short)uVar85 >= (short)uVar402) * uVar85;
        uVar408 = ((short)uVar87 < (short)uVar408) * uVar408 |
                  ((short)uVar87 >= (short)uVar408) * uVar87;
        uVar415 = ((short)uVar89 < (short)uVar415) * uVar415 |
                  ((short)uVar89 >= (short)uVar415) * uVar89;
        uVar422 = ((short)uVar91 < (short)uVar422) * uVar422 |
                  ((short)uVar91 >= (short)uVar422) * uVar91;
        uVar429 = ((short)uVar94 < (short)uVar429) * uVar429 |
                  ((short)uVar94 >= (short)uVar429) * uVar94;
        uVar458 = (ushort)(sVar366 < (short)uVar244) * sVar366 |
                  (sVar366 >= (short)uVar244) * uVar244;
        uVar469 = (ushort)(sVar390 < (short)uVar258) * sVar390 |
                  (sVar390 >= (short)uVar258) * uVar258;
        uVar471 = (ushort)(sVar397 < (short)uVar274) * sVar397 |
                  (sVar397 >= (short)uVar274) * uVar274;
        uVar474 = (ushort)(sVar403 < (short)uVar291) * sVar403 |
                  (sVar403 >= (short)uVar291) * uVar291;
        uVar477 = (ushort)(sVar409 < (short)uVar414) * sVar409 |
                  (sVar409 >= (short)uVar414) * uVar414;
        uVar479 = (ushort)(sVar416 < (short)uVar486) * sVar416 |
                  (sVar416 >= (short)uVar486) * uVar486;
        uVar481 = (ushort)(sVar423 < (short)uVar488) * sVar423 |
                  (sVar423 >= (short)uVar488) * uVar488;
        uVar483 = (ushort)(sVar430 < (short)uVar490) * sVar430 |
                  (sVar430 >= (short)uVar490) * uVar490;
        auVar375 = auVar375 & _DAT_00566860;
        sVar20 = auVar375._0_2_;
        uVar60 = (sVar20 < (short)uVar250) * uVar250 | (ushort)(sVar20 >= (short)uVar250) * sVar20;
        sVar20 = auVar375._2_2_;
        uVar81 = (sVar20 < (short)uVar266) * uVar266 | (ushort)(sVar20 >= (short)uVar266) * sVar20;
        sVar20 = auVar375._4_2_;
        uVar83 = (sVar20 < (short)uVar283) * uVar283 | (ushort)(sVar20 >= (short)uVar283) * sVar20;
        sVar20 = auVar375._6_2_;
        uVar85 = (sVar20 < (short)uVar401) * uVar401 | (ushort)(sVar20 >= (short)uVar401) * sVar20;
        sVar20 = auVar375._8_2_;
        uVar87 = (sVar20 < (short)uVar421) * uVar421 | (ushort)(sVar20 >= (short)uVar421) * sVar20;
        sVar20 = auVar375._10_2_;
        uVar89 = (sVar20 < (short)uVar487) * uVar487 | (ushort)(sVar20 >= (short)uVar487) * sVar20;
        sVar20 = auVar375._12_2_;
        sVar21 = auVar375._14_2_;
        uVar91 = (sVar20 < (short)uVar489) * uVar489 | (ushort)(sVar20 >= (short)uVar489) * sVar20;
        uVar94 = (sVar21 < (short)uVar491) * uVar491 | (ushort)(sVar21 >= (short)uVar491) * sVar21;
        uVar486 = ((short)uVar60 < (short)uVar215) * uVar215 |
                  ((short)uVar60 >= (short)uVar215) * uVar60;
        uVar487 = ((short)uVar81 < (short)uVar364) * uVar364 |
                  ((short)uVar81 >= (short)uVar364) * uVar81;
        uVar488 = ((short)uVar83 < (short)uVar388) * uVar388 |
                  ((short)uVar83 >= (short)uVar388) * uVar83;
        uVar489 = ((short)uVar85 < (short)uVar395) * uVar395 |
                  ((short)uVar85 >= (short)uVar395) * uVar85;
        uVar490 = ((short)uVar87 < (short)uVar407) * uVar407 |
                  ((short)uVar87 >= (short)uVar407) * uVar87;
        uVar491 = ((short)uVar89 < (short)uVar428) * uVar428 |
                  ((short)uVar89 >= (short)uVar428) * uVar89;
        uVar92 = ((short)uVar91 < (short)uVar92) * uVar92 |
                 ((short)uVar91 >= (short)uVar92) * uVar91;
        uVar95 = ((short)uVar94 < (short)uVar95) * uVar95 |
                 ((short)uVar94 >= (short)uVar95) * uVar94;
        uVar60 = (ushort)(sVar434 < sVar302) * sVar434 | (ushort)(sVar434 >= sVar302) * sVar302;
        uVar83 = (ushort)(sVar444 < sVar320) * sVar444 | (ushort)(sVar444 >= sVar320) * sVar320;
        uVar87 = (ushort)(sVar446 < sVar324) * sVar446 | (ushort)(sVar446 >= sVar324) * sVar324;
        uVar91 = (ushort)(sVar448 < sVar329) * sVar448 | (ushort)(sVar448 >= sVar329) * sVar329;
        uVar215 = (ushort)(sVar450 < sVar334) * sVar450 | (ushort)(sVar450 >= sVar334) * sVar334;
        uVar250 = (ushort)(sVar452 < sVar339) * sVar452 | (ushort)(sVar452 >= sVar339) * sVar339;
        uVar258 = (ushort)(sVar454 < sVar344) * sVar454 | (ushort)(sVar454 >= sVar344) * sVar344;
        uVar388 = (ushort)(sVar456 < sVar350) * sVar456 | (ushort)(sVar456 >= sVar350) * sVar350;
        auVar97 = auVar97 & _DAT_00566860;
        auVar162 = auVar162 & _DAT_00566860;
        sVar20 = auVar97._0_2_;
        sVar21 = auVar162._0_2_;
        uVar81 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._2_2_;
        sVar21 = auVar162._2_2_;
        uVar85 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._4_2_;
        sVar21 = auVar162._4_2_;
        uVar89 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._6_2_;
        sVar21 = auVar162._6_2_;
        uVar94 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._8_2_;
        sVar21 = auVar162._8_2_;
        uVar244 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._10_2_;
        sVar21 = auVar162._10_2_;
        uVar364 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._12_2_;
        sVar21 = auVar162._12_2_;
        sVar34 = auVar162._14_2_;
        uVar266 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar97._14_2_;
        uVar274 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        uVar435 = (ushort)(sVar218 < sVar217) * sVar218 | (ushort)(sVar218 >= sVar217) * sVar217;
        uVar445 = (ushort)(sVar247 < sVar246) * sVar247 | (ushort)(sVar247 >= sVar246) * sVar246;
        uVar447 = (ushort)(sVar253 < sVar252) * sVar253 | (ushort)(sVar253 >= sVar252) * sVar252;
        uVar449 = (ushort)(sVar261 < sVar260) * sVar261 | (ushort)(sVar261 >= sVar260) * sVar260;
        uVar451 = (ushort)(sVar269 < sVar268) * sVar269 | (ushort)(sVar269 >= sVar268) * sVar268;
        uVar453 = (ushort)(sVar277 < sVar276) * sVar277 | (ushort)(sVar277 >= sVar276) * sVar276;
        uVar455 = (ushort)(sVar286 < sVar285) * sVar286 | (ushort)(sVar286 >= sVar285) * sVar285;
        uVar457 = (ushort)(sVar294 < sVar293) * sVar294 | (ushort)(sVar294 >= sVar293) * sVar293;
        auVar354 = auVar354 & _DAT_00566860;
        auVar228 = auVar228 & _DAT_00566860;
        sVar20 = auVar354._0_2_;
        sVar21 = auVar228._0_2_;
        uVar283 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._2_2_;
        sVar21 = auVar228._2_2_;
        uVar395 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._4_2_;
        sVar21 = auVar228._4_2_;
        uVar291 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._6_2_;
        sVar21 = auVar228._6_2_;
        uVar401 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._8_2_;
        sVar21 = auVar228._8_2_;
        uVar407 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._10_2_;
        sVar21 = auVar228._10_2_;
        uVar414 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._12_2_;
        sVar21 = auVar228._12_2_;
        sVar34 = auVar228._14_2_;
        uVar421 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar354._14_2_;
        uVar428 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        uVar526 = (ushort)(sVar158 < (short)uVar60) * sVar158 | (sVar158 >= (short)uVar60) * uVar60;
        uVar529 = (ushort)(sVar179 < (short)uVar83) * sVar179 | (sVar179 >= (short)uVar83) * uVar83;
        uVar530 = (ushort)(sVar183 < (short)uVar87) * sVar183 | (sVar183 >= (short)uVar87) * uVar87;
        uVar531 = (ushort)(sVar187 < (short)uVar91) * sVar187 | (sVar187 >= (short)uVar91) * uVar91;
        uVar532 = (ushort)(sVar192 < (short)uVar215) * sVar192 |
                  (sVar192 >= (short)uVar215) * uVar215;
        uVar533 = (ushort)(sVar197 < (short)uVar250) * sVar197 |
                  (sVar197 >= (short)uVar250) * uVar250;
        uVar534 = (ushort)(sVar203 < (short)uVar258) * sVar203 |
                  (sVar203 >= (short)uVar258) * uVar258;
        uVar535 = (ushort)(sVar209 < (short)uVar388) * sVar209 |
                  (sVar209 >= (short)uVar388) * uVar388;
        auVar222 = auVar222 & _DAT_00566860;
        sVar20 = auVar222._0_2_;
        uVar60 = (sVar20 < (short)uVar81) * uVar81 | (ushort)(sVar20 >= (short)uVar81) * sVar20;
        sVar20 = auVar222._2_2_;
        uVar81 = (sVar20 < (short)uVar85) * uVar85 | (ushort)(sVar20 >= (short)uVar85) * sVar20;
        sVar20 = auVar222._4_2_;
        uVar83 = (sVar20 < (short)uVar89) * uVar89 | (ushort)(sVar20 >= (short)uVar89) * sVar20;
        sVar20 = auVar222._6_2_;
        uVar85 = (sVar20 < (short)uVar94) * uVar94 | (ushort)(sVar20 >= (short)uVar94) * sVar20;
        sVar20 = auVar222._8_2_;
        uVar87 = (sVar20 < (short)uVar244) * uVar244 | (ushort)(sVar20 >= (short)uVar244) * sVar20;
        sVar20 = auVar222._10_2_;
        uVar89 = (sVar20 < (short)uVar364) * uVar364 | (ushort)(sVar20 >= (short)uVar364) * sVar20;
        sVar20 = auVar222._12_2_;
        sVar21 = auVar222._14_2_;
        uVar91 = (sVar20 < (short)uVar266) * uVar266 | (ushort)(sVar20 >= (short)uVar266) * sVar20;
        uVar94 = (sVar21 < (short)uVar274) * uVar274 | (ushort)(sVar21 >= (short)uVar274) * sVar21;
        uVar435 = (ushort)(sVar86 < (short)uVar435) * sVar86 | (sVar86 >= (short)uVar435) * uVar435;
        uVar445 = (ushort)(sVar96 < (short)uVar445) * sVar96 | (sVar96 >= (short)uVar445) * uVar445;
        uVar447 = (ushort)(sVar119 < (short)uVar447) * sVar119 |
                  (sVar119 >= (short)uVar447) * uVar447;
        uVar449 = (ushort)(sVar123 < (short)uVar449) * sVar123 |
                  (sVar123 >= (short)uVar449) * uVar449;
        uVar451 = (ushort)(sVar130 < (short)uVar451) * sVar130 |
                  (sVar130 >= (short)uVar451) * uVar451;
        uVar453 = (ushort)(sVar137 < (short)uVar453) * sVar137 |
                  (sVar137 >= (short)uVar453) * uVar453;
        uVar455 = (ushort)(sVar144 < (short)uVar455) * sVar144 |
                  (sVar144 >= (short)uVar455) * uVar455;
        uVar457 = (ushort)(sVar151 < (short)uVar457) * sVar151 |
                  (sVar151 >= (short)uVar457) * uVar457;
        auVar436 = auVar436 & _DAT_00566860;
        sVar20 = auVar436._0_2_;
        uVar215 = (sVar20 < (short)uVar283) * uVar283 | (ushort)(sVar20 >= (short)uVar283) * sVar20;
        sVar20 = auVar436._2_2_;
        uVar244 = (sVar20 < (short)uVar395) * uVar395 | (ushort)(sVar20 >= (short)uVar395) * sVar20;
        sVar20 = auVar436._4_2_;
        uVar250 = (sVar20 < (short)uVar291) * uVar291 | (ushort)(sVar20 >= (short)uVar291) * sVar20;
        sVar20 = auVar436._6_2_;
        uVar364 = (sVar20 < (short)uVar401) * uVar401 | (ushort)(sVar20 >= (short)uVar401) * sVar20;
        sVar20 = auVar436._8_2_;
        uVar258 = (sVar20 < (short)uVar407) * uVar407 | (ushort)(sVar20 >= (short)uVar407) * sVar20;
        sVar20 = auVar436._10_2_;
        uVar266 = (sVar20 < (short)uVar414) * uVar414 | (ushort)(sVar20 >= (short)uVar414) * sVar20;
        sVar20 = auVar436._12_2_;
        sVar21 = auVar436._14_2_;
        uVar388 = (sVar20 < (short)uVar421) * uVar421 | (ushort)(sVar20 >= (short)uVar421) * sVar20;
        uVar274 = (sVar21 < (short)uVar428) * uVar428 | (ushort)(sVar21 >= (short)uVar428) * sVar21;
        uVar526 = (ushort)(sVar159 < (short)uVar526) * sVar159 |
                  (sVar159 >= (short)uVar526) * uVar526;
        uVar529 = (ushort)(sVar180 < (short)uVar529) * sVar180 |
                  (sVar180 >= (short)uVar529) * uVar529;
        uVar530 = (ushort)(sVar184 < (short)uVar530) * sVar184 |
                  (sVar184 >= (short)uVar530) * uVar530;
        uVar531 = (ushort)(sVar188 < (short)uVar531) * sVar188 |
                  (sVar188 >= (short)uVar531) * uVar531;
        uVar532 = (ushort)(sVar193 < (short)uVar532) * sVar193 |
                  (sVar193 >= (short)uVar532) * uVar532;
        uVar533 = (ushort)(sVar198 < (short)uVar533) * sVar198 |
                  (sVar198 >= (short)uVar533) * uVar533;
        uVar534 = (ushort)(sVar204 < (short)uVar534) * sVar204 |
                  (sVar204 >= (short)uVar534) * uVar534;
        uVar535 = (ushort)(sVar210 < (short)uVar535) * sVar210 |
                  (sVar210 >= (short)uVar535) * uVar535;
        auVar168 = auVar168 & _DAT_00566860;
        sVar20 = auVar168._0_2_;
        uVar60 = (sVar20 < (short)uVar60) * uVar60 | (ushort)(sVar20 >= (short)uVar60) * sVar20;
        sVar20 = auVar168._2_2_;
        uVar81 = (sVar20 < (short)uVar81) * uVar81 | (ushort)(sVar20 >= (short)uVar81) * sVar20;
        sVar20 = auVar168._4_2_;
        uVar83 = (sVar20 < (short)uVar83) * uVar83 | (ushort)(sVar20 >= (short)uVar83) * sVar20;
        sVar20 = auVar168._6_2_;
        uVar85 = (sVar20 < (short)uVar85) * uVar85 | (ushort)(sVar20 >= (short)uVar85) * sVar20;
        sVar20 = auVar168._8_2_;
        uVar87 = (sVar20 < (short)uVar87) * uVar87 | (ushort)(sVar20 >= (short)uVar87) * sVar20;
        sVar20 = auVar168._10_2_;
        uVar89 = (sVar20 < (short)uVar89) * uVar89 | (ushort)(sVar20 >= (short)uVar89) * sVar20;
        sVar20 = auVar168._12_2_;
        sVar21 = auVar168._14_2_;
        uVar91 = (sVar20 < (short)uVar91) * uVar91 | (ushort)(sVar20 >= (short)uVar91) * sVar20;
        uVar94 = (sVar21 < (short)uVar94) * uVar94 | (ushort)(sVar21 >= (short)uVar94) * sVar21;
        uVar283 = ((short)uVar60 < (short)uVar365) * uVar365 |
                  ((short)uVar60 >= (short)uVar365) * uVar60;
        uVar395 = ((short)uVar81 < (short)uVar389) * uVar389 |
                  ((short)uVar81 >= (short)uVar389) * uVar81;
        uVar291 = ((short)uVar83 < (short)uVar396) * uVar396 |
                  ((short)uVar83 >= (short)uVar396) * uVar83;
        uVar401 = ((short)uVar85 < (short)uVar402) * uVar402 |
                  ((short)uVar85 >= (short)uVar402) * uVar85;
        uVar407 = ((short)uVar87 < (short)uVar408) * uVar408 |
                  ((short)uVar87 >= (short)uVar408) * uVar87;
        uVar414 = ((short)uVar89 < (short)uVar415) * uVar415 |
                  ((short)uVar89 >= (short)uVar415) * uVar89;
        uVar421 = ((short)uVar91 < (short)uVar422) * uVar422 |
                  ((short)uVar91 >= (short)uVar422) * uVar91;
        uVar428 = ((short)uVar94 < (short)uVar429) * uVar429 |
                  ((short)uVar94 >= (short)uVar429) * uVar94;
        uVar365 = (ushort)(sVar88 < (short)uVar435) * sVar88 | (sVar88 >= (short)uVar435) * uVar435;
        uVar389 = (ushort)(sVar116 < (short)uVar445) * sVar116 |
                  (sVar116 >= (short)uVar445) * uVar445;
        uVar396 = (ushort)(sVar120 < (short)uVar447) * sVar120 |
                  (sVar120 >= (short)uVar447) * uVar447;
        uVar402 = (ushort)(sVar124 < (short)uVar449) * sVar124 |
                  (sVar124 >= (short)uVar449) * uVar449;
        uVar408 = (ushort)(sVar131 < (short)uVar451) * sVar131 |
                  (sVar131 >= (short)uVar451) * uVar451;
        uVar415 = (ushort)(sVar138 < (short)uVar453) * sVar138 |
                  (sVar138 >= (short)uVar453) * uVar453;
        uVar422 = (ushort)(sVar145 < (short)uVar455) * sVar145 |
                  (sVar145 >= (short)uVar455) * uVar455;
        uVar429 = (ushort)(sVar152 < (short)uVar457) * sVar152 |
                  (sVar152 >= (short)uVar457) * uVar457;
        auVar64 = auVar64 & _DAT_00566860;
        sVar20 = auVar64._0_2_;
        uVar60 = (sVar20 < (short)uVar215) * uVar215 | (ushort)(sVar20 >= (short)uVar215) * sVar20;
        sVar20 = auVar64._2_2_;
        uVar81 = (sVar20 < (short)uVar244) * uVar244 | (ushort)(sVar20 >= (short)uVar244) * sVar20;
        sVar20 = auVar64._4_2_;
        uVar83 = (sVar20 < (short)uVar250) * uVar250 | (ushort)(sVar20 >= (short)uVar250) * sVar20;
        sVar20 = auVar64._6_2_;
        uVar85 = (sVar20 < (short)uVar364) * uVar364 | (ushort)(sVar20 >= (short)uVar364) * sVar20;
        sVar20 = auVar64._8_2_;
        uVar87 = (sVar20 < (short)uVar258) * uVar258 | (ushort)(sVar20 >= (short)uVar258) * sVar20;
        sVar20 = auVar64._10_2_;
        uVar89 = (sVar20 < (short)uVar266) * uVar266 | (ushort)(sVar20 >= (short)uVar266) * sVar20;
        sVar20 = auVar64._12_2_;
        sVar21 = auVar64._14_2_;
        uVar91 = (sVar20 < (short)uVar388) * uVar388 | (ushort)(sVar20 >= (short)uVar388) * sVar20;
        uVar94 = (sVar21 < (short)uVar274) * uVar274 | (ushort)(sVar21 >= (short)uVar274) * sVar21;
        uVar60 = ((short)uVar60 < (short)uVar486) * uVar486 |
                 ((short)uVar60 >= (short)uVar486) * uVar60;
        uVar81 = ((short)uVar81 < (short)uVar487) * uVar487 |
                 ((short)uVar81 >= (short)uVar487) * uVar81;
        uVar83 = ((short)uVar83 < (short)uVar488) * uVar488 |
                 ((short)uVar83 >= (short)uVar488) * uVar83;
        uVar85 = ((short)uVar85 < (short)uVar489) * uVar489 |
                 ((short)uVar85 >= (short)uVar489) * uVar85;
        uVar87 = ((short)uVar87 < (short)uVar490) * uVar490 |
                 ((short)uVar87 >= (short)uVar490) * uVar87;
        uVar89 = ((short)uVar89 < (short)uVar491) * uVar491 |
                 ((short)uVar89 >= (short)uVar491) * uVar89;
        uVar91 = ((short)uVar91 < (short)uVar92) * uVar92 |
                 ((short)uVar91 >= (short)uVar92) * uVar91;
        uVar94 = ((short)uVar94 < (short)uVar95) * uVar95 |
                 ((short)uVar94 >= (short)uVar95) * uVar94;
        uVar486 = (ushort)(sVar93 < sVar90) * sVar93 | (ushort)(sVar93 >= sVar90) * sVar90;
        uVar487 = (ushort)(sVar118 < sVar117) * sVar118 | (ushort)(sVar118 >= sVar117) * sVar117;
        uVar92 = (ushort)(sVar122 < sVar121) * sVar122 | (ushort)(sVar122 >= sVar121) * sVar121;
        uVar488 = (ushort)(sVar126 < sVar125) * sVar126 | (ushort)(sVar126 >= sVar125) * sVar125;
        uVar489 = (ushort)(sVar133 < sVar132) * sVar133 | (ushort)(sVar133 >= sVar132) * sVar132;
        uVar95 = (ushort)(sVar140 < sVar139) * sVar140 | (ushort)(sVar140 >= sVar139) * sVar139;
        uVar490 = (ushort)(sVar147 < sVar146) * sVar147 | (ushort)(sVar147 >= sVar146) * sVar146;
        uVar491 = (ushort)(sVar154 < sVar153) * sVar154 | (ushort)(sVar154 >= sVar153) * sVar153;
        auVar437 = auVar437 & _DAT_00566860;
        auVar232 = in_XMM6 & _DAT_00566860;
        sVar20 = auVar437._0_2_;
        sVar21 = auVar232._0_2_;
        uVar215 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._2_2_;
        sVar21 = auVar232._2_2_;
        uVar244 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._4_2_;
        sVar21 = auVar232._4_2_;
        uVar250 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._6_2_;
        sVar21 = auVar232._6_2_;
        uVar364 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._8_2_;
        sVar21 = auVar232._8_2_;
        uVar258 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._10_2_;
        sVar21 = auVar232._10_2_;
        uVar266 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._12_2_;
        sVar21 = auVar232._12_2_;
        sVar34 = auVar232._14_2_;
        uVar388 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = auVar437._14_2_;
        uVar274 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        in_XMM3._0_2_ =
             ((short)uVar215 < (short)uVar283) * uVar283 |
             ((short)uVar215 >= (short)uVar283) * uVar215;
        in_XMM3._2_2_ =
             ((short)uVar244 < (short)uVar395) * uVar395 |
             ((short)uVar244 >= (short)uVar395) * uVar244;
        in_XMM3._4_2_ =
             ((short)uVar250 < (short)uVar291) * uVar291 |
             ((short)uVar250 >= (short)uVar291) * uVar250;
        in_XMM3._6_2_ =
             ((short)uVar364 < (short)uVar401) * uVar401 |
             ((short)uVar364 >= (short)uVar401) * uVar364;
        in_XMM3._8_2_ =
             ((short)uVar258 < (short)uVar407) * uVar407 |
             ((short)uVar258 >= (short)uVar407) * uVar258;
        in_XMM3._10_2_ =
             ((short)uVar266 < (short)uVar414) * uVar414 |
             ((short)uVar266 >= (short)uVar414) * uVar266;
        in_XMM3._12_2_ =
             ((short)uVar388 < (short)uVar421) * uVar421 |
             ((short)uVar388 >= (short)uVar421) * uVar388;
        in_XMM3._14_2_ =
             ((short)uVar274 < (short)uVar428) * uVar428 |
             ((short)uVar274 >= (short)uVar428) * uVar274;
        uVar283 = (ushort)(sVar36 < sVar35) * sVar36 | (ushort)(sVar36 >= sVar35) * sVar35;
        uVar395 = (ushort)(sVar38 < sVar37) * sVar38 | (ushort)(sVar38 >= sVar37) * sVar37;
        uVar291 = (ushort)(sVar41 < sVar39) * sVar41 | (ushort)(sVar41 >= sVar39) * sVar39;
        uVar401 = (ushort)(sVar49 < sVar47) * sVar49 | (ushort)(sVar49 >= sVar47) * sVar47;
        uVar407 = (ushort)(sVar53 < sVar51) * sVar53 | (ushort)(sVar53 >= sVar51) * sVar51;
        uVar414 = (ushort)(sVar56 < sVar55) * sVar56 | (ushort)(sVar56 >= sVar55) * sVar55;
        uVar421 = (ushort)(sVar59 < sVar58) * sVar59 | (ushort)(sVar59 >= sVar58) * sVar58;
        uVar428 = (ushort)(sVar84 < sVar82) * sVar84 | (ushort)(sVar84 >= sVar82) * sVar82;
        auVar44._0_8_ = auVar380._0_8_ & (ulong)DAT_00566860;
        auVar44._8_8_ = auVar380._8_8_ & DAT_00566860._8_8_;
        auVar230 = auVar230 & _DAT_00566860;
        sVar20 = (short)auVar44._0_8_;
        sVar21 = auVar230._0_2_;
        uVar215 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._0_8_ >> 0x10);
        sVar21 = auVar230._2_2_;
        uVar244 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._0_8_ >> 0x20);
        sVar21 = auVar230._4_2_;
        uVar250 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._0_8_ >> 0x30);
        sVar21 = auVar230._6_2_;
        uVar364 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)auVar44._8_8_;
        sVar21 = auVar230._8_2_;
        uVar258 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._8_8_ >> 0x10);
        sVar21 = auVar230._10_2_;
        uVar266 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._8_8_ >> 0x20);
        sVar21 = auVar230._12_2_;
        sVar34 = auVar230._14_2_;
        uVar388 = (ushort)(sVar21 < sVar20) * sVar20 | (ushort)(sVar21 >= sVar20) * sVar21;
        sVar20 = (short)(auVar44._8_8_ >> 0x30);
        uVar274 = (ushort)(sVar34 < sVar20) * sVar20 | (ushort)(sVar34 >= sVar20) * sVar34;
        in_XMM2._0_2_ =
             ((short)uVar215 < (short)uVar60) * uVar60 | ((short)uVar215 >= (short)uVar60) * uVar215
        ;
        in_XMM2._2_2_ =
             ((short)uVar244 < (short)uVar81) * uVar81 | ((short)uVar244 >= (short)uVar81) * uVar244
        ;
        in_XMM2._4_2_ =
             ((short)uVar250 < (short)uVar83) * uVar83 | ((short)uVar250 >= (short)uVar83) * uVar250
        ;
        in_XMM2._6_2_ =
             ((short)uVar364 < (short)uVar85) * uVar85 | ((short)uVar364 >= (short)uVar85) * uVar364
        ;
        in_XMM2._8_2_ =
             ((short)uVar258 < (short)uVar87) * uVar87 | ((short)uVar258 >= (short)uVar87) * uVar258
        ;
        in_XMM2._10_2_ =
             ((short)uVar266 < (short)uVar89) * uVar89 | ((short)uVar266 >= (short)uVar89) * uVar266
        ;
        in_XMM2._12_2_ =
             ((short)uVar388 < (short)uVar91) * uVar91 | ((short)uVar388 >= (short)uVar91) * uVar388
        ;
        in_XMM2._14_2_ =
             ((short)uVar274 < (short)uVar94) * uVar94 | ((short)uVar274 >= (short)uVar94) * uVar274
        ;
        uVar60 = ((short)auVar67._0_2_ < (short)in_XMM9._0_2_) * auVar67._0_2_ |
                 ((short)auVar67._0_2_ >= (short)in_XMM9._0_2_) * in_XMM9._0_2_;
        uVar81 = ((short)auVar67._2_2_ < (short)in_XMM9._2_2_) * auVar67._2_2_ |
                 ((short)auVar67._2_2_ >= (short)in_XMM9._2_2_) * in_XMM9._2_2_;
        uVar83 = ((short)auVar67._4_2_ < (short)in_XMM9._4_2_) * auVar67._4_2_ |
                 ((short)auVar67._4_2_ >= (short)in_XMM9._4_2_) * in_XMM9._4_2_;
        uVar85 = ((short)auVar67._6_2_ < (short)in_XMM9._6_2_) * auVar67._6_2_ |
                 ((short)auVar67._6_2_ >= (short)in_XMM9._6_2_) * in_XMM9._6_2_;
        uVar87 = ((short)auVar67._8_2_ < (short)in_XMM9._8_2_) * auVar67._8_2_ |
                 ((short)auVar67._8_2_ >= (short)in_XMM9._8_2_) * in_XMM9._8_2_;
        uVar89 = ((short)auVar67._10_2_ < (short)in_XMM9._10_2_) * auVar67._10_2_ |
                 ((short)auVar67._10_2_ >= (short)in_XMM9._10_2_) * in_XMM9._10_2_;
        uVar91 = ((short)auVar67._12_2_ < (short)in_XMM9._12_2_) * auVar67._12_2_ |
                 ((short)auVar67._12_2_ >= (short)in_XMM9._12_2_) * in_XMM9._12_2_;
        uVar94 = ((short)auVar67._14_2_ < (short)in_XMM9._14_2_) * auVar67._14_2_ |
                 ((short)auVar67._14_2_ >= (short)in_XMM9._14_2_) * in_XMM9._14_2_;
        uVar215 = ((short)uVar216 < (short)uVar458) * uVar216 |
                  ((short)uVar216 >= (short)uVar458) * uVar458;
        uVar244 = ((short)uVar245 < (short)uVar469) * uVar245 |
                  ((short)uVar245 >= (short)uVar469) * uVar469;
        uVar250 = ((short)uVar251 < (short)uVar471) * uVar251 |
                  ((short)uVar251 >= (short)uVar471) * uVar471;
        uVar364 = ((short)uVar259 < (short)uVar474) * uVar259 |
                  ((short)uVar259 >= (short)uVar474) * uVar474;
        uVar258 = ((short)uVar267 < (short)uVar477) * uVar267 |
                  ((short)uVar267 >= (short)uVar477) * uVar477;
        uVar266 = ((short)uVar275 < (short)uVar479) * uVar275 |
                  ((short)uVar275 >= (short)uVar479) * uVar479;
        uVar388 = ((short)uVar284 < (short)uVar481) * uVar284 |
                  ((short)uVar284 >= (short)uVar481) * uVar481;
        uVar274 = ((short)uVar292 < (short)uVar483) * uVar292 |
                  ((short)uVar292 >= (short)uVar483) * uVar483;
        in_XMM13._0_2_ =
             ((short)uVar60 < (short)uVar526) * uVar60 | ((short)uVar60 >= (short)uVar526) * uVar526
        ;
        in_XMM13._2_2_ =
             ((short)uVar81 < (short)uVar529) * uVar81 | ((short)uVar81 >= (short)uVar529) * uVar529
        ;
        in_XMM13._4_2_ =
             ((short)uVar83 < (short)uVar530) * uVar83 | ((short)uVar83 >= (short)uVar530) * uVar530
        ;
        in_XMM13._6_2_ =
             ((short)uVar85 < (short)uVar531) * uVar85 | ((short)uVar85 >= (short)uVar531) * uVar531
        ;
        in_XMM13._8_2_ =
             ((short)uVar87 < (short)uVar532) * uVar87 | ((short)uVar87 >= (short)uVar532) * uVar532
        ;
        in_XMM13._10_2_ =
             ((short)uVar89 < (short)uVar533) * uVar89 | ((short)uVar89 >= (short)uVar533) * uVar533
        ;
        in_XMM13._12_2_ =
             ((short)uVar91 < (short)uVar534) * uVar91 | ((short)uVar91 >= (short)uVar534) * uVar534
        ;
        in_XMM13._14_2_ =
             ((short)uVar94 < (short)uVar535) * uVar94 | ((short)uVar94 >= (short)uVar535) * uVar535
        ;
        in_XMM7._0_2_ =
             ((short)uVar215 < (short)uVar365) * uVar215 |
             ((short)uVar215 >= (short)uVar365) * uVar365;
        in_XMM7._2_2_ =
             ((short)uVar244 < (short)uVar389) * uVar244 |
             ((short)uVar244 >= (short)uVar389) * uVar389;
        in_XMM7._4_2_ =
             ((short)uVar250 < (short)uVar396) * uVar250 |
             ((short)uVar250 >= (short)uVar396) * uVar396;
        in_XMM7._6_2_ =
             ((short)uVar364 < (short)uVar402) * uVar364 |
             ((short)uVar364 >= (short)uVar402) * uVar402;
        in_XMM7._8_2_ =
             ((short)uVar258 < (short)uVar408) * uVar258 |
             ((short)uVar258 >= (short)uVar408) * uVar408;
        in_XMM7._10_2_ =
             ((short)uVar266 < (short)uVar415) * uVar266 |
             ((short)uVar266 >= (short)uVar415) * uVar415;
        in_XMM7._12_2_ =
             ((short)uVar388 < (short)uVar422) * uVar388 |
             ((short)uVar388 >= (short)uVar422) * uVar422;
        in_XMM7._14_2_ =
             ((short)uVar274 < (short)uVar429) * uVar274 |
             ((short)uVar274 >= (short)uVar429) * uVar429;
        uVar60 = ((short)in_XMM13._0_2_ < (short)uVar486) * in_XMM13._0_2_ |
                 ((short)in_XMM13._0_2_ >= (short)uVar486) * uVar486;
        uVar81 = ((short)in_XMM13._2_2_ < (short)uVar487) * in_XMM13._2_2_ |
                 ((short)in_XMM13._2_2_ >= (short)uVar487) * uVar487;
        uVar83 = ((short)in_XMM13._4_2_ < (short)uVar92) * in_XMM13._4_2_ |
                 ((short)in_XMM13._4_2_ >= (short)uVar92) * uVar92;
        uVar85 = ((short)in_XMM13._6_2_ < (short)uVar488) * in_XMM13._6_2_ |
                 ((short)in_XMM13._6_2_ >= (short)uVar488) * uVar488;
        uVar87 = ((short)in_XMM13._8_2_ < (short)uVar489) * in_XMM13._8_2_ |
                 ((short)in_XMM13._8_2_ >= (short)uVar489) * uVar489;
        uVar89 = ((short)in_XMM13._10_2_ < (short)uVar95) * in_XMM13._10_2_ |
                 ((short)in_XMM13._10_2_ >= (short)uVar95) * uVar95;
        uVar91 = ((short)in_XMM13._12_2_ < (short)uVar490) * in_XMM13._12_2_ |
                 ((short)in_XMM13._12_2_ >= (short)uVar490) * uVar490;
        uVar94 = ((short)in_XMM13._14_2_ < (short)uVar491) * in_XMM13._14_2_ |
                 ((short)in_XMM13._14_2_ >= (short)uVar491) * uVar491;
        uVar215 = ((short)in_XMM7._0_2_ < (short)uVar283) * in_XMM7._0_2_ |
                  ((short)in_XMM7._0_2_ >= (short)uVar283) * uVar283;
        uVar244 = ((short)in_XMM7._2_2_ < (short)uVar395) * in_XMM7._2_2_ |
                  ((short)in_XMM7._2_2_ >= (short)uVar395) * uVar395;
        uVar250 = ((short)in_XMM7._4_2_ < (short)uVar291) * in_XMM7._4_2_ |
                  ((short)in_XMM7._4_2_ >= (short)uVar291) * uVar291;
        uVar364 = ((short)in_XMM7._6_2_ < (short)uVar401) * in_XMM7._6_2_ |
                  ((short)in_XMM7._6_2_ >= (short)uVar401) * uVar401;
        uVar258 = ((short)in_XMM7._8_2_ < (short)uVar407) * in_XMM7._8_2_ |
                  ((short)in_XMM7._8_2_ >= (short)uVar407) * uVar407;
        uVar266 = ((short)in_XMM7._10_2_ < (short)uVar414) * in_XMM7._10_2_ |
                  ((short)in_XMM7._10_2_ >= (short)uVar414) * uVar414;
        uVar388 = ((short)in_XMM7._12_2_ < (short)uVar421) * in_XMM7._12_2_ |
                  ((short)in_XMM7._12_2_ >= (short)uVar421) * uVar421;
        uVar274 = ((short)in_XMM7._14_2_ < (short)uVar428) * in_XMM7._14_2_ |
                  ((short)in_XMM7._14_2_ >= (short)uVar428) * uVar428;
        auVar232 = psraw(auVar171,0xf);
        auVar45 = pmovsxbw(auVar44,0x808080808080808);
        auVar172._0_2_ = auVar171._0_2_ + auVar45._0_2_ + auVar232._0_2_;
        auVar172._2_2_ = auVar171._2_2_ + auVar45._2_2_ + auVar232._2_2_;
        auVar172._4_2_ = auVar171._4_2_ + auVar45._4_2_ + auVar232._4_2_;
        auVar172._6_2_ = auVar171._6_2_ + auVar45._6_2_ + auVar232._6_2_;
        auVar172._8_2_ = auVar171._8_2_ + auVar45._8_2_ + auVar232._8_2_;
        auVar172._10_2_ = auVar171._10_2_ + auVar45._10_2_ + auVar232._10_2_;
        auVar172._12_2_ = auVar171._12_2_ + auVar45._12_2_ + auVar232._12_2_;
        auVar172._14_2_ = auVar171._14_2_ + auVar45._14_2_ + auVar232._14_2_;
        auVar232 = psraw(auVar502,0xf);
        auVar503._0_2_ = auVar502._0_2_ + auVar45._0_2_ + auVar232._0_2_;
        auVar503._2_2_ = auVar502._2_2_ + auVar45._2_2_ + auVar232._2_2_;
        auVar503._4_2_ = auVar502._4_2_ + auVar45._4_2_ + auVar232._4_2_;
        auVar503._6_2_ = auVar502._6_2_ + auVar45._6_2_ + auVar232._6_2_;
        auVar503._8_2_ = auVar502._8_2_ + auVar45._8_2_ + auVar232._8_2_;
        auVar503._10_2_ = auVar502._10_2_ + auVar45._10_2_ + auVar232._10_2_;
        auVar503._12_2_ = auVar502._12_2_ + auVar45._12_2_ + auVar232._12_2_;
        auVar503._14_2_ = auVar502._14_2_ + auVar45._14_2_ + auVar232._14_2_;
        auVar232 = psraw(auVar172,4);
        sVar160 = auVar232._0_2_ + sVar160;
        sVar181 = auVar232._2_2_ + sVar181;
        sVar185 = auVar232._4_2_ + sVar185;
        sVar190 = auVar232._6_2_ + sVar190;
        sVar195 = auVar232._8_2_ + sVar195;
        sVar200 = auVar232._10_2_ + sVar200;
        sVar206 = auVar232._12_2_ + sVar206;
        sVar212 = auVar232._14_2_ + sVar212;
        uVar60 = (sVar160 < (short)uVar60) * uVar60 | (ushort)(sVar160 >= (short)uVar60) * sVar160;
        uVar81 = (sVar181 < (short)uVar81) * uVar81 | (ushort)(sVar181 >= (short)uVar81) * sVar181;
        uVar83 = (sVar185 < (short)uVar83) * uVar83 | (ushort)(sVar185 >= (short)uVar83) * sVar185;
        uVar85 = (sVar190 < (short)uVar85) * uVar85 | (ushort)(sVar190 >= (short)uVar85) * sVar190;
        uVar87 = (sVar195 < (short)uVar87) * uVar87 | (ushort)(sVar195 >= (short)uVar87) * sVar195;
        uVar89 = (sVar200 < (short)uVar89) * uVar89 | (ushort)(sVar200 >= (short)uVar89) * sVar200;
        uVar91 = (sVar206 < (short)uVar91) * uVar91 | (ushort)(sVar206 >= (short)uVar91) * sVar206;
        uVar94 = (sVar212 < (short)uVar94) * uVar94 | (ushort)(sVar212 >= (short)uVar94) * sVar212;
        in_XMM4._0_2_ =
             ((short)in_XMM3._0_2_ < (short)uVar60) * in_XMM3._0_2_ |
             ((short)in_XMM3._0_2_ >= (short)uVar60) * uVar60;
        in_XMM4._2_2_ =
             ((short)in_XMM3._2_2_ < (short)uVar81) * in_XMM3._2_2_ |
             ((short)in_XMM3._2_2_ >= (short)uVar81) * uVar81;
        in_XMM4._4_2_ =
             ((short)in_XMM3._4_2_ < (short)uVar83) * in_XMM3._4_2_ |
             ((short)in_XMM3._4_2_ >= (short)uVar83) * uVar83;
        in_XMM4._6_2_ =
             ((short)in_XMM3._6_2_ < (short)uVar85) * in_XMM3._6_2_ |
             ((short)in_XMM3._6_2_ >= (short)uVar85) * uVar85;
        in_XMM4._8_2_ =
             ((short)in_XMM3._8_2_ < (short)uVar87) * in_XMM3._8_2_ |
             ((short)in_XMM3._8_2_ >= (short)uVar87) * uVar87;
        in_XMM4._10_2_ =
             ((short)in_XMM3._10_2_ < (short)uVar89) * in_XMM3._10_2_ |
             ((short)in_XMM3._10_2_ >= (short)uVar89) * uVar89;
        in_XMM4._12_2_ =
             ((short)in_XMM3._12_2_ < (short)uVar91) * in_XMM3._12_2_ |
             ((short)in_XMM3._12_2_ >= (short)uVar91) * uVar91;
        in_XMM4._14_2_ =
             ((short)in_XMM3._14_2_ < (short)uVar94) * in_XMM3._14_2_ |
             ((short)in_XMM3._14_2_ >= (short)uVar94) * uVar94;
        auVar232 = psraw(auVar503,4);
        sVar494 = auVar232._0_2_ + sVar494;
        sVar507 = auVar232._2_2_ + sVar507;
        sVar510 = auVar232._4_2_ + sVar510;
        sVar513 = auVar232._6_2_ + sVar513;
        sVar516 = auVar232._8_2_ + sVar516;
        sVar519 = auVar232._10_2_ + sVar519;
        sVar522 = auVar232._12_2_ + sVar522;
        sVar525 = auVar232._14_2_ + sVar525;
        uVar60 = (sVar494 < (short)uVar215) * uVar215 |
                 (ushort)(sVar494 >= (short)uVar215) * sVar494;
        uVar81 = (sVar507 < (short)uVar244) * uVar244 |
                 (ushort)(sVar507 >= (short)uVar244) * sVar507;
        uVar83 = (sVar510 < (short)uVar250) * uVar250 |
                 (ushort)(sVar510 >= (short)uVar250) * sVar510;
        uVar85 = (sVar513 < (short)uVar364) * uVar364 |
                 (ushort)(sVar513 >= (short)uVar364) * sVar513;
        uVar87 = (sVar516 < (short)uVar258) * uVar258 |
                 (ushort)(sVar516 >= (short)uVar258) * sVar516;
        uVar89 = (sVar519 < (short)uVar266) * uVar266 |
                 (ushort)(sVar519 >= (short)uVar266) * sVar519;
        uVar91 = (sVar522 < (short)uVar388) * uVar388 |
                 (ushort)(sVar522 >= (short)uVar388) * sVar522;
        uVar94 = (sVar525 < (short)uVar274) * uVar274 |
                 (ushort)(sVar525 >= (short)uVar274) * sVar525;
        *(undefined1 (*) [16])dest = in_XMM4;
        puVar1 = (ushort *)((long)*(undefined1 (*) [16])dest + (long)dstride * 2);
        *puVar1 = ((short)in_XMM2._0_2_ < (short)uVar60) * in_XMM2._0_2_ |
                  ((short)in_XMM2._0_2_ >= (short)uVar60) * uVar60;
        puVar1[1] = ((short)in_XMM2._2_2_ < (short)uVar81) * in_XMM2._2_2_ |
                    ((short)in_XMM2._2_2_ >= (short)uVar81) * uVar81;
        puVar1[2] = ((short)in_XMM2._4_2_ < (short)uVar83) * in_XMM2._4_2_ |
                    ((short)in_XMM2._4_2_ >= (short)uVar83) * uVar83;
        puVar1[3] = ((short)in_XMM2._6_2_ < (short)uVar85) * in_XMM2._6_2_ |
                    ((short)in_XMM2._6_2_ >= (short)uVar85) * uVar85;
        puVar1[4] = ((short)in_XMM2._8_2_ < (short)uVar87) * in_XMM2._8_2_ |
                    ((short)in_XMM2._8_2_ >= (short)uVar87) * uVar87;
        puVar1[5] = ((short)in_XMM2._10_2_ < (short)uVar89) * in_XMM2._10_2_ |
                    ((short)in_XMM2._10_2_ >= (short)uVar89) * uVar89;
        puVar1[6] = ((short)in_XMM2._12_2_ < (short)uVar91) * in_XMM2._12_2_ |
                    ((short)in_XMM2._12_2_ >= (short)uVar91) * uVar91;
        puVar1[7] = ((short)in_XMM2._14_2_ < (short)uVar94) * in_XMM2._14_2_ |
                    ((short)in_XMM2._14_2_ >= (short)uVar94) * uVar94;
        uVar9 = uVar9 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      } while (uVar9 < (uint)block_height);
    }
  }
  else {
    uVar17 = pri_damping;
    if (pri_strength != 0) {
      iVar6 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar17 = pri_damping - iVar6;
      if (pri_damping < iVar6) {
        uVar17 = 0;
      }
    }
    uVar18 = sec_damping;
    if (sec_strength != 0) {
      iVar6 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar18 = sec_damping - iVar6;
      if (sec_damping < iVar6) {
        uVar18 = 0;
      }
    }
    if (0 < block_height) {
      auVar23 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      local_138._4_4_ = auVar23._0_4_;
      local_138._0_4_ = local_138._4_4_;
      local_138._8_4_ = local_138._4_4_;
      local_138._12_4_ = local_138._4_4_;
      auVar23 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar19][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar19][0]),0);
      auVar24 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar19][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar19][1]),0);
      local_168 = auVar24._0_2_;
      sStack_166 = auVar24._2_2_;
      auVar24 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
      local_178._4_4_ = auVar24._0_4_;
      local_178._0_4_ = local_178._4_4_;
      local_178._8_4_ = local_178._4_4_;
      local_178._12_4_ = local_178._4_4_;
      auVar24 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
      auVar25 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
      lVar10 = (long)dstride;
      uVar9 = 0;
      do {
        local_238._8_8_ = *(undefined8 *)in;
        local_238._0_8_ = *(undefined8 *)(in + 0x90);
        uVar2 = *(undefined8 *)(in + 0x120);
        uVar3 = *(undefined8 *)(in + 0x1b0);
        auVar371._8_8_ = uVar2;
        auVar371._0_8_ = uVar3;
        local_248._8_8_ = *(undefined8 *)(in + lVar12);
        local_248._0_8_ = *(undefined8 *)(in + lVar12 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar12 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar12 + 0x1b0);
        auVar174._8_8_ = uVar4;
        auVar174._0_8_ = uVar5;
        sVar212 = (short)local_248._0_8_;
        sVar21 = (short)local_238._0_8_;
        auVar162._0_2_ = sVar212 - sVar21;
        sVar46 = (short)((ulong)local_248._0_8_ >> 0x10);
        sVar510 = (short)((ulong)local_238._0_8_ >> 0x10);
        auVar162._2_2_ = sVar46 - sVar510;
        sVar48 = (short)((ulong)local_248._0_8_ >> 0x20);
        sVar36 = (short)((ulong)local_238._0_8_ >> 0x20);
        auVar162._4_2_ = sVar48 - sVar36;
        sVar50 = (short)((ulong)local_248._0_8_ >> 0x30);
        sVar519 = (short)((ulong)local_238._0_8_ >> 0x30);
        auVar162._6_2_ = sVar50 - sVar519;
        sVar52 = (short)local_248._8_8_;
        sVar39 = (short)local_238._8_8_;
        auVar162._8_2_ = sVar52 - sVar39;
        sVar54 = (short)((ulong)local_248._8_8_ >> 0x10);
        sVar160 = (short)((ulong)local_238._8_8_ >> 0x10);
        auVar162._10_2_ = sVar54 - sVar160;
        sVar56 = (short)((ulong)local_248._8_8_ >> 0x20);
        sVar58 = (short)((ulong)local_248._8_8_ >> 0x30);
        sVar190 = (short)((ulong)local_238._8_8_ >> 0x20);
        auVar162._12_2_ = sVar56 - sVar190;
        sVar206 = (short)((ulong)local_238._8_8_ >> 0x30);
        auVar162._14_2_ = sVar58 - sVar206;
        sVar61 = (short)uVar5;
        sVar41 = (short)uVar3;
        auVar75._0_2_ = sVar61 - sVar41;
        sVar82 = (short)((ulong)uVar5 >> 0x10);
        sVar47 = (short)((ulong)uVar3 >> 0x10);
        auVar75._2_2_ = sVar82 - sVar47;
        sVar84 = (short)((ulong)uVar5 >> 0x20);
        sVar49 = (short)((ulong)uVar3 >> 0x20);
        auVar75._4_2_ = sVar84 - sVar49;
        sVar86 = (short)((ulong)uVar5 >> 0x30);
        sVar51 = (short)((ulong)uVar3 >> 0x30);
        auVar75._6_2_ = sVar86 - sVar51;
        sVar88 = (short)uVar4;
        sVar53 = (short)uVar2;
        auVar75._8_2_ = sVar88 - sVar53;
        sVar90 = (short)((ulong)uVar4 >> 0x10);
        sVar55 = (short)((ulong)uVar2 >> 0x10);
        auVar75._10_2_ = sVar90 - sVar55;
        sVar93 = (short)((ulong)uVar4 >> 0x20);
        sVar96 = (short)((ulong)uVar4 >> 0x30);
        sVar57 = (short)((ulong)uVar2 >> 0x20);
        auVar75._12_2_ = sVar93 - sVar57;
        sVar59 = (short)((ulong)uVar2 >> 0x30);
        auVar75._14_2_ = sVar96 - sVar59;
        auVar27 = pabsw(auVar371,auVar162);
        auVar28 = psraw(auVar162,0xf);
        auVar45 = pabsw(auVar174,auVar75);
        auVar232 = psraw(auVar75,0xf);
        local_148 = (ulong)uVar17;
        uVar60 = auVar27._0_2_;
        auVar26._0_2_ = uVar60 >> local_148;
        uVar81 = auVar27._2_2_;
        auVar26._2_2_ = uVar81 >> local_148;
        uVar83 = auVar27._4_2_;
        auVar26._4_2_ = uVar83 >> local_148;
        uVar85 = auVar27._6_2_;
        auVar26._6_2_ = uVar85 >> local_148;
        uVar87 = auVar27._8_2_;
        auVar26._8_2_ = uVar87 >> local_148;
        uVar89 = auVar27._10_2_;
        auVar26._10_2_ = uVar89 >> local_148;
        uVar91 = auVar27._12_2_;
        uVar94 = auVar27._14_2_;
        auVar26._12_2_ = uVar91 >> local_148;
        auVar26._14_2_ = uVar94 >> local_148;
        uVar215 = auVar45._0_2_;
        auVar311._0_2_ = uVar215 >> local_148;
        uVar244 = auVar45._2_2_;
        auVar311._2_2_ = uVar244 >> local_148;
        uVar250 = auVar45._4_2_;
        auVar311._4_2_ = uVar250 >> local_148;
        uVar364 = auVar45._6_2_;
        auVar311._6_2_ = uVar364 >> local_148;
        uVar258 = auVar45._8_2_;
        auVar311._8_2_ = uVar258 >> local_148;
        uVar266 = auVar45._10_2_;
        auVar311._10_2_ = uVar266 >> local_148;
        uVar388 = auVar45._12_2_;
        uVar274 = auVar45._14_2_;
        auVar311._12_2_ = uVar388 >> local_148;
        auVar311._14_2_ = uVar274 >> local_148;
        auVar27 = psubusw(local_138,auVar26);
        auVar26 = psubusw(local_138,auVar311);
        sVar38 = auVar27._0_2_;
        sVar522 = auVar27._2_2_;
        sVar525 = auVar27._4_2_;
        sVar40 = auVar27._6_2_;
        sVar181 = auVar27._8_2_;
        sVar185 = auVar27._10_2_;
        sVar195 = auVar27._12_2_;
        sVar200 = auVar27._14_2_;
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        auVar234._0_2_ =
             (((short)uVar60 < sVar38) * uVar60 | (ushort)((short)uVar60 >= sVar38) * sVar38) +
             auVar28._0_2_;
        auVar234._2_2_ =
             (((short)uVar81 < sVar522) * uVar81 | (ushort)((short)uVar81 >= sVar522) * sVar522) +
             auVar28._2_2_;
        auVar234._4_2_ =
             (((short)uVar83 < sVar525) * uVar83 | (ushort)((short)uVar83 >= sVar525) * sVar525) +
             auVar28._4_2_;
        auVar234._6_2_ =
             (((short)uVar85 < sVar40) * uVar85 | (ushort)((short)uVar85 >= sVar40) * sVar40) +
             auVar28._6_2_;
        auVar234._8_2_ =
             (((short)uVar87 < sVar181) * uVar87 | (ushort)((short)uVar87 >= sVar181) * sVar181) +
             auVar28._8_2_;
        auVar234._10_2_ =
             (((short)uVar89 < sVar185) * uVar89 | (ushort)((short)uVar89 >= sVar185) * sVar185) +
             auVar28._10_2_;
        auVar234._12_2_ =
             (((short)uVar91 < sVar195) * uVar91 | (ushort)((short)uVar91 >= sVar195) * sVar195) +
             auVar28._12_2_;
        auVar234._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar28._14_2_;
        auVar27._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar232._0_2_;
        auVar27._2_2_ =
             (((short)uVar244 < sVar494) * uVar244 | (ushort)((short)uVar244 >= sVar494) * sVar494)
             + auVar232._2_2_;
        auVar27._4_2_ =
             (((short)uVar250 < sVar507) * uVar250 | (ushort)((short)uVar250 >= sVar507) * sVar507)
             + auVar232._4_2_;
        auVar27._6_2_ =
             (((short)uVar364 < sVar34) * uVar364 | (ushort)((short)uVar364 >= sVar34) * sVar34) +
             auVar232._6_2_;
        auVar27._8_2_ =
             (((short)uVar258 < sVar35) * uVar258 | (ushort)((short)uVar258 >= sVar35) * sVar35) +
             auVar232._8_2_;
        auVar27._10_2_ =
             (((short)uVar266 < sVar513) * uVar266 | (ushort)((short)uVar266 >= sVar513) * sVar513)
             + auVar232._10_2_;
        auVar27._12_2_ =
             (((short)uVar388 < sVar516) * uVar388 | (ushort)((short)uVar388 >= sVar516) * sVar516)
             + auVar232._12_2_;
        auVar27._14_2_ =
             (((short)uVar274 < sVar37) * uVar274 | (ushort)((short)uVar274 >= sVar37) * sVar37) +
             auVar232._14_2_;
        auVar234 = auVar234 ^ auVar28;
        auVar27 = auVar27 ^ auVar232;
        uVar2 = *(undefined8 *)(in + -lVar12);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar12));
        auVar436._8_8_ = uVar2;
        auVar436._0_8_ = uVar3;
        uVar4 = *(undefined8 *)(in + (0x120 - lVar12));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar12));
        auVar314._8_8_ = uVar4;
        auVar314._0_8_ = uVar5;
        sVar116 = (short)uVar3;
        auVar312._0_2_ = sVar116 - sVar21;
        sVar118 = (short)((ulong)uVar3 >> 0x10);
        auVar312._2_2_ = sVar118 - sVar510;
        sVar120 = (short)((ulong)uVar3 >> 0x20);
        auVar312._4_2_ = sVar120 - sVar36;
        sVar122 = (short)((ulong)uVar3 >> 0x30);
        auVar312._6_2_ = sVar122 - sVar519;
        sVar124 = (short)uVar2;
        auVar312._8_2_ = sVar124 - sVar39;
        sVar126 = (short)((ulong)uVar2 >> 0x10);
        auVar312._10_2_ = sVar126 - sVar160;
        sVar131 = (short)((ulong)uVar2 >> 0x20);
        sVar133 = (short)((ulong)uVar2 >> 0x30);
        auVar312._12_2_ = sVar131 - sVar190;
        auVar312._14_2_ = sVar133 - sVar206;
        sVar138 = (short)uVar5;
        auVar358._0_2_ = sVar138 - sVar41;
        sVar140 = (short)((ulong)uVar5 >> 0x10);
        auVar358._2_2_ = sVar140 - sVar47;
        sVar145 = (short)((ulong)uVar5 >> 0x20);
        auVar358._4_2_ = sVar145 - sVar49;
        sVar147 = (short)((ulong)uVar5 >> 0x30);
        auVar358._6_2_ = sVar147 - sVar51;
        sVar152 = (short)uVar4;
        auVar358._8_2_ = sVar152 - sVar53;
        sVar154 = (short)((ulong)uVar4 >> 0x10);
        auVar358._10_2_ = sVar154 - sVar55;
        sVar159 = (short)((ulong)uVar4 >> 0x20);
        sVar180 = (short)((ulong)uVar4 >> 0x30);
        auVar358._12_2_ = sVar159 - sVar57;
        auVar358._14_2_ = sVar180 - sVar59;
        auVar304 = pabsw(auVar371,auVar312);
        auVar232 = psraw(auVar312,0xf);
        uVar60 = auVar304._0_2_;
        auVar107._0_2_ = uVar60 >> local_148;
        uVar81 = auVar304._2_2_;
        auVar107._2_2_ = uVar81 >> local_148;
        uVar83 = auVar304._4_2_;
        auVar107._4_2_ = uVar83 >> local_148;
        uVar85 = auVar304._6_2_;
        auVar107._6_2_ = uVar85 >> local_148;
        uVar87 = auVar304._8_2_;
        auVar107._8_2_ = uVar87 >> local_148;
        uVar89 = auVar304._10_2_;
        auVar107._10_2_ = uVar89 >> local_148;
        uVar91 = auVar304._12_2_;
        uVar94 = auVar304._14_2_;
        auVar107._12_2_ = uVar91 >> local_148;
        auVar107._14_2_ = uVar94 >> local_148;
        auVar64 = pabsw(in_XMM9,auVar358);
        uVar215 = auVar64._0_2_;
        auVar461._0_2_ = uVar215 >> local_148;
        uVar244 = auVar64._2_2_;
        auVar461._2_2_ = uVar244 >> local_148;
        uVar250 = auVar64._4_2_;
        auVar461._4_2_ = uVar250 >> local_148;
        uVar364 = auVar64._6_2_;
        auVar461._6_2_ = uVar364 >> local_148;
        uVar258 = auVar64._8_2_;
        auVar461._8_2_ = uVar258 >> local_148;
        uVar266 = auVar64._10_2_;
        auVar461._10_2_ = uVar266 >> local_148;
        uVar388 = auVar64._12_2_;
        uVar274 = auVar64._14_2_;
        auVar461._12_2_ = uVar388 >> local_148;
        auVar461._14_2_ = uVar274 >> local_148;
        auVar45 = psraw(auVar358,0xf);
        auVar28 = psubusw(local_138,auVar107);
        auVar26 = psubusw(local_138,auVar461);
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        auVar173._0_2_ =
             (((short)uVar60 < sVar38) * uVar60 | (ushort)((short)uVar60 >= sVar38) * sVar38) +
             auVar232._0_2_;
        auVar173._2_2_ =
             (((short)uVar81 < sVar522) * uVar81 | (ushort)((short)uVar81 >= sVar522) * sVar522) +
             auVar232._2_2_;
        auVar173._4_2_ =
             (((short)uVar83 < sVar525) * uVar83 | (ushort)((short)uVar83 >= sVar525) * sVar525) +
             auVar232._4_2_;
        auVar173._6_2_ =
             (((short)uVar85 < sVar40) * uVar85 | (ushort)((short)uVar85 >= sVar40) * sVar40) +
             auVar232._6_2_;
        auVar173._8_2_ =
             (((short)uVar87 < sVar181) * uVar87 | (ushort)((short)uVar87 >= sVar181) * sVar181) +
             auVar232._8_2_;
        auVar173._10_2_ =
             (((short)uVar89 < sVar185) * uVar89 | (ushort)((short)uVar89 >= sVar185) * sVar185) +
             auVar232._10_2_;
        auVar173._12_2_ =
             (((short)uVar91 < sVar195) * uVar91 | (ushort)((short)uVar91 >= sVar195) * sVar195) +
             auVar232._12_2_;
        auVar173._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar232._14_2_;
        auVar108._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar45._0_2_;
        auVar108._2_2_ =
             (((short)uVar244 < sVar494) * uVar244 | (ushort)((short)uVar244 >= sVar494) * sVar494)
             + auVar45._2_2_;
        auVar108._4_2_ =
             (((short)uVar250 < sVar507) * uVar250 | (ushort)((short)uVar250 >= sVar507) * sVar507)
             + auVar45._4_2_;
        auVar108._6_2_ =
             (((short)uVar364 < sVar34) * uVar364 | (ushort)((short)uVar364 >= sVar34) * sVar34) +
             auVar45._6_2_;
        auVar108._8_2_ =
             (((short)uVar258 < sVar35) * uVar258 | (ushort)((short)uVar258 >= sVar35) * sVar35) +
             auVar45._8_2_;
        auVar108._10_2_ =
             (((short)uVar266 < sVar513) * uVar266 | (ushort)((short)uVar266 >= sVar513) * sVar513)
             + auVar45._10_2_;
        auVar108._12_2_ =
             (((short)uVar388 < sVar516) * uVar388 | (ushort)((short)uVar388 >= sVar516) * sVar516)
             + auVar45._12_2_;
        auVar108._14_2_ =
             (((short)uVar274 < sVar37) * uVar274 | (ushort)((short)uVar274 >= sVar37) * sVar37) +
             auVar45._14_2_;
        auVar173 = auVar173 ^ auVar232;
        auVar108 = auVar108 ^ auVar45;
        uVar2 = *(undefined8 *)(in + lVar13);
        uVar3 = *(undefined8 *)(in + lVar13 + 0x90);
        auVar543._8_8_ = uVar2;
        auVar543._0_8_ = uVar3;
        local_228._8_8_ = *(undefined8 *)(in + lVar13 + 0x120);
        local_228._0_8_ = *(undefined8 *)(in + lVar13 + 0x1b0);
        sVar20 = (short)uVar3;
        auVar28._0_2_ = sVar20 - sVar21;
        sVar507 = (short)((ulong)uVar3 >> 0x10);
        auVar28._2_2_ = sVar507 - sVar510;
        sVar35 = (short)((ulong)uVar3 >> 0x20);
        auVar28._4_2_ = sVar35 - sVar36;
        sVar516 = (short)((ulong)uVar3 >> 0x30);
        auVar28._6_2_ = sVar516 - sVar519;
        sVar38 = (short)uVar2;
        auVar28._8_2_ = sVar38 - sVar39;
        sVar525 = (short)((ulong)uVar2 >> 0x10);
        auVar28._10_2_ = sVar525 - sVar160;
        sVar181 = (short)((ulong)uVar2 >> 0x20);
        sVar195 = (short)((ulong)uVar2 >> 0x30);
        auVar28._12_2_ = sVar181 - sVar190;
        auVar28._14_2_ = sVar195 - sVar206;
        sVar139 = (short)local_228._0_8_;
        auVar359._0_2_ = sVar139 - sVar41;
        sVar144 = (short)((ulong)local_228._0_8_ >> 0x10);
        auVar359._2_2_ = sVar144 - sVar47;
        sVar146 = (short)((ulong)local_228._0_8_ >> 0x20);
        auVar359._4_2_ = sVar146 - sVar49;
        sVar151 = (short)((ulong)local_228._0_8_ >> 0x30);
        auVar359._6_2_ = sVar151 - sVar51;
        sVar153 = (short)local_228._8_8_;
        auVar359._8_2_ = sVar153 - sVar53;
        sVar158 = (short)((ulong)local_228._8_8_ >> 0x10);
        auVar359._10_2_ = sVar158 - sVar55;
        sVar179 = (short)((ulong)local_228._8_8_ >> 0x20);
        sVar183 = (short)((ulong)local_228._8_8_ >> 0x30);
        auVar359._12_2_ = sVar179 - sVar57;
        auVar359._14_2_ = sVar183 - sVar59;
        auVar26 = pabsw(auVar304,auVar28);
        auVar304 = pabsw(auVar64,auVar359);
        uVar60 = auVar26._0_2_;
        auVar235._0_2_ = uVar60 >> local_148;
        uVar81 = auVar26._2_2_;
        auVar235._2_2_ = uVar81 >> local_148;
        uVar83 = auVar26._4_2_;
        auVar235._4_2_ = uVar83 >> local_148;
        uVar85 = auVar26._6_2_;
        auVar235._6_2_ = uVar85 >> local_148;
        uVar87 = auVar26._8_2_;
        auVar235._8_2_ = uVar87 >> local_148;
        uVar89 = auVar26._10_2_;
        auVar235._10_2_ = uVar89 >> local_148;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar235._12_2_ = uVar91 >> local_148;
        auVar235._14_2_ = uVar94 >> local_148;
        uVar215 = auVar304._0_2_;
        auVar462._0_2_ = uVar215 >> local_148;
        uVar244 = auVar304._2_2_;
        auVar462._2_2_ = uVar244 >> local_148;
        uVar250 = auVar304._4_2_;
        auVar462._4_2_ = uVar250 >> local_148;
        uVar364 = auVar304._6_2_;
        auVar462._6_2_ = uVar364 >> local_148;
        uVar258 = auVar304._8_2_;
        auVar462._8_2_ = uVar258 >> local_148;
        uVar266 = auVar304._10_2_;
        auVar462._10_2_ = uVar266 >> local_148;
        uVar388 = auVar304._12_2_;
        uVar274 = auVar304._14_2_;
        auVar462._12_2_ = uVar388 >> local_148;
        auVar462._14_2_ = uVar274 >> local_148;
        auVar45 = psubusw(local_138,auVar235);
        auVar232 = psubusw(local_138,auVar462);
        auVar26 = psraw(auVar28,0xf);
        auVar28 = psraw(auVar359,0xf);
        sVar117 = auVar45._0_2_;
        sVar119 = auVar45._2_2_;
        sVar121 = auVar45._4_2_;
        sVar123 = auVar45._6_2_;
        sVar125 = auVar45._8_2_;
        sVar130 = auVar45._10_2_;
        sVar132 = auVar45._12_2_;
        sVar137 = auVar45._14_2_;
        sVar494 = auVar232._0_2_;
        sVar34 = auVar232._2_2_;
        sVar513 = auVar232._4_2_;
        sVar37 = auVar232._6_2_;
        sVar522 = auVar232._8_2_;
        sVar40 = auVar232._10_2_;
        sVar185 = auVar232._12_2_;
        sVar200 = auVar232._14_2_;
        auVar313._0_2_ =
             (((short)uVar60 < sVar117) * uVar60 | (ushort)((short)uVar60 >= sVar117) * sVar117) +
             auVar26._0_2_;
        auVar313._2_2_ =
             (((short)uVar81 < sVar119) * uVar81 | (ushort)((short)uVar81 >= sVar119) * sVar119) +
             auVar26._2_2_;
        auVar313._4_2_ =
             (((short)uVar83 < sVar121) * uVar83 | (ushort)((short)uVar83 >= sVar121) * sVar121) +
             auVar26._4_2_;
        auVar313._6_2_ =
             (((short)uVar85 < sVar123) * uVar85 | (ushort)((short)uVar85 >= sVar123) * sVar123) +
             auVar26._6_2_;
        auVar313._8_2_ =
             (((short)uVar87 < sVar125) * uVar87 | (ushort)((short)uVar87 >= sVar125) * sVar125) +
             auVar26._8_2_;
        auVar313._10_2_ =
             (((short)uVar89 < sVar130) * uVar89 | (ushort)((short)uVar89 >= sVar130) * sVar130) +
             auVar26._10_2_;
        auVar313._12_2_ =
             (((short)uVar91 < sVar132) * uVar91 | (ushort)((short)uVar91 >= sVar132) * sVar132) +
             auVar26._12_2_;
        auVar313._14_2_ =
             (((short)uVar94 < sVar137) * uVar94 | (ushort)((short)uVar94 >= sVar137) * sVar137) +
             auVar26._14_2_;
        auVar236._0_2_ =
             (((short)uVar215 < sVar494) * uVar215 | (ushort)((short)uVar215 >= sVar494) * sVar494)
             + auVar28._0_2_;
        auVar236._2_2_ =
             (((short)uVar244 < sVar34) * uVar244 | (ushort)((short)uVar244 >= sVar34) * sVar34) +
             auVar28._2_2_;
        auVar236._4_2_ =
             (((short)uVar250 < sVar513) * uVar250 | (ushort)((short)uVar250 >= sVar513) * sVar513)
             + auVar28._4_2_;
        auVar236._6_2_ =
             (((short)uVar364 < sVar37) * uVar364 | (ushort)((short)uVar364 >= sVar37) * sVar37) +
             auVar28._6_2_;
        auVar236._8_2_ =
             (((short)uVar258 < sVar522) * uVar258 | (ushort)((short)uVar258 >= sVar522) * sVar522)
             + auVar28._8_2_;
        auVar236._10_2_ =
             (((short)uVar266 < sVar40) * uVar266 | (ushort)((short)uVar266 >= sVar40) * sVar40) +
             auVar28._10_2_;
        auVar236._12_2_ =
             (((short)uVar388 < sVar185) * uVar388 | (ushort)((short)uVar388 >= sVar185) * sVar185)
             + auVar28._12_2_;
        auVar236._14_2_ =
             (((short)uVar274 < sVar200) * uVar274 | (ushort)((short)uVar274 >= sVar200) * sVar200)
             + auVar28._14_2_;
        auVar313 = auVar313 ^ auVar26;
        auVar236 = auVar236 ^ auVar28;
        uVar2 = *(undefined8 *)(in + -lVar13);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar13));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar13));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar13));
        uVar474 = (ushort)uVar3;
        auVar360._0_2_ = uVar474 - sVar21;
        uVar529 = (ushort)((ulong)uVar3 >> 0x10);
        auVar360._2_2_ = uVar529 - sVar510;
        uVar535 = (ushort)((ulong)uVar3 >> 0x20);
        auVar360._4_2_ = uVar535 - sVar36;
        uVar208 = (ushort)((ulong)uVar3 >> 0x30);
        auVar360._6_2_ = uVar208 - sVar519;
        uVar220 = (ushort)uVar2;
        auVar360._8_2_ = uVar220 - sVar39;
        uVar249 = (ushort)((ulong)uVar2 >> 0x10);
        auVar360._10_2_ = uVar249 - sVar160;
        uVar257 = (ushort)((ulong)uVar2 >> 0x20);
        uVar265 = (ushort)((ulong)uVar2 >> 0x30);
        auVar360._12_2_ = uVar257 - sVar190;
        auVar360._14_2_ = uVar265 - sVar206;
        auVar26 = pabsw(auVar304,auVar360);
        uVar60 = auVar26._0_2_;
        auVar381._0_2_ = uVar60 >> local_148;
        uVar81 = auVar26._2_2_;
        auVar381._2_2_ = uVar81 >> local_148;
        uVar83 = auVar26._4_2_;
        auVar381._4_2_ = uVar83 >> local_148;
        uVar85 = auVar26._6_2_;
        auVar381._6_2_ = uVar85 >> local_148;
        uVar87 = auVar26._8_2_;
        auVar381._8_2_ = uVar87 >> local_148;
        uVar89 = auVar26._10_2_;
        auVar381._10_2_ = uVar89 >> local_148;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar381._12_2_ = uVar91 >> local_148;
        auVar381._14_2_ = uVar94 >> local_148;
        auVar26 = psubusw(local_138,auVar381);
        uVar477 = (ushort)uVar5;
        auVar463._0_2_ = uVar477 - sVar41;
        uVar530 = (ushort)((ulong)uVar5 >> 0x10);
        auVar463._2_2_ = uVar530 - sVar47;
        uVar202 = (ushort)((ulong)uVar5 >> 0x20);
        auVar463._4_2_ = uVar202 - sVar49;
        uVar214 = (ushort)((ulong)uVar5 >> 0x30);
        auVar463._6_2_ = uVar214 - sVar51;
        uVar326 = (ushort)uVar4;
        auVar463._8_2_ = uVar326 - sVar53;
        uVar347 = (ushort)((ulong)uVar4 >> 0x10);
        auVar463._10_2_ = uVar347 - sVar55;
        uVar369 = (ushort)((ulong)uVar4 >> 0x20);
        uVar412 = (ushort)((ulong)uVar4 >> 0x30);
        auVar463._12_2_ = uVar369 - sVar57;
        auVar463._14_2_ = uVar412 - sVar59;
        auVar28 = pabsw(auVar371,auVar463);
        uVar215 = auVar28._0_2_;
        auVar504._0_2_ = uVar215 >> local_148;
        uVar244 = auVar28._2_2_;
        auVar504._2_2_ = uVar244 >> local_148;
        uVar250 = auVar28._4_2_;
        auVar504._4_2_ = uVar250 >> local_148;
        uVar364 = auVar28._6_2_;
        auVar504._6_2_ = uVar364 >> local_148;
        uVar258 = auVar28._8_2_;
        auVar504._8_2_ = uVar258 >> local_148;
        uVar266 = auVar28._10_2_;
        auVar504._10_2_ = uVar266 >> local_148;
        uVar388 = auVar28._12_2_;
        uVar274 = auVar28._14_2_;
        auVar504._12_2_ = uVar388 >> local_148;
        auVar504._14_2_ = uVar274 >> local_148;
        auVar28 = psubusw(local_138,auVar504);
        sVar494 = auVar26._0_2_;
        sVar34 = auVar26._2_2_;
        sVar513 = auVar26._4_2_;
        sVar37 = auVar26._6_2_;
        sVar522 = auVar26._8_2_;
        sVar40 = auVar26._10_2_;
        sVar185 = auVar26._12_2_;
        sVar200 = auVar26._14_2_;
        sVar117 = auVar28._0_2_;
        sVar119 = auVar28._2_2_;
        sVar121 = auVar28._4_2_;
        sVar123 = auVar28._6_2_;
        sVar125 = auVar28._8_2_;
        sVar130 = auVar28._10_2_;
        sVar132 = auVar28._12_2_;
        sVar137 = auVar28._14_2_;
        auVar26 = psraw(auVar360,0xf);
        auVar232._0_2_ =
             (((short)uVar60 < sVar494) * uVar60 | (ushort)((short)uVar60 >= sVar494) * sVar494) +
             auVar26._0_2_;
        auVar232._2_2_ =
             (((short)uVar81 < sVar34) * uVar81 | (ushort)((short)uVar81 >= sVar34) * sVar34) +
             auVar26._2_2_;
        auVar232._4_2_ =
             (((short)uVar83 < sVar513) * uVar83 | (ushort)((short)uVar83 >= sVar513) * sVar513) +
             auVar26._4_2_;
        auVar232._6_2_ =
             (((short)uVar85 < sVar37) * uVar85 | (ushort)((short)uVar85 >= sVar37) * sVar37) +
             auVar26._6_2_;
        auVar232._8_2_ =
             (((short)uVar87 < sVar522) * uVar87 | (ushort)((short)uVar87 >= sVar522) * sVar522) +
             auVar26._8_2_;
        auVar232._10_2_ =
             (((short)uVar89 < sVar40) * uVar89 | (ushort)((short)uVar89 >= sVar40) * sVar40) +
             auVar26._10_2_;
        auVar232._12_2_ =
             (((short)uVar91 < sVar185) * uVar91 | (ushort)((short)uVar91 >= sVar185) * sVar185) +
             auVar26._12_2_;
        auVar232._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar26._14_2_;
        auVar232 = auVar232 ^ auVar26;
        local_158 = auVar23._0_2_;
        sStack_156 = auVar23._2_2_;
        auVar26 = psraw(auVar463,0xf);
        auVar382._0_2_ =
             (((short)uVar215 < sVar117) * uVar215 | (ushort)((short)uVar215 >= sVar117) * sVar117)
             + auVar26._0_2_;
        auVar382._2_2_ =
             (((short)uVar244 < sVar119) * uVar244 | (ushort)((short)uVar244 >= sVar119) * sVar119)
             + auVar26._2_2_;
        auVar382._4_2_ =
             (((short)uVar250 < sVar121) * uVar250 | (ushort)((short)uVar250 >= sVar121) * sVar121)
             + auVar26._4_2_;
        auVar382._6_2_ =
             (((short)uVar364 < sVar123) * uVar364 | (ushort)((short)uVar364 >= sVar123) * sVar123)
             + auVar26._6_2_;
        auVar382._8_2_ =
             (((short)uVar258 < sVar125) * uVar258 | (ushort)((short)uVar258 >= sVar125) * sVar125)
             + auVar26._8_2_;
        auVar382._10_2_ =
             (((short)uVar266 < sVar130) * uVar266 | (ushort)((short)uVar266 >= sVar130) * sVar130)
             + auVar26._10_2_;
        auVar382._12_2_ =
             (((short)uVar388 < sVar132) * uVar388 | (ushort)((short)uVar388 >= sVar132) * sVar132)
             + auVar26._12_2_;
        auVar382._14_2_ =
             (((short)uVar274 < sVar137) * uVar274 | (ushort)((short)uVar274 >= sVar137) * sVar137)
             + auVar26._14_2_;
        auVar382 = auVar382 ^ auVar26;
        local_248 = local_248 & _DAT_00566860;
        sVar494 = local_248._0_2_;
        uVar215 = (ushort)(sVar494 < sVar21) * sVar21 | (ushort)(sVar494 >= sVar21) * sVar494;
        sVar494 = local_248._2_2_;
        uVar244 = (ushort)(sVar494 < sVar510) * sVar510 | (ushort)(sVar494 >= sVar510) * sVar494;
        sVar494 = local_248._4_2_;
        uVar250 = (ushort)(sVar494 < sVar36) * sVar36 | (ushort)(sVar494 >= sVar36) * sVar494;
        sVar494 = local_248._6_2_;
        uVar364 = (ushort)(sVar494 < sVar519) * sVar519 | (ushort)(sVar494 >= sVar519) * sVar494;
        sVar494 = local_248._8_2_;
        uVar258 = (ushort)(sVar494 < sVar39) * sVar39 | (ushort)(sVar494 >= sVar39) * sVar494;
        sVar494 = local_248._10_2_;
        uVar266 = (ushort)(sVar494 < sVar160) * sVar160 | (ushort)(sVar494 >= sVar160) * sVar494;
        sVar494 = local_248._12_2_;
        sVar34 = local_248._14_2_;
        uVar388 = (ushort)(sVar494 < sVar190) * sVar190 | (ushort)(sVar494 >= sVar190) * sVar494;
        uVar274 = (ushort)(sVar34 < sVar206) * sVar206 | (ushort)(sVar34 >= sVar206) * sVar34;
        auVar174 = auVar174 & _DAT_00566860;
        sVar494 = auVar174._0_2_;
        uVar486 = (ushort)(sVar494 < sVar41) * sVar41 | (ushort)(sVar494 >= sVar41) * sVar494;
        sVar494 = auVar174._2_2_;
        uVar487 = (ushort)(sVar494 < sVar47) * sVar47 | (ushort)(sVar494 >= sVar47) * sVar494;
        sVar494 = auVar174._4_2_;
        uVar92 = (ushort)(sVar494 < sVar49) * sVar49 | (ushort)(sVar494 >= sVar49) * sVar494;
        sVar494 = auVar174._6_2_;
        uVar488 = (ushort)(sVar494 < sVar51) * sVar51 | (ushort)(sVar494 >= sVar51) * sVar494;
        sVar494 = auVar174._8_2_;
        uVar489 = (ushort)(sVar494 < sVar53) * sVar53 | (ushort)(sVar494 >= sVar53) * sVar494;
        sVar494 = auVar174._10_2_;
        uVar95 = (ushort)(sVar494 < sVar55) * sVar55 | (ushort)(sVar494 >= sVar55) * sVar494;
        sVar494 = auVar174._12_2_;
        sVar34 = auVar174._14_2_;
        uVar490 = (ushort)(sVar494 < sVar57) * sVar57 | (ushort)(sVar494 >= sVar57) * sVar494;
        uVar491 = (ushort)(sVar34 < sVar59) * sVar59 | (ushort)(sVar34 >= sVar59) * sVar34;
        auVar436 = auVar436 & _DAT_00566860;
        auVar314 = auVar314 & _DAT_00566860;
        uVar60 = (ushort)(sVar20 < sVar116) * sVar20 | (ushort)(sVar20 >= sVar116) * sVar116;
        uVar81 = (ushort)(sVar507 < sVar118) * sVar507 | (ushort)(sVar507 >= sVar118) * sVar118;
        uVar83 = (ushort)(sVar35 < sVar120) * sVar35 | (ushort)(sVar35 >= sVar120) * sVar120;
        uVar85 = (ushort)(sVar516 < sVar122) * sVar516 | (ushort)(sVar516 >= sVar122) * sVar122;
        uVar87 = (ushort)(sVar38 < sVar124) * sVar38 | (ushort)(sVar38 >= sVar124) * sVar124;
        uVar89 = (ushort)(sVar525 < sVar126) * sVar525 | (ushort)(sVar525 >= sVar126) * sVar126;
        uVar91 = (ushort)(sVar181 < sVar131) * sVar181 | (ushort)(sVar181 >= sVar131) * sVar131;
        uVar94 = (ushort)(sVar195 < sVar133) * sVar195 | (ushort)(sVar195 >= sVar133) * sVar133;
        auVar543 = auVar543 & _DAT_00566860;
        sVar20 = auVar436._0_2_;
        sVar494 = auVar543._0_2_;
        uVar283 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._2_2_;
        sVar494 = auVar543._2_2_;
        uVar395 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._4_2_;
        sVar494 = auVar543._4_2_;
        uVar291 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._6_2_;
        sVar494 = auVar543._6_2_;
        uVar401 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._8_2_;
        sVar494 = auVar543._8_2_;
        uVar407 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._10_2_;
        sVar494 = auVar543._10_2_;
        uVar414 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._12_2_;
        sVar494 = auVar543._12_2_;
        sVar507 = auVar543._14_2_;
        uVar421 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar436._14_2_;
        uVar428 = (ushort)(sVar507 < sVar20) * sVar20 | (ushort)(sVar507 >= sVar20) * sVar507;
        uVar540 = ((short)uVar283 < (short)uVar215) * uVar215 |
                  ((short)uVar283 >= (short)uVar215) * uVar283;
        uVar544 = ((short)uVar395 < (short)uVar244) * uVar244 |
                  ((short)uVar395 >= (short)uVar244) * uVar395;
        uVar545 = ((short)uVar291 < (short)uVar250) * uVar250 |
                  ((short)uVar291 >= (short)uVar250) * uVar291;
        uVar546 = ((short)uVar401 < (short)uVar364) * uVar364 |
                  ((short)uVar401 >= (short)uVar364) * uVar401;
        uVar547 = ((short)uVar407 < (short)uVar258) * uVar258 |
                  ((short)uVar407 >= (short)uVar258) * uVar407;
        uVar548 = ((short)uVar414 < (short)uVar266) * uVar266 |
                  ((short)uVar414 >= (short)uVar266) * uVar414;
        uVar549 = ((short)uVar421 < (short)uVar388) * uVar388 |
                  ((short)uVar421 >= (short)uVar388) * uVar421;
        uVar550 = ((short)uVar428 < (short)uVar274) * uVar274 |
                  ((short)uVar428 >= (short)uVar274) * uVar428;
        uVar215 = (ushort)(sVar139 < sVar138) * sVar139 | (ushort)(sVar139 >= sVar138) * sVar138;
        uVar244 = (ushort)(sVar144 < sVar140) * sVar144 | (ushort)(sVar144 >= sVar140) * sVar140;
        uVar250 = (ushort)(sVar146 < sVar145) * sVar146 | (ushort)(sVar146 >= sVar145) * sVar145;
        uVar364 = (ushort)(sVar151 < sVar147) * sVar151 | (ushort)(sVar151 >= sVar147) * sVar147;
        uVar258 = (ushort)(sVar153 < sVar152) * sVar153 | (ushort)(sVar153 >= sVar152) * sVar152;
        uVar266 = (ushort)(sVar158 < sVar154) * sVar158 | (ushort)(sVar158 >= sVar154) * sVar154;
        uVar388 = (ushort)(sVar179 < sVar159) * sVar179 | (ushort)(sVar179 >= sVar159) * sVar159;
        uVar274 = (ushort)(sVar183 < sVar180) * sVar183 | (ushort)(sVar183 >= sVar180) * sVar180;
        local_228 = local_228 & _DAT_00566860;
        sVar20 = auVar314._0_2_;
        sVar494 = local_228._0_2_;
        uVar283 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._2_2_;
        sVar494 = local_228._2_2_;
        uVar395 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._4_2_;
        sVar494 = local_228._4_2_;
        uVar291 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._6_2_;
        sVar494 = local_228._6_2_;
        uVar401 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._8_2_;
        sVar494 = local_228._8_2_;
        uVar407 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._10_2_;
        sVar494 = local_228._10_2_;
        uVar414 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._12_2_;
        sVar494 = local_228._12_2_;
        sVar507 = local_228._14_2_;
        uVar421 = (ushort)(sVar494 < sVar20) * sVar20 | (ushort)(sVar494 >= sVar20) * sVar494;
        sVar20 = auVar314._14_2_;
        uVar428 = (ushort)(sVar507 < sVar20) * sVar20 | (ushort)(sVar507 >= sVar20) * sVar507;
        uVar458 = ((short)uVar283 < (short)uVar486) * uVar486 |
                  ((short)uVar283 >= (short)uVar486) * uVar283;
        uVar481 = ((short)uVar395 < (short)uVar487) * uVar487 |
                  ((short)uVar395 >= (short)uVar487) * uVar395;
        uVar532 = ((short)uVar291 < (short)uVar92) * uVar92 |
                  ((short)uVar291 >= (short)uVar92) * uVar291;
        uVar127 = ((short)uVar401 < (short)uVar488) * uVar488 |
                  ((short)uVar401 >= (short)uVar488) * uVar401;
        uVar134 = ((short)uVar407 < (short)uVar489) * uVar489 |
                  ((short)uVar407 >= (short)uVar489) * uVar407;
        uVar141 = ((short)uVar414 < (short)uVar95) * uVar95 |
                  ((short)uVar414 >= (short)uVar95) * uVar414;
        uVar148 = ((short)uVar421 < (short)uVar490) * uVar490 |
                  ((short)uVar421 >= (short)uVar490) * uVar421;
        uVar155 = ((short)uVar428 < (short)uVar491) * uVar491 |
                  ((short)uVar428 >= (short)uVar491) * uVar428;
        uVar283 = (ushort)(sVar21 < sVar212) * sVar21 | (ushort)(sVar21 >= sVar212) * sVar212;
        uVar395 = (ushort)(sVar510 < sVar46) * sVar510 | (ushort)(sVar510 >= sVar46) * sVar46;
        uVar291 = (ushort)(sVar36 < sVar48) * sVar36 | (ushort)(sVar36 >= sVar48) * sVar48;
        uVar401 = (ushort)(sVar519 < sVar50) * sVar519 | (ushort)(sVar519 >= sVar50) * sVar50;
        uVar407 = (ushort)(sVar39 < sVar52) * sVar39 | (ushort)(sVar39 >= sVar52) * sVar52;
        uVar414 = (ushort)(sVar160 < sVar54) * sVar160 | (ushort)(sVar160 >= sVar54) * sVar54;
        uVar421 = (ushort)(sVar190 < sVar56) * sVar190 | (ushort)(sVar190 >= sVar56) * sVar56;
        uVar428 = (ushort)(sVar206 < sVar58) * sVar206 | (ushort)(sVar206 >= sVar58) * sVar58;
        uVar486 = (ushort)(sVar41 < sVar61) * sVar41 | (ushort)(sVar41 >= sVar61) * sVar61;
        uVar487 = (ushort)(sVar47 < sVar82) * sVar47 | (ushort)(sVar47 >= sVar82) * sVar82;
        uVar92 = (ushort)(sVar49 < sVar84) * sVar49 | (ushort)(sVar49 >= sVar84) * sVar84;
        uVar488 = (ushort)(sVar51 < sVar86) * sVar51 | (ushort)(sVar51 >= sVar86) * sVar86;
        uVar489 = (ushort)(sVar53 < sVar88) * sVar53 | (ushort)(sVar53 >= sVar88) * sVar88;
        uVar95 = (ushort)(sVar55 < sVar90) * sVar55 | (ushort)(sVar55 >= sVar90) * sVar90;
        uVar490 = (ushort)(sVar57 < sVar93) * sVar57 | (ushort)(sVar57 >= sVar93) * sVar93;
        uVar491 = (ushort)(sVar59 < sVar96) * sVar59 | (ushort)(sVar59 >= sVar96) * sVar96;
        uVar469 = ((short)uVar60 < (short)uVar283) * uVar60 |
                  ((short)uVar60 >= (short)uVar283) * uVar283;
        uVar483 = ((short)uVar81 < (short)uVar395) * uVar81 |
                  ((short)uVar81 >= (short)uVar395) * uVar395;
        uVar533 = ((short)uVar83 < (short)uVar291) * uVar83 |
                  ((short)uVar83 >= (short)uVar291) * uVar291;
        uVar128 = ((short)uVar85 < (short)uVar401) * uVar85 |
                  ((short)uVar85 >= (short)uVar401) * uVar401;
        uVar135 = ((short)uVar87 < (short)uVar407) * uVar87 |
                  ((short)uVar87 >= (short)uVar407) * uVar407;
        uVar142 = ((short)uVar89 < (short)uVar414) * uVar89 |
                  ((short)uVar89 >= (short)uVar414) * uVar414;
        uVar149 = ((short)uVar91 < (short)uVar421) * uVar91 |
                  ((short)uVar91 >= (short)uVar421) * uVar421;
        uVar156 = ((short)uVar94 < (short)uVar428) * uVar94 |
                  ((short)uVar94 >= (short)uVar428) * uVar428;
        uVar161 = ((short)uVar215 < (short)uVar486) * uVar215 |
                  ((short)uVar215 >= (short)uVar486) * uVar486;
        uVar182 = ((short)uVar244 < (short)uVar487) * uVar244 |
                  ((short)uVar244 >= (short)uVar487) * uVar487;
        uVar186 = ((short)uVar250 < (short)uVar92) * uVar250 |
                  ((short)uVar250 >= (short)uVar92) * uVar92;
        uVar191 = ((short)uVar364 < (short)uVar488) * uVar364 |
                  ((short)uVar364 >= (short)uVar488) * uVar488;
        uVar196 = ((short)uVar258 < (short)uVar489) * uVar258 |
                  ((short)uVar258 >= (short)uVar489) * uVar489;
        uVar201 = ((short)uVar266 < (short)uVar95) * uVar266 |
                  ((short)uVar266 >= (short)uVar95) * uVar95;
        uVar207 = ((short)uVar388 < (short)uVar490) * uVar388 |
                  ((short)uVar388 >= (short)uVar490) * uVar490;
        uVar213 = ((short)uVar274 < (short)uVar491) * uVar274 |
                  ((short)uVar274 >= (short)uVar491) * uVar491;
        uVar2 = *(undefined8 *)(in + lVar14);
        uVar3 = *(undefined8 *)(in + lVar14 + 0x90);
        auVar76._8_8_ = uVar2;
        auVar76._0_8_ = uVar3;
        uVar4 = *(undefined8 *)(in + lVar14 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar14 + 0x1b0);
        uVar283 = (ushort)uVar3;
        auVar437._0_2_ = uVar283 - sVar21;
        uVar291 = (ushort)((ulong)uVar3 >> 0x10);
        auVar437._2_2_ = uVar291 - sVar510;
        uVar407 = (ushort)((ulong)uVar3 >> 0x20);
        auVar437._4_2_ = uVar407 - sVar36;
        uVar421 = (ushort)((ulong)uVar3 >> 0x30);
        auVar437._6_2_ = uVar421 - sVar519;
        uVar486 = (ushort)uVar2;
        auVar437._8_2_ = uVar486 - sVar39;
        uVar92 = (ushort)((ulong)uVar2 >> 0x10);
        auVar437._10_2_ = uVar92 - sVar160;
        uVar489 = (ushort)((ulong)uVar2 >> 0x20);
        uVar490 = (ushort)((ulong)uVar2 >> 0x30);
        auVar437._12_2_ = uVar489 - sVar190;
        auVar437._14_2_ = uVar490 - sVar206;
        auVar26 = pabsw(auVar76,auVar437);
        local_1a8 = (ulong)uVar18;
        uVar60 = auVar26._0_2_;
        auVar175._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar26._2_2_;
        auVar175._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar26._4_2_;
        auVar175._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar26._6_2_;
        auVar175._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar26._8_2_;
        auVar175._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar26._10_2_;
        auVar175._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar175._12_2_ = uVar91 >> local_1a8;
        auVar175._14_2_ = uVar94 >> local_1a8;
        auVar26 = psubusw(local_178,auVar175);
        uVar426 = (ushort)uVar5;
        auVar237._0_2_ = uVar426 - sVar41;
        uVar433 = (ushort)((ulong)uVar5 >> 0x10);
        auVar237._2_2_ = uVar433 - sVar47;
        uVar254 = (ushort)((ulong)uVar5 >> 0x20);
        auVar237._4_2_ = uVar254 - sVar49;
        uVar262 = (ushort)((ulong)uVar5 >> 0x30);
        auVar237._6_2_ = uVar262 - sVar51;
        uVar270 = (ushort)uVar4;
        auVar237._8_2_ = uVar270 - sVar53;
        uVar278 = (ushort)((ulong)uVar4 >> 0x10);
        auVar237._10_2_ = uVar278 - sVar55;
        uVar287 = (ushort)((ulong)uVar4 >> 0x20);
        uVar295 = (ushort)((ulong)uVar4 >> 0x30);
        auVar237._12_2_ = uVar287 - sVar57;
        auVar237._14_2_ = uVar295 - sVar59;
        auVar28 = pabsw(auVar314,auVar237);
        uVar215 = auVar28._0_2_;
        auVar361._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar28._2_2_;
        auVar361._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar28._4_2_;
        auVar361._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar28._6_2_;
        auVar361._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar28._8_2_;
        auVar361._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar28._10_2_;
        auVar361._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar28._12_2_;
        uVar274 = auVar28._14_2_;
        auVar361._12_2_ = uVar388 >> local_1a8;
        auVar361._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar361);
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        auVar26 = psraw(auVar437,0xf);
        auVar28 = psraw(auVar237,0xf);
        auVar109._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar109._2_2_ =
             (((short)uVar81 < sVar494) * uVar81 | (ushort)((short)uVar81 >= sVar494) * sVar494) +
             auVar26._2_2_;
        auVar109._4_2_ =
             (((short)uVar83 < sVar507) * uVar83 | (ushort)((short)uVar83 >= sVar507) * sVar507) +
             auVar26._4_2_;
        auVar109._6_2_ =
             (((short)uVar85 < sVar34) * uVar85 | (ushort)((short)uVar85 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar109._8_2_ =
             (((short)uVar87 < sVar35) * uVar87 | (ushort)((short)uVar87 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar109._10_2_ =
             (((short)uVar89 < sVar513) * uVar89 | (ushort)((short)uVar89 >= sVar513) * sVar513) +
             auVar26._10_2_;
        auVar109._12_2_ =
             (((short)uVar91 < sVar516) * uVar91 | (ushort)((short)uVar91 >= sVar516) * sVar516) +
             auVar26._12_2_;
        auVar109._14_2_ =
             (((short)uVar94 < sVar37) * uVar94 | (ushort)((short)uVar94 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar176._0_2_ =
             (((short)uVar215 < sVar38) * uVar215 | (ushort)((short)uVar215 >= sVar38) * sVar38) +
             auVar28._0_2_;
        auVar176._2_2_ =
             (((short)uVar244 < sVar522) * uVar244 | (ushort)((short)uVar244 >= sVar522) * sVar522)
             + auVar28._2_2_;
        auVar176._4_2_ =
             (((short)uVar250 < sVar525) * uVar250 | (ushort)((short)uVar250 >= sVar525) * sVar525)
             + auVar28._4_2_;
        auVar176._6_2_ =
             (((short)uVar364 < sVar40) * uVar364 | (ushort)((short)uVar364 >= sVar40) * sVar40) +
             auVar28._6_2_;
        auVar176._8_2_ =
             (((short)uVar258 < sVar181) * uVar258 | (ushort)((short)uVar258 >= sVar181) * sVar181)
             + auVar28._8_2_;
        auVar176._10_2_ =
             (((short)uVar266 < sVar185) * uVar266 | (ushort)((short)uVar266 >= sVar185) * sVar185)
             + auVar28._10_2_;
        auVar176._12_2_ =
             (((short)uVar388 < sVar195) * uVar388 | (ushort)((short)uVar388 >= sVar195) * sVar195)
             + auVar28._12_2_;
        auVar176._14_2_ =
             (((short)uVar274 < sVar200) * uVar274 | (ushort)((short)uVar274 >= sVar200) * sVar200)
             + auVar28._14_2_;
        auVar109 = auVar109 ^ auVar26;
        auVar176 = auVar176 ^ auVar28;
        uVar2 = *(undefined8 *)(in + -lVar14);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar14));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar14));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar14));
        uVar479 = (ushort)uVar3;
        auVar315._0_2_ = uVar479 - sVar21;
        uVar531 = (ushort)((ulong)uVar3 >> 0x10);
        auVar315._2_2_ = uVar531 - sVar510;
        uVar282 = (ushort)((ulong)uVar3 >> 0x20);
        auVar315._4_2_ = uVar282 - sVar36;
        uVar299 = (ushort)((ulong)uVar3 >> 0x30);
        auVar315._6_2_ = uVar299 - sVar519;
        uVar331 = (ushort)uVar2;
        auVar315._8_2_ = uVar331 - sVar39;
        uVar353 = (ushort)((ulong)uVar2 >> 0x10);
        auVar315._10_2_ = uVar353 - sVar160;
        uVar393 = (ushort)((ulong)uVar2 >> 0x20);
        uVar419 = (ushort)((ulong)uVar2 >> 0x30);
        auVar315._12_2_ = uVar393 - sVar190;
        auVar315._14_2_ = uVar419 - sVar206;
        uVar245 = (ushort)uVar5;
        auVar238._0_2_ = uVar245 - sVar41;
        uVar396 = (ushort)((ulong)uVar5 >> 0x10);
        auVar238._2_2_ = uVar396 - sVar47;
        uVar267 = (ushort)((ulong)uVar5 >> 0x20);
        auVar238._4_2_ = uVar267 - sVar49;
        uVar415 = (ushort)((ulong)uVar5 >> 0x30);
        auVar238._6_2_ = uVar415 - sVar51;
        uVar292 = (ushort)uVar4;
        auVar238._8_2_ = uVar292 - sVar53;
        uVar445 = (ushort)((ulong)uVar4 >> 0x10);
        auVar238._10_2_ = uVar445 - sVar55;
        uVar451 = (ushort)((ulong)uVar4 >> 0x20);
        uVar457 = (ushort)((ulong)uVar4 >> 0x30);
        auVar238._12_2_ = uVar451 - sVar57;
        auVar238._14_2_ = uVar457 - sVar59;
        auVar45 = pabsw(auVar361,auVar315);
        uVar60 = auVar45._0_2_;
        auVar306._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar45._2_2_;
        auVar306._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar45._4_2_;
        auVar306._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar45._6_2_;
        auVar306._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar45._8_2_;
        auVar306._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar45._10_2_;
        auVar306._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar45._12_2_;
        uVar94 = auVar45._14_2_;
        auVar306._12_2_ = uVar91 >> local_1a8;
        auVar306._14_2_ = uVar94 >> local_1a8;
        auVar304 = pabsw(auVar371,auVar238);
        uVar215 = auVar304._0_2_;
        auVar464._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar304._2_2_;
        auVar464._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar304._4_2_;
        auVar464._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar304._6_2_;
        auVar464._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar304._8_2_;
        auVar464._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar304._10_2_;
        auVar464._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar304._12_2_;
        uVar274 = auVar304._14_2_;
        auVar464._12_2_ = uVar388 >> local_1a8;
        auVar464._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar306);
        auVar26 = psubusw(local_178,auVar464);
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        auVar26 = psraw(auVar315,0xf);
        auVar77._0_2_ =
             (((short)uVar60 < sVar38) * uVar60 | (ushort)((short)uVar60 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar77._2_2_ =
             (((short)uVar81 < sVar522) * uVar81 | (ushort)((short)uVar81 >= sVar522) * sVar522) +
             auVar26._2_2_;
        auVar77._4_2_ =
             (((short)uVar83 < sVar525) * uVar83 | (ushort)((short)uVar83 >= sVar525) * sVar525) +
             auVar26._4_2_;
        auVar77._6_2_ =
             (((short)uVar85 < sVar40) * uVar85 | (ushort)((short)uVar85 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar77._8_2_ =
             (((short)uVar87 < sVar181) * uVar87 | (ushort)((short)uVar87 >= sVar181) * sVar181) +
             auVar26._8_2_;
        auVar77._10_2_ =
             (((short)uVar89 < sVar185) * uVar89 | (ushort)((short)uVar89 >= sVar185) * sVar185) +
             auVar26._10_2_;
        auVar77._12_2_ =
             (((short)uVar91 < sVar195) * uVar91 | (ushort)((short)uVar91 >= sVar195) * sVar195) +
             auVar26._12_2_;
        auVar77._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar26._14_2_;
        auVar77 = auVar77 ^ auVar26;
        auVar26 = psraw(auVar238,0xf);
        auVar228._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar228._2_2_ =
             (((short)uVar244 < sVar494) * uVar244 | (ushort)((short)uVar244 >= sVar494) * sVar494)
             + auVar26._2_2_;
        auVar228._4_2_ =
             (((short)uVar250 < sVar507) * uVar250 | (ushort)((short)uVar250 >= sVar507) * sVar507)
             + auVar26._4_2_;
        auVar228._6_2_ =
             (((short)uVar364 < sVar34) * uVar364 | (ushort)((short)uVar364 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar228._8_2_ =
             (((short)uVar258 < sVar35) * uVar258 | (ushort)((short)uVar258 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar228._10_2_ =
             (((short)uVar266 < sVar513) * uVar266 | (ushort)((short)uVar266 >= sVar513) * sVar513)
             + auVar26._10_2_;
        auVar228._12_2_ =
             (((short)uVar388 < sVar516) * uVar388 | (ushort)((short)uVar388 >= sVar516) * sVar516)
             + auVar26._12_2_;
        auVar228._14_2_ =
             (((short)uVar274 < sVar37) * uVar274 | (ushort)((short)uVar274 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar228 = auVar228 ^ auVar26;
        uVar2 = *(undefined8 *)(in + lVar11);
        uVar3 = *(undefined8 *)(in + lVar11 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar11 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar11 + 0x1b0);
        uVar219 = (ushort)uVar3;
        auVar239._0_2_ = uVar219 - sVar21;
        uVar248 = (ushort)((ulong)uVar3 >> 0x10);
        auVar239._2_2_ = uVar248 - sVar510;
        uVar255 = (ushort)((ulong)uVar3 >> 0x20);
        auVar239._4_2_ = uVar255 - sVar36;
        uVar263 = (ushort)((ulong)uVar3 >> 0x30);
        auVar239._6_2_ = uVar263 - sVar519;
        uVar271 = (ushort)uVar2;
        auVar239._8_2_ = uVar271 - sVar39;
        uVar279 = (ushort)((ulong)uVar2 >> 0x10);
        auVar239._10_2_ = uVar279 - sVar160;
        uVar288 = (ushort)((ulong)uVar2 >> 0x20);
        uVar296 = (ushort)((ulong)uVar2 >> 0x30);
        auVar239._12_2_ = uVar288 - sVar190;
        auVar239._14_2_ = uVar296 - sVar206;
        uVar303 = (ushort)uVar5;
        auVar316._0_2_ = uVar303 - sVar41;
        uVar321 = (ushort)((ulong)uVar5 >> 0x10);
        auVar316._2_2_ = uVar321 - sVar47;
        uVar325 = (ushort)((ulong)uVar5 >> 0x20);
        auVar316._4_2_ = uVar325 - sVar49;
        uVar330 = (ushort)((ulong)uVar5 >> 0x30);
        auVar316._6_2_ = uVar330 - sVar51;
        uVar335 = (ushort)uVar4;
        auVar316._8_2_ = uVar335 - sVar53;
        uVar340 = (ushort)((ulong)uVar4 >> 0x10);
        auVar316._10_2_ = uVar340 - sVar55;
        uVar345 = (ushort)((ulong)uVar4 >> 0x20);
        uVar351 = (ushort)((ulong)uVar4 >> 0x30);
        auVar316._12_2_ = uVar345 - sVar57;
        auVar316._14_2_ = uVar351 - sVar59;
        auVar26 = pabsw(auVar45,auVar239);
        uVar60 = auVar26._0_2_;
        auVar110._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar26._2_2_;
        auVar110._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar26._4_2_;
        auVar110._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar26._6_2_;
        auVar110._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar26._8_2_;
        auVar110._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar26._10_2_;
        auVar110._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar110._12_2_ = uVar91 >> local_1a8;
        auVar110._14_2_ = uVar94 >> local_1a8;
        auVar26 = pabsw(auVar304,auVar316);
        uVar215 = auVar26._0_2_;
        auVar465._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar26._2_2_;
        auVar465._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar26._4_2_;
        auVar465._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar26._6_2_;
        auVar465._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar26._8_2_;
        auVar465._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar26._10_2_;
        auVar465._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar26._12_2_;
        uVar274 = auVar26._14_2_;
        auVar465._12_2_ = uVar388 >> local_1a8;
        auVar465._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar110);
        auVar26 = psubusw(local_178,auVar465);
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        auVar26 = psraw(auVar239,0xf);
        auVar177._0_2_ =
             (((short)uVar60 < sVar38) * uVar60 | (ushort)((short)uVar60 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar177._2_2_ =
             (((short)uVar81 < sVar522) * uVar81 | (ushort)((short)uVar81 >= sVar522) * sVar522) +
             auVar26._2_2_;
        auVar177._4_2_ =
             (((short)uVar83 < sVar525) * uVar83 | (ushort)((short)uVar83 >= sVar525) * sVar525) +
             auVar26._4_2_;
        auVar177._6_2_ =
             (((short)uVar85 < sVar40) * uVar85 | (ushort)((short)uVar85 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar177._8_2_ =
             (((short)uVar87 < sVar181) * uVar87 | (ushort)((short)uVar87 >= sVar181) * sVar181) +
             auVar26._8_2_;
        auVar177._10_2_ =
             (((short)uVar89 < sVar185) * uVar89 | (ushort)((short)uVar89 >= sVar185) * sVar185) +
             auVar26._10_2_;
        auVar177._12_2_ =
             (((short)uVar91 < sVar195) * uVar91 | (ushort)((short)uVar91 >= sVar195) * sVar195) +
             auVar26._12_2_;
        auVar177._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar26._14_2_;
        auVar177 = auVar177 ^ auVar26;
        auVar26 = psraw(auVar316,0xf);
        auVar111._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar111._2_2_ =
             (((short)uVar244 < sVar494) * uVar244 | (ushort)((short)uVar244 >= sVar494) * sVar494)
             + auVar26._2_2_;
        auVar111._4_2_ =
             (((short)uVar250 < sVar507) * uVar250 | (ushort)((short)uVar250 >= sVar507) * sVar507)
             + auVar26._4_2_;
        auVar111._6_2_ =
             (((short)uVar364 < sVar34) * uVar364 | (ushort)((short)uVar364 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar111._8_2_ =
             (((short)uVar258 < sVar35) * uVar258 | (ushort)((short)uVar258 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar111._10_2_ =
             (((short)uVar266 < sVar513) * uVar266 | (ushort)((short)uVar266 >= sVar513) * sVar513)
             + auVar26._10_2_;
        auVar111._12_2_ =
             (((short)uVar388 < sVar516) * uVar388 | (ushort)((short)uVar388 >= sVar516) * sVar516)
             + auVar26._12_2_;
        auVar111._14_2_ =
             (((short)uVar274 < sVar37) * uVar274 | (ushort)((short)uVar274 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar111 = auVar111 ^ auVar26;
        uVar2 = *(undefined8 *)(in + -lVar11);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar11));
        auVar442._8_8_ = uVar2;
        auVar442._0_8_ = uVar3;
        uVar4 = *(undefined8 *)(in + (0x120 - lVar11));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar11));
        uVar473 = (ushort)uVar3;
        auVar240._0_2_ = uVar473 - sVar21;
        uVar476 = (ushort)((ulong)uVar3 >> 0x10);
        auVar240._2_2_ = uVar476 - sVar510;
        uVar256 = (ushort)((ulong)uVar3 >> 0x20);
        auVar240._4_2_ = uVar256 - sVar36;
        uVar264 = (ushort)((ulong)uVar3 >> 0x30);
        auVar240._6_2_ = uVar264 - sVar519;
        uVar272 = (ushort)uVar2;
        auVar240._8_2_ = uVar272 - sVar39;
        uVar280 = (ushort)((ulong)uVar2 >> 0x10);
        auVar240._10_2_ = uVar280 - sVar160;
        uVar289 = (ushort)((ulong)uVar2 >> 0x20);
        uVar297 = (ushort)((ulong)uVar2 >> 0x30);
        auVar240._12_2_ = uVar289 - sVar190;
        auVar240._14_2_ = uVar297 - sVar206;
        auVar62 = pabsw(auVar442,auVar240);
        uVar60 = auVar62._0_2_;
        auVar317._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar62._2_2_;
        auVar317._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar62._4_2_;
        auVar317._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar62._6_2_;
        auVar317._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar62._8_2_;
        auVar317._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar62._10_2_;
        auVar317._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar62._12_2_;
        uVar94 = auVar62._14_2_;
        auVar317._12_2_ = uVar91 >> local_1a8;
        auVar317._14_2_ = uVar94 >> local_1a8;
        auVar26 = psubusw(local_178,auVar317);
        uVar459 = (ushort)uVar5;
        auVar466._0_2_ = uVar459 - sVar41;
        uVar470 = (ushort)((ulong)uVar5 >> 0x10);
        auVar466._2_2_ = uVar470 - sVar47;
        uVar472 = (ushort)((ulong)uVar5 >> 0x20);
        auVar466._4_2_ = uVar472 - sVar49;
        uVar475 = (ushort)((ulong)uVar5 >> 0x30);
        auVar466._6_2_ = uVar475 - sVar51;
        uVar478 = (ushort)uVar4;
        auVar466._8_2_ = uVar478 - sVar53;
        uVar480 = (ushort)((ulong)uVar4 >> 0x10);
        auVar466._10_2_ = uVar480 - sVar55;
        uVar482 = (ushort)((ulong)uVar4 >> 0x20);
        uVar484 = (ushort)((ulong)uVar4 >> 0x30);
        auVar466._12_2_ = uVar482 - sVar57;
        auVar466._14_2_ = uVar484 - sVar59;
        auVar28 = pabsw(local_238,auVar466);
        uVar215 = auVar28._0_2_;
        auVar539._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar28._2_2_;
        auVar539._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar28._4_2_;
        auVar539._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar28._6_2_;
        auVar539._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar28._8_2_;
        auVar539._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar28._10_2_;
        auVar539._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar28._12_2_;
        uVar274 = auVar28._14_2_;
        auVar539._12_2_ = uVar388 >> local_1a8;
        auVar539._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar539);
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        auVar28 = psraw(auVar240,0xf);
        auVar45._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar28._0_2_;
        auVar45._2_2_ =
             (((short)uVar81 < sVar494) * uVar81 | (ushort)((short)uVar81 >= sVar494) * sVar494) +
             auVar28._2_2_;
        auVar45._4_2_ =
             (((short)uVar83 < sVar507) * uVar83 | (ushort)((short)uVar83 >= sVar507) * sVar507) +
             auVar28._4_2_;
        auVar45._6_2_ =
             (((short)uVar85 < sVar34) * uVar85 | (ushort)((short)uVar85 >= sVar34) * sVar34) +
             auVar28._6_2_;
        auVar45._8_2_ =
             (((short)uVar87 < sVar35) * uVar87 | (ushort)((short)uVar87 >= sVar35) * sVar35) +
             auVar28._8_2_;
        auVar45._10_2_ =
             (((short)uVar89 < sVar513) * uVar89 | (ushort)((short)uVar89 >= sVar513) * sVar513) +
             auVar28._10_2_;
        auVar45._12_2_ =
             (((short)uVar91 < sVar516) * uVar91 | (ushort)((short)uVar91 >= sVar516) * sVar516) +
             auVar28._12_2_;
        auVar45._14_2_ =
             (((short)uVar94 < sVar37) * uVar94 | (ushort)((short)uVar94 >= sVar37) * sVar37) +
             auVar28._14_2_;
        auVar45 = auVar45 ^ auVar28;
        auVar26 = psraw(auVar466,0xf);
        auVar485._0_2_ =
             (((short)uVar215 < sVar38) * uVar215 | (ushort)((short)uVar215 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar485._2_2_ =
             (((short)uVar244 < sVar522) * uVar244 | (ushort)((short)uVar244 >= sVar522) * sVar522)
             + auVar26._2_2_;
        auVar485._4_2_ =
             (((short)uVar250 < sVar525) * uVar250 | (ushort)((short)uVar250 >= sVar525) * sVar525)
             + auVar26._4_2_;
        auVar485._6_2_ =
             (((short)uVar364 < sVar40) * uVar364 | (ushort)((short)uVar364 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar485._8_2_ =
             (((short)uVar258 < sVar181) * uVar258 | (ushort)((short)uVar258 >= sVar181) * sVar181)
             + auVar26._8_2_;
        auVar485._10_2_ =
             (((short)uVar266 < sVar185) * uVar266 | (ushort)((short)uVar266 >= sVar185) * sVar185)
             + auVar26._10_2_;
        auVar485._12_2_ =
             (((short)uVar388 < sVar195) * uVar388 | (ushort)((short)uVar388 >= sVar195) * sVar195)
             + auVar26._12_2_;
        auVar485._14_2_ =
             (((short)uVar274 < sVar200) * uVar274 | (ushort)((short)uVar274 >= sVar200) * sVar200)
             + auVar26._14_2_;
        auVar485 = auVar485 ^ auVar26;
        local_188 = auVar24._0_2_;
        sStack_186 = auVar24._2_2_;
        uVar2 = *(undefined8 *)(in + lVar15);
        uVar3 = *(undefined8 *)(in + lVar15 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar15 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar15 + 0x1b0);
        uVar216 = (ushort)uVar3;
        auVar78._0_2_ = uVar216 - sVar21;
        uVar389 = (ushort)((ulong)uVar3 >> 0x10);
        auVar78._2_2_ = uVar389 - sVar510;
        uVar259 = (ushort)((ulong)uVar3 >> 0x20);
        auVar78._4_2_ = uVar259 - sVar36;
        uVar408 = (ushort)((ulong)uVar3 >> 0x30);
        auVar78._6_2_ = uVar408 - sVar519;
        uVar284 = (ushort)uVar2;
        auVar78._8_2_ = uVar284 - sVar39;
        uVar429 = (ushort)((ulong)uVar2 >> 0x10);
        auVar78._10_2_ = uVar429 - sVar160;
        uVar447 = (ushort)((ulong)uVar2 >> 0x20);
        uVar453 = (ushort)((ulong)uVar2 >> 0x30);
        auVar78._12_2_ = uVar447 - sVar190;
        auVar78._14_2_ = uVar453 - sVar206;
        uVar471 = (ushort)uVar5;
        auVar112._0_2_ = uVar471 - sVar41;
        uVar526 = (ushort)((ulong)uVar5 >> 0x10);
        auVar112._2_2_ = uVar526 - sVar47;
        uVar534 = (ushort)((ulong)uVar5 >> 0x20);
        auVar112._4_2_ = uVar534 - sVar49;
        uVar129 = (ushort)((ulong)uVar5 >> 0x30);
        auVar112._6_2_ = uVar129 - sVar51;
        uVar136 = (ushort)uVar4;
        auVar112._8_2_ = uVar136 - sVar53;
        uVar143 = (ushort)((ulong)uVar4 >> 0x10);
        auVar112._10_2_ = uVar143 - sVar55;
        uVar150 = (ushort)((ulong)uVar4 >> 0x20);
        uVar157 = (ushort)((ulong)uVar4 >> 0x30);
        auVar112._12_2_ = uVar150 - sVar57;
        auVar112._14_2_ = uVar157 - sVar59;
        auVar26 = pabsw(auVar177,auVar78);
        uVar60 = auVar26._0_2_;
        auVar304._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar26._2_2_;
        auVar304._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar26._4_2_;
        auVar304._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar26._6_2_;
        auVar304._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar26._8_2_;
        auVar304._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar26._10_2_;
        auVar304._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar304._12_2_ = uVar91 >> local_1a8;
        auVar304._14_2_ = uVar94 >> local_1a8;
        auVar26 = pabsw(auVar28,auVar112);
        uVar215 = auVar26._0_2_;
        auVar383._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar26._2_2_;
        auVar383._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar26._4_2_;
        auVar383._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar26._6_2_;
        auVar383._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar26._8_2_;
        auVar383._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar26._10_2_;
        auVar383._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar26._12_2_;
        uVar274 = auVar26._14_2_;
        auVar383._12_2_ = uVar388 >> local_1a8;
        auVar383._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar304);
        auVar26 = psubusw(local_178,auVar383);
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        auVar26 = psraw(auVar78,0xf);
        auVar168._0_2_ =
             (((short)uVar60 < sVar38) * uVar60 | (ushort)((short)uVar60 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar168._2_2_ =
             (((short)uVar81 < sVar522) * uVar81 | (ushort)((short)uVar81 >= sVar522) * sVar522) +
             auVar26._2_2_;
        auVar168._4_2_ =
             (((short)uVar83 < sVar525) * uVar83 | (ushort)((short)uVar83 >= sVar525) * sVar525) +
             auVar26._4_2_;
        auVar168._6_2_ =
             (((short)uVar85 < sVar40) * uVar85 | (ushort)((short)uVar85 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar168._8_2_ =
             (((short)uVar87 < sVar181) * uVar87 | (ushort)((short)uVar87 >= sVar181) * sVar181) +
             auVar26._8_2_;
        auVar168._10_2_ =
             (((short)uVar89 < sVar185) * uVar89 | (ushort)((short)uVar89 >= sVar185) * sVar185) +
             auVar26._10_2_;
        auVar168._12_2_ =
             (((short)uVar91 < sVar195) * uVar91 | (ushort)((short)uVar91 >= sVar195) * sVar195) +
             auVar26._12_2_;
        auVar168._14_2_ =
             (((short)uVar94 < sVar200) * uVar94 | (ushort)((short)uVar94 >= sVar200) * sVar200) +
             auVar26._14_2_;
        auVar168 = auVar168 ^ auVar26;
        auVar26 = psraw(auVar112,0xf);
        auVar64._0_2_ =
             (((short)uVar215 < sVar20) * uVar215 | (ushort)((short)uVar215 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar64._2_2_ =
             (((short)uVar244 < sVar494) * uVar244 | (ushort)((short)uVar244 >= sVar494) * sVar494)
             + auVar26._2_2_;
        auVar64._4_2_ =
             (((short)uVar250 < sVar507) * uVar250 | (ushort)((short)uVar250 >= sVar507) * sVar507)
             + auVar26._4_2_;
        auVar64._6_2_ =
             (((short)uVar364 < sVar34) * uVar364 | (ushort)((short)uVar364 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar64._8_2_ =
             (((short)uVar258 < sVar35) * uVar258 | (ushort)((short)uVar258 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar64._10_2_ =
             (((short)uVar266 < sVar513) * uVar266 | (ushort)((short)uVar266 >= sVar513) * sVar513)
             + auVar26._10_2_;
        auVar64._12_2_ =
             (((short)uVar388 < sVar516) * uVar388 | (ushort)((short)uVar388 >= sVar516) * sVar516)
             + auVar26._12_2_;
        auVar64._14_2_ =
             (((short)uVar274 < sVar37) * uVar274 | (ushort)((short)uVar274 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar64 = auVar64 ^ auVar26;
        uVar2 = *(undefined8 *)(in + -lVar15);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar15));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar15));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar15));
        auVar113._8_8_ = uVar4;
        auVar113._0_8_ = uVar5;
        uVar365 = (ushort)uVar3;
        auVar79._0_2_ = uVar365 - sVar21;
        uVar251 = (ushort)((ulong)uVar3 >> 0x10);
        auVar79._2_2_ = uVar251 - sVar510;
        uVar402 = (ushort)((ulong)uVar3 >> 0x20);
        auVar79._4_2_ = uVar402 - sVar36;
        uVar275 = (ushort)((ulong)uVar3 >> 0x30);
        auVar79._6_2_ = uVar275 - sVar519;
        uVar422 = (ushort)uVar2;
        auVar79._8_2_ = uVar422 - sVar39;
        uVar435 = (ushort)((ulong)uVar2 >> 0x10);
        auVar79._10_2_ = uVar435 - sVar160;
        uVar449 = (ushort)((ulong)uVar2 >> 0x20);
        uVar455 = (ushort)((ulong)uVar2 >> 0x30);
        auVar79._12_2_ = uVar449 - sVar190;
        auVar79._14_2_ = uVar455 - sVar206;
        auVar26 = pabsw(auVar113,auVar79);
        uVar60 = auVar26._0_2_;
        auVar241._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar26._2_2_;
        auVar241._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar26._4_2_;
        auVar241._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar26._6_2_;
        auVar241._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar26._8_2_;
        auVar241._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar26._10_2_;
        auVar241._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar241._12_2_ = uVar91 >> local_1a8;
        auVar241._14_2_ = uVar94 >> local_1a8;
        auVar26 = psubusw(local_178,auVar241);
        uVar367 = (ushort)uVar5;
        auVar384._0_2_ = uVar367 - sVar41;
        uVar391 = (ushort)((ulong)uVar5 >> 0x10);
        auVar384._2_2_ = uVar391 - sVar47;
        uVar398 = (ushort)((ulong)uVar5 >> 0x20);
        auVar384._4_2_ = uVar398 - sVar49;
        uVar404 = (ushort)((ulong)uVar5 >> 0x30);
        auVar384._6_2_ = uVar404 - sVar51;
        uVar410 = (ushort)uVar4;
        auVar384._8_2_ = uVar410 - sVar53;
        uVar417 = (ushort)((ulong)uVar4 >> 0x10);
        auVar384._10_2_ = uVar417 - sVar55;
        uVar424 = (ushort)((ulong)uVar4 >> 0x20);
        uVar431 = (ushort)((ulong)uVar4 >> 0x30);
        auVar384._12_2_ = uVar424 - sVar57;
        auVar384._14_2_ = uVar431 - sVar59;
        auVar304 = pabsw(auVar62,auVar384);
        uVar215 = auVar304._0_2_;
        auVar467._0_2_ = uVar215 >> local_1a8;
        uVar244 = auVar304._2_2_;
        auVar467._2_2_ = uVar244 >> local_1a8;
        uVar250 = auVar304._4_2_;
        auVar467._4_2_ = uVar250 >> local_1a8;
        uVar364 = auVar304._6_2_;
        auVar467._6_2_ = uVar364 >> local_1a8;
        uVar258 = auVar304._8_2_;
        auVar467._8_2_ = uVar258 >> local_1a8;
        uVar266 = auVar304._10_2_;
        auVar467._10_2_ = uVar266 >> local_1a8;
        uVar388 = auVar304._12_2_;
        uVar274 = auVar304._14_2_;
        auVar467._12_2_ = uVar388 >> local_1a8;
        auVar467._14_2_ = uVar274 >> local_1a8;
        auVar28 = psubusw(local_178,auVar467);
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        auVar26 = psraw(auVar79,0xf);
        auVar178._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar178._2_2_ =
             (((short)uVar81 < sVar494) * uVar81 | (ushort)((short)uVar81 >= sVar494) * sVar494) +
             auVar26._2_2_;
        auVar178._4_2_ =
             (((short)uVar83 < sVar507) * uVar83 | (ushort)((short)uVar83 >= sVar507) * sVar507) +
             auVar26._4_2_;
        auVar178._6_2_ =
             (((short)uVar85 < sVar34) * uVar85 | (ushort)((short)uVar85 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar178._8_2_ =
             (((short)uVar87 < sVar35) * uVar87 | (ushort)((short)uVar87 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar178._10_2_ =
             (((short)uVar89 < sVar513) * uVar89 | (ushort)((short)uVar89 >= sVar513) * sVar513) +
             auVar26._10_2_;
        auVar178._12_2_ =
             (((short)uVar91 < sVar516) * uVar91 | (ushort)((short)uVar91 >= sVar516) * sVar516) +
             auVar26._12_2_;
        auVar178._14_2_ =
             (((short)uVar94 < sVar37) * uVar94 | (ushort)((short)uVar94 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar178 = auVar178 ^ auVar26;
        auVar26 = psraw(auVar384,0xf);
        auVar362._0_2_ =
             (((short)uVar215 < sVar38) * uVar215 | (ushort)((short)uVar215 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar362._2_2_ =
             (((short)uVar244 < sVar522) * uVar244 | (ushort)((short)uVar244 >= sVar522) * sVar522)
             + auVar26._2_2_;
        auVar362._4_2_ =
             (((short)uVar250 < sVar525) * uVar250 | (ushort)((short)uVar250 >= sVar525) * sVar525)
             + auVar26._4_2_;
        auVar362._6_2_ =
             (((short)uVar364 < sVar40) * uVar364 | (ushort)((short)uVar364 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar362._8_2_ =
             (((short)uVar258 < sVar181) * uVar258 | (ushort)((short)uVar258 >= sVar181) * sVar181)
             + auVar26._8_2_;
        auVar362._10_2_ =
             (((short)uVar266 < sVar185) * uVar266 | (ushort)((short)uVar266 >= sVar185) * sVar185)
             + auVar26._10_2_;
        auVar362._12_2_ =
             (((short)uVar388 < sVar195) * uVar388 | (ushort)((short)uVar388 >= sVar195) * sVar195)
             + auVar26._12_2_;
        auVar362._14_2_ =
             (((short)uVar274 < sVar200) * uVar274 | (ushort)((short)uVar274 >= sVar200) * sVar200)
             + auVar26._14_2_;
        auVar362 = auVar362 ^ auVar26;
        uVar2 = *(undefined8 *)(in + lVar16);
        uVar3 = *(undefined8 *)(in + lVar16 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar16 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar16 + 0x1b0);
        auVar230._8_8_ = uVar4;
        auVar230._0_8_ = uVar5;
        uVar215 = (ushort)uVar3;
        auVar62._0_2_ = uVar215 - sVar21;
        uVar244 = (ushort)((ulong)uVar3 >> 0x10);
        auVar62._2_2_ = uVar244 - sVar510;
        uVar250 = (ushort)((ulong)uVar3 >> 0x20);
        auVar62._4_2_ = uVar250 - sVar36;
        uVar364 = (ushort)((ulong)uVar3 >> 0x30);
        auVar62._6_2_ = uVar364 - sVar519;
        uVar258 = (ushort)uVar2;
        auVar62._8_2_ = uVar258 - sVar39;
        uVar266 = (ushort)((ulong)uVar2 >> 0x10);
        auVar62._10_2_ = uVar266 - sVar160;
        uVar388 = (ushort)((ulong)uVar2 >> 0x20);
        uVar274 = (ushort)((ulong)uVar2 >> 0x30);
        auVar62._12_2_ = uVar388 - sVar190;
        auVar62._14_2_ = uVar274 - sVar206;
        auVar26 = pabsw(auVar230,auVar62);
        uVar60 = auVar26._0_2_;
        auVar114._0_2_ = uVar60 >> local_1a8;
        uVar81 = auVar26._2_2_;
        auVar114._2_2_ = uVar81 >> local_1a8;
        uVar83 = auVar26._4_2_;
        auVar114._4_2_ = uVar83 >> local_1a8;
        uVar85 = auVar26._6_2_;
        auVar114._6_2_ = uVar85 >> local_1a8;
        uVar87 = auVar26._8_2_;
        auVar114._8_2_ = uVar87 >> local_1a8;
        uVar89 = auVar26._10_2_;
        auVar114._10_2_ = uVar89 >> local_1a8;
        uVar91 = auVar26._12_2_;
        uVar94 = auVar26._14_2_;
        auVar114._12_2_ = uVar91 >> local_1a8;
        auVar114._14_2_ = uVar94 >> local_1a8;
        auVar26 = psubusw(local_178,auVar114);
        uVar368 = (ushort)uVar5;
        auVar385._0_2_ = uVar368 - sVar41;
        uVar392 = (ushort)((ulong)uVar5 >> 0x10);
        auVar385._2_2_ = uVar392 - sVar47;
        uVar399 = (ushort)((ulong)uVar5 >> 0x20);
        auVar385._4_2_ = uVar399 - sVar49;
        uVar405 = (ushort)((ulong)uVar5 >> 0x30);
        auVar385._6_2_ = uVar405 - sVar51;
        uVar411 = (ushort)uVar4;
        auVar385._8_2_ = uVar411 - sVar53;
        uVar418 = (ushort)((ulong)uVar4 >> 0x10);
        auVar385._10_2_ = uVar418 - sVar55;
        uVar425 = (ushort)((ulong)uVar4 >> 0x20);
        uVar432 = (ushort)((ulong)uVar4 >> 0x30);
        auVar385._12_2_ = uVar425 - sVar57;
        auVar385._14_2_ = uVar432 - sVar59;
        auVar28 = pabsw(auVar304,auVar385);
        uVar395 = auVar28._0_2_;
        auVar468._0_2_ = uVar395 >> local_1a8;
        uVar401 = auVar28._2_2_;
        auVar468._2_2_ = uVar401 >> local_1a8;
        uVar414 = auVar28._4_2_;
        auVar468._4_2_ = uVar414 >> local_1a8;
        uVar428 = auVar28._6_2_;
        auVar468._6_2_ = uVar428 >> local_1a8;
        uVar487 = auVar28._8_2_;
        auVar468._8_2_ = uVar487 >> local_1a8;
        uVar488 = auVar28._10_2_;
        auVar468._10_2_ = uVar488 >> local_1a8;
        uVar95 = auVar28._12_2_;
        uVar491 = auVar28._14_2_;
        auVar468._12_2_ = uVar95 >> local_1a8;
        auVar468._14_2_ = uVar491 >> local_1a8;
        auVar28 = psubusw(local_178,auVar468);
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        auVar26 = psraw(auVar62,0xf);
        auVar80._0_2_ =
             (((short)uVar60 < sVar20) * uVar60 | (ushort)((short)uVar60 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar80._2_2_ =
             (((short)uVar81 < sVar494) * uVar81 | (ushort)((short)uVar81 >= sVar494) * sVar494) +
             auVar26._2_2_;
        auVar80._4_2_ =
             (((short)uVar83 < sVar507) * uVar83 | (ushort)((short)uVar83 >= sVar507) * sVar507) +
             auVar26._4_2_;
        auVar80._6_2_ =
             (((short)uVar85 < sVar34) * uVar85 | (ushort)((short)uVar85 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar80._8_2_ =
             (((short)uVar87 < sVar35) * uVar87 | (ushort)((short)uVar87 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar80._10_2_ =
             (((short)uVar89 < sVar513) * uVar89 | (ushort)((short)uVar89 >= sVar513) * sVar513) +
             auVar26._10_2_;
        auVar80._12_2_ =
             (((short)uVar91 < sVar516) * uVar91 | (ushort)((short)uVar91 >= sVar516) * sVar516) +
             auVar26._12_2_;
        auVar80._14_2_ =
             (((short)uVar94 < sVar37) * uVar94 | (ushort)((short)uVar94 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar80 = auVar80 ^ auVar26;
        auVar26 = psraw(auVar385,0xf);
        auVar115._0_2_ =
             (((short)uVar395 < sVar38) * uVar395 | (ushort)((short)uVar395 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar115._2_2_ =
             (((short)uVar401 < sVar522) * uVar401 | (ushort)((short)uVar401 >= sVar522) * sVar522)
             + auVar26._2_2_;
        auVar115._4_2_ =
             (((short)uVar414 < sVar525) * uVar414 | (ushort)((short)uVar414 >= sVar525) * sVar525)
             + auVar26._4_2_;
        auVar115._6_2_ =
             (((short)uVar428 < sVar40) * uVar428 | (ushort)((short)uVar428 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar115._8_2_ =
             (((short)uVar487 < sVar181) * uVar487 | (ushort)((short)uVar487 >= sVar181) * sVar181)
             + auVar26._8_2_;
        auVar115._10_2_ =
             (((short)uVar488 < sVar185) * uVar488 | (ushort)((short)uVar488 >= sVar185) * sVar185)
             + auVar26._10_2_;
        auVar115._12_2_ =
             (((short)uVar95 < sVar195) * uVar95 | (ushort)((short)uVar95 >= sVar195) * sVar195) +
             auVar26._12_2_;
        auVar115._14_2_ =
             (((short)uVar491 < sVar200) * uVar491 | (ushort)((short)uVar491 >= sVar200) * sVar200)
             + auVar26._14_2_;
        auVar115 = auVar115 ^ auVar26;
        uVar87 = in[4 - lVar16];
        uVar89 = in[5 - lVar16];
        uVar91 = in[6 - lVar16];
        uVar94 = in[7 - lVar16];
        puVar1 = in + (0x90 - lVar16);
        uVar60 = *puVar1;
        uVar81 = puVar1[1];
        uVar83 = puVar1[2];
        uVar85 = puVar1[3];
        uVar2 = *(undefined8 *)(in + (0x120 - lVar16));
        uVar3 = *(undefined8 *)(in + (0x1b0 - lVar16));
        local_128 = (ushort)uVar3;
        uStack_126 = (ushort)((ulong)uVar3 >> 0x10);
        uStack_124 = (ushort)((ulong)uVar3 >> 0x20);
        uStack_122 = (ushort)((ulong)uVar3 >> 0x30);
        uStack_120 = (ushort)uVar2;
        uStack_11e = (ushort)((ulong)uVar2 >> 0x10);
        uStack_11c = (ushort)((ulong)uVar2 >> 0x20);
        uStack_11a = (ushort)((ulong)uVar2 >> 0x30);
        auVar386._0_2_ = uVar60 - sVar21;
        auVar386._2_2_ = uVar81 - sVar510;
        auVar386._4_2_ = uVar83 - sVar36;
        auVar386._6_2_ = uVar85 - sVar519;
        auVar386._8_2_ = uVar87 - sVar39;
        auVar386._10_2_ = uVar89 - sVar160;
        auVar386._12_2_ = uVar91 - sVar190;
        auVar386._14_2_ = uVar94 - sVar206;
        auVar443._0_2_ = local_128 - sVar41;
        auVar443._2_2_ = uStack_126 - sVar47;
        auVar443._4_2_ = uStack_124 - sVar49;
        auVar443._6_2_ = uStack_122 - sVar51;
        auVar443._8_2_ = uStack_120 - sVar53;
        auVar443._10_2_ = uStack_11e - sVar55;
        auVar443._12_2_ = uStack_11c - sVar57;
        auVar443._14_2_ = uStack_11a - sVar59;
        auVar26 = pabsw(auVar468,auVar386);
        uVar395 = auVar26._0_2_;
        auVar379._0_2_ = uVar395 >> local_1a8;
        uVar401 = auVar26._2_2_;
        auVar379._2_2_ = uVar401 >> local_1a8;
        uVar414 = auVar26._4_2_;
        auVar379._4_2_ = uVar414 >> local_1a8;
        uVar428 = auVar26._6_2_;
        auVar379._6_2_ = uVar428 >> local_1a8;
        uVar487 = auVar26._8_2_;
        auVar379._8_2_ = uVar487 >> local_1a8;
        uVar488 = auVar26._10_2_;
        auVar379._10_2_ = uVar488 >> local_1a8;
        uVar95 = auVar26._12_2_;
        uVar491 = auVar26._14_2_;
        auVar379._12_2_ = uVar95 >> local_1a8;
        auVar379._14_2_ = uVar491 >> local_1a8;
        auVar26 = pabsw(local_238,auVar443);
        uVar273 = auVar26._0_2_;
        auVar242._0_2_ = uVar273 >> local_1a8;
        uVar281 = auVar26._2_2_;
        auVar242._2_2_ = uVar281 >> local_1a8;
        uVar290 = auVar26._4_2_;
        auVar242._4_2_ = uVar290 >> local_1a8;
        uVar298 = auVar26._6_2_;
        auVar242._6_2_ = uVar298 >> local_1a8;
        uVar336 = auVar26._8_2_;
        auVar242._8_2_ = uVar336 >> local_1a8;
        uVar341 = auVar26._10_2_;
        auVar242._10_2_ = uVar341 >> local_1a8;
        uVar346 = auVar26._12_2_;
        uVar352 = auVar26._14_2_;
        auVar242._12_2_ = uVar346 >> local_1a8;
        auVar242._14_2_ = uVar352 >> local_1a8;
        auVar26 = psubusw(local_178,auVar379);
        auVar28 = psubusw(local_178,auVar242);
        sVar20 = auVar26._0_2_;
        sVar494 = auVar26._2_2_;
        sVar507 = auVar26._4_2_;
        sVar34 = auVar26._6_2_;
        sVar35 = auVar26._8_2_;
        sVar513 = auVar26._10_2_;
        sVar516 = auVar26._12_2_;
        sVar37 = auVar26._14_2_;
        sVar38 = auVar28._0_2_;
        sVar522 = auVar28._2_2_;
        sVar525 = auVar28._4_2_;
        sVar40 = auVar28._6_2_;
        sVar181 = auVar28._8_2_;
        sVar185 = auVar28._10_2_;
        sVar195 = auVar28._12_2_;
        sVar200 = auVar28._14_2_;
        auVar26 = psraw(auVar386,0xf);
        auVar97._0_2_ =
             (((short)uVar395 < sVar20) * uVar395 | (ushort)((short)uVar395 >= sVar20) * sVar20) +
             auVar26._0_2_;
        auVar97._2_2_ =
             (((short)uVar401 < sVar494) * uVar401 | (ushort)((short)uVar401 >= sVar494) * sVar494)
             + auVar26._2_2_;
        auVar97._4_2_ =
             (((short)uVar414 < sVar507) * uVar414 | (ushort)((short)uVar414 >= sVar507) * sVar507)
             + auVar26._4_2_;
        auVar97._6_2_ =
             (((short)uVar428 < sVar34) * uVar428 | (ushort)((short)uVar428 >= sVar34) * sVar34) +
             auVar26._6_2_;
        auVar97._8_2_ =
             (((short)uVar487 < sVar35) * uVar487 | (ushort)((short)uVar487 >= sVar35) * sVar35) +
             auVar26._8_2_;
        auVar97._10_2_ =
             (((short)uVar488 < sVar513) * uVar488 | (ushort)((short)uVar488 >= sVar513) * sVar513)
             + auVar26._10_2_;
        auVar97._12_2_ =
             (((short)uVar95 < sVar516) * uVar95 | (ushort)((short)uVar95 >= sVar516) * sVar516) +
             auVar26._12_2_;
        auVar97._14_2_ =
             (((short)uVar491 < sVar37) * uVar491 | (ushort)((short)uVar491 >= sVar37) * sVar37) +
             auVar26._14_2_;
        auVar97 = auVar97 ^ auVar26;
        auVar26 = psraw(auVar443,0xf);
        auVar372._0_2_ =
             (((short)uVar273 < sVar38) * uVar273 | (ushort)((short)uVar273 >= sVar38) * sVar38) +
             auVar26._0_2_;
        auVar372._2_2_ =
             (((short)uVar281 < sVar522) * uVar281 | (ushort)((short)uVar281 >= sVar522) * sVar522)
             + auVar26._2_2_;
        auVar372._4_2_ =
             (((short)uVar290 < sVar525) * uVar290 | (ushort)((short)uVar290 >= sVar525) * sVar525)
             + auVar26._4_2_;
        auVar372._6_2_ =
             (((short)uVar298 < sVar40) * uVar298 | (ushort)((short)uVar298 >= sVar40) * sVar40) +
             auVar26._6_2_;
        auVar372._8_2_ =
             (((short)uVar336 < sVar181) * uVar336 | (ushort)((short)uVar336 >= sVar181) * sVar181)
             + auVar26._8_2_;
        auVar372._10_2_ =
             (((short)uVar341 < sVar185) * uVar341 | (ushort)((short)uVar341 >= sVar185) * sVar185)
             + auVar26._10_2_;
        auVar372._12_2_ =
             (((short)uVar346 < sVar195) * uVar346 | (ushort)((short)uVar346 >= sVar195) * sVar195)
             + auVar26._12_2_;
        auVar372._14_2_ =
             (((short)uVar352 < sVar200) * uVar352 | (ushort)((short)uVar352 >= sVar200) * sVar200)
             + auVar26._14_2_;
        auVar372 = auVar372 ^ auVar26;
        local_198 = auVar25._0_2_;
        sStack_196 = auVar25._2_2_;
        auVar354._0_2_ =
             (auVar97._0_2_ + auVar80._0_2_ + auVar178._0_2_ + auVar168._0_2_) * local_198 +
             (auVar45._0_2_ + auVar177._0_2_ + auVar77._0_2_ + auVar109._0_2_) * local_188 +
             (auVar232._0_2_ + auVar313._0_2_) * local_168 +
             (auVar173._0_2_ + auVar234._0_2_) * local_158;
        auVar354._2_2_ =
             (auVar97._2_2_ + auVar80._2_2_ + auVar178._2_2_ + auVar168._2_2_) * sStack_196 +
             (auVar45._2_2_ + auVar177._2_2_ + auVar77._2_2_ + auVar109._2_2_) * sStack_186 +
             (auVar232._2_2_ + auVar313._2_2_) * sStack_166 +
             (auVar173._2_2_ + auVar234._2_2_) * sStack_156;
        auVar354._4_2_ =
             (auVar97._4_2_ + auVar80._4_2_ + auVar178._4_2_ + auVar168._4_2_) * local_198 +
             (auVar45._4_2_ + auVar177._4_2_ + auVar77._4_2_ + auVar109._4_2_) * local_188 +
             (auVar232._4_2_ + auVar313._4_2_) * local_168 +
             (auVar173._4_2_ + auVar234._4_2_) * local_158;
        auVar354._6_2_ =
             (auVar97._6_2_ + auVar80._6_2_ + auVar178._6_2_ + auVar168._6_2_) * sStack_196 +
             (auVar45._6_2_ + auVar177._6_2_ + auVar77._6_2_ + auVar109._6_2_) * sStack_186 +
             (auVar232._6_2_ + auVar313._6_2_) * sStack_166 +
             (auVar173._6_2_ + auVar234._6_2_) * sStack_156;
        auVar354._8_2_ =
             (auVar97._8_2_ + auVar80._8_2_ + auVar178._8_2_ + auVar168._8_2_) * local_198 +
             (auVar45._8_2_ + auVar177._8_2_ + auVar77._8_2_ + auVar109._8_2_) * local_188 +
             (auVar232._8_2_ + auVar313._8_2_) * local_168 +
             (auVar173._8_2_ + auVar234._8_2_) * local_158;
        auVar354._10_2_ =
             (auVar97._10_2_ + auVar80._10_2_ + auVar178._10_2_ + auVar168._10_2_) * sStack_196 +
             (auVar45._10_2_ + auVar177._10_2_ + auVar77._10_2_ + auVar109._10_2_) * sStack_186 +
             (auVar232._10_2_ + auVar313._10_2_) * sStack_166 +
             (auVar173._10_2_ + auVar234._10_2_) * sStack_156;
        auVar354._12_2_ =
             (auVar97._12_2_ + auVar80._12_2_ + auVar178._12_2_ + auVar168._12_2_) * local_198 +
             (auVar45._12_2_ + auVar177._12_2_ + auVar77._12_2_ + auVar109._12_2_) * local_188 +
             (auVar232._12_2_ + auVar313._12_2_) * local_168 +
             (auVar173._12_2_ + auVar234._12_2_) * local_158;
        auVar354._14_2_ =
             (auVar97._14_2_ + auVar80._14_2_ + auVar178._14_2_ + auVar168._14_2_) * sStack_196 +
             (auVar45._14_2_ + auVar177._14_2_ + auVar77._14_2_ + auVar109._14_2_) * sStack_186 +
             (auVar232._14_2_ + auVar313._14_2_) * sStack_166 +
             (auVar173._14_2_ + auVar234._14_2_) * sStack_156;
        auVar375._0_2_ =
             (auVar372._0_2_ + auVar115._0_2_ + auVar362._0_2_ + auVar64._0_2_) * local_198 +
             (auVar485._0_2_ + auVar111._0_2_ + auVar228._0_2_ + auVar176._0_2_) * local_188 +
             (auVar382._0_2_ + auVar236._0_2_) * local_168 +
             (auVar108._0_2_ + auVar27._0_2_) * local_158;
        auVar375._2_2_ =
             (auVar372._2_2_ + auVar115._2_2_ + auVar362._2_2_ + auVar64._2_2_) * sStack_196 +
             (auVar485._2_2_ + auVar111._2_2_ + auVar228._2_2_ + auVar176._2_2_) * sStack_186 +
             (auVar382._2_2_ + auVar236._2_2_) * sStack_166 +
             (auVar108._2_2_ + auVar27._2_2_) * sStack_156;
        auVar375._4_2_ =
             (auVar372._4_2_ + auVar115._4_2_ + auVar362._4_2_ + auVar64._4_2_) * local_198 +
             (auVar485._4_2_ + auVar111._4_2_ + auVar228._4_2_ + auVar176._4_2_) * local_188 +
             (auVar382._4_2_ + auVar236._4_2_) * local_168 +
             (auVar108._4_2_ + auVar27._4_2_) * local_158;
        auVar375._6_2_ =
             (auVar372._6_2_ + auVar115._6_2_ + auVar362._6_2_ + auVar64._6_2_) * sStack_196 +
             (auVar485._6_2_ + auVar111._6_2_ + auVar228._6_2_ + auVar176._6_2_) * sStack_186 +
             (auVar382._6_2_ + auVar236._6_2_) * sStack_166 +
             (auVar108._6_2_ + auVar27._6_2_) * sStack_156;
        auVar375._8_2_ =
             (auVar372._8_2_ + auVar115._8_2_ + auVar362._8_2_ + auVar64._8_2_) * local_198 +
             (auVar485._8_2_ + auVar111._8_2_ + auVar228._8_2_ + auVar176._8_2_) * local_188 +
             (auVar382._8_2_ + auVar236._8_2_) * local_168 +
             (auVar108._8_2_ + auVar27._8_2_) * local_158;
        auVar375._10_2_ =
             (auVar372._10_2_ + auVar115._10_2_ + auVar362._10_2_ + auVar64._10_2_) * sStack_196 +
             (auVar485._10_2_ + auVar111._10_2_ + auVar228._10_2_ + auVar176._10_2_) * sStack_186 +
             (auVar382._10_2_ + auVar236._10_2_) * sStack_166 +
             (auVar108._10_2_ + auVar27._10_2_) * sStack_156;
        auVar375._12_2_ =
             (auVar372._12_2_ + auVar115._12_2_ + auVar362._12_2_ + auVar64._12_2_) * local_198 +
             (auVar485._12_2_ + auVar111._12_2_ + auVar228._12_2_ + auVar176._12_2_) * local_188 +
             (auVar382._12_2_ + auVar236._12_2_) * local_168 +
             (auVar108._12_2_ + auVar27._12_2_) * local_158;
        auVar375._14_2_ =
             (auVar372._14_2_ + auVar115._14_2_ + auVar362._14_2_ + auVar64._14_2_) * sStack_196 +
             (auVar485._14_2_ + auVar111._14_2_ + auVar228._14_2_ + auVar176._14_2_) * sStack_186 +
             (auVar382._14_2_ + auVar236._14_2_) * sStack_166 +
             (auVar108._14_2_ + auVar27._14_2_) * sStack_156;
        uVar487 = ((short)uVar474 < (short)uVar283) * uVar474 |
                  ((short)uVar474 >= (short)uVar283) * uVar283;
        uVar488 = ((short)uVar529 < (short)uVar291) * uVar529 |
                  ((short)uVar529 >= (short)uVar291) * uVar291;
        uVar95 = ((short)uVar535 < (short)uVar407) * uVar535 |
                 ((short)uVar535 >= (short)uVar407) * uVar407;
        uVar491 = ((short)uVar208 < (short)uVar421) * uVar208 |
                  ((short)uVar208 >= (short)uVar421) * uVar421;
        uVar336 = ((short)uVar220 < (short)uVar486) * uVar220 |
                  ((short)uVar220 >= (short)uVar486) * uVar486;
        uVar341 = ((short)uVar249 < (short)uVar92) * uVar249 |
                  ((short)uVar249 >= (short)uVar92) * uVar92;
        uVar346 = ((short)uVar257 < (short)uVar489) * uVar257 |
                  ((short)uVar257 >= (short)uVar489) * uVar489;
        uVar352 = ((short)uVar265 < (short)uVar490) * uVar265 |
                  ((short)uVar265 >= (short)uVar490) * uVar490;
        uVar474 = uVar474 & 0xbfff;
        uVar529 = uVar529 & 0xbfff;
        uVar535 = uVar535 & 0xbfff;
        uVar208 = uVar208 & 0xbfff;
        uVar220 = uVar220 & 0xbfff;
        uVar249 = uVar249 & 0xbfff;
        uVar257 = uVar257 & 0xbfff;
        uVar265 = uVar265 & 0xbfff;
        uVar283 = uVar283 & 0xbfff;
        uVar291 = uVar291 & 0xbfff;
        uVar407 = uVar407 & 0xbfff;
        uVar421 = uVar421 & 0xbfff;
        uVar486 = uVar486 & 0xbfff;
        uVar92 = uVar92 & 0xbfff;
        uVar489 = uVar489 & 0xbfff;
        uVar490 = uVar490 & 0xbfff;
        uVar283 = ((short)uVar283 < (short)uVar474) * uVar474 |
                  ((short)uVar283 >= (short)uVar474) * uVar283;
        uVar395 = ((short)uVar291 < (short)uVar529) * uVar529 |
                  ((short)uVar291 >= (short)uVar529) * uVar291;
        uVar291 = ((short)uVar407 < (short)uVar535) * uVar535 |
                  ((short)uVar407 >= (short)uVar535) * uVar407;
        uVar401 = ((short)uVar421 < (short)uVar208) * uVar208 |
                  ((short)uVar421 >= (short)uVar208) * uVar421;
        uVar407 = ((short)uVar486 < (short)uVar220) * uVar220 |
                  ((short)uVar486 >= (short)uVar220) * uVar486;
        uVar414 = ((short)uVar92 < (short)uVar249) * uVar249 |
                  ((short)uVar92 >= (short)uVar249) * uVar92;
        uVar421 = ((short)uVar489 < (short)uVar257) * uVar257 |
                  ((short)uVar489 >= (short)uVar257) * uVar489;
        uVar428 = ((short)uVar490 < (short)uVar265) * uVar265 |
                  ((short)uVar490 >= (short)uVar265) * uVar490;
        uVar220 = ((short)uVar477 < (short)uVar426) * uVar477 |
                  ((short)uVar477 >= (short)uVar426) * uVar426;
        uVar249 = ((short)uVar530 < (short)uVar433) * uVar530 |
                  ((short)uVar530 >= (short)uVar433) * uVar433;
        uVar257 = ((short)uVar202 < (short)uVar254) * uVar202 |
                  ((short)uVar202 >= (short)uVar254) * uVar254;
        uVar265 = ((short)uVar214 < (short)uVar262) * uVar214 |
                  ((short)uVar214 >= (short)uVar262) * uVar262;
        uVar273 = ((short)uVar326 < (short)uVar270) * uVar326 |
                  ((short)uVar326 >= (short)uVar270) * uVar270;
        uVar281 = ((short)uVar347 < (short)uVar278) * uVar347 |
                  ((short)uVar347 >= (short)uVar278) * uVar278;
        uVar290 = ((short)uVar369 < (short)uVar287) * uVar369 |
                  ((short)uVar369 >= (short)uVar287) * uVar287;
        uVar298 = ((short)uVar412 < (short)uVar295) * uVar412 |
                  ((short)uVar412 >= (short)uVar295) * uVar295;
        uVar477 = uVar477 & 0xbfff;
        uVar530 = uVar530 & 0xbfff;
        uVar202 = uVar202 & 0xbfff;
        uVar214 = uVar214 & 0xbfff;
        uVar326 = uVar326 & 0xbfff;
        uVar347 = uVar347 & 0xbfff;
        uVar369 = uVar369 & 0xbfff;
        uVar412 = uVar412 & 0xbfff;
        uVar426 = uVar426 & 0xbfff;
        uVar433 = uVar433 & 0xbfff;
        uVar254 = uVar254 & 0xbfff;
        uVar262 = uVar262 & 0xbfff;
        uVar270 = uVar270 & 0xbfff;
        uVar278 = uVar278 & 0xbfff;
        uVar287 = uVar287 & 0xbfff;
        uVar295 = uVar295 & 0xbfff;
        uVar474 = ((short)uVar426 < (short)uVar477) * uVar477 |
                  ((short)uVar426 >= (short)uVar477) * uVar426;
        uVar477 = ((short)uVar433 < (short)uVar530) * uVar530 |
                  ((short)uVar433 >= (short)uVar530) * uVar433;
        uVar529 = ((short)uVar254 < (short)uVar202) * uVar202 |
                  ((short)uVar254 >= (short)uVar202) * uVar254;
        uVar530 = ((short)uVar262 < (short)uVar214) * uVar214 |
                  ((short)uVar262 >= (short)uVar214) * uVar262;
        uVar535 = ((short)uVar270 < (short)uVar326) * uVar326 |
                  ((short)uVar270 >= (short)uVar326) * uVar270;
        uVar202 = ((short)uVar278 < (short)uVar347) * uVar347 |
                  ((short)uVar278 >= (short)uVar347) * uVar278;
        uVar208 = ((short)uVar287 < (short)uVar369) * uVar369 |
                  ((short)uVar287 >= (short)uVar369) * uVar287;
        uVar214 = ((short)uVar295 < (short)uVar412) * uVar412 |
                  ((short)uVar295 >= (short)uVar412) * uVar295;
        in_XMM9._0_2_ =
             ((short)uVar479 < (short)uVar487) * uVar479 |
             ((short)uVar479 >= (short)uVar487) * uVar487;
        in_XMM9._2_2_ =
             ((short)uVar531 < (short)uVar488) * uVar531 |
             ((short)uVar531 >= (short)uVar488) * uVar488;
        in_XMM9._4_2_ =
             ((short)uVar282 < (short)uVar95) * uVar282 | ((short)uVar282 >= (short)uVar95) * uVar95
        ;
        in_XMM9._6_2_ =
             ((short)uVar299 < (short)uVar491) * uVar299 |
             ((short)uVar299 >= (short)uVar491) * uVar491;
        in_XMM9._8_2_ =
             ((short)uVar331 < (short)uVar336) * uVar331 |
             ((short)uVar331 >= (short)uVar336) * uVar336;
        in_XMM9._10_2_ =
             ((short)uVar353 < (short)uVar341) * uVar353 |
             ((short)uVar353 >= (short)uVar341) * uVar341;
        in_XMM9._12_2_ =
             ((short)uVar393 < (short)uVar346) * uVar393 |
             ((short)uVar393 >= (short)uVar346) * uVar346;
        in_XMM9._14_2_ =
             ((short)uVar419 < (short)uVar352) * uVar419 |
             ((short)uVar419 >= (short)uVar352) * uVar352;
        uVar479 = uVar479 & 0xbfff;
        uVar531 = uVar531 & 0xbfff;
        uVar282 = uVar282 & 0xbfff;
        uVar299 = uVar299 & 0xbfff;
        uVar331 = uVar331 & 0xbfff;
        uVar353 = uVar353 & 0xbfff;
        uVar393 = uVar393 & 0xbfff;
        uVar419 = uVar419 & 0xbfff;
        uVar283 = ((short)uVar479 < (short)uVar283) * uVar283 |
                  ((short)uVar479 >= (short)uVar283) * uVar479;
        uVar395 = ((short)uVar531 < (short)uVar395) * uVar395 |
                  ((short)uVar531 >= (short)uVar395) * uVar531;
        uVar291 = ((short)uVar282 < (short)uVar291) * uVar291 |
                  ((short)uVar282 >= (short)uVar291) * uVar282;
        uVar401 = ((short)uVar299 < (short)uVar401) * uVar401 |
                  ((short)uVar299 >= (short)uVar401) * uVar299;
        uVar407 = ((short)uVar331 < (short)uVar407) * uVar407 |
                  ((short)uVar331 >= (short)uVar407) * uVar331;
        uVar414 = ((short)uVar353 < (short)uVar414) * uVar414 |
                  ((short)uVar353 >= (short)uVar414) * uVar353;
        uVar421 = ((short)uVar393 < (short)uVar421) * uVar421 |
                  ((short)uVar393 >= (short)uVar421) * uVar393;
        uVar428 = ((short)uVar419 < (short)uVar428) * uVar428 |
                  ((short)uVar419 >= (short)uVar428) * uVar419;
        uVar486 = ((short)uVar283 < (short)uVar540) * uVar540 |
                  ((short)uVar283 >= (short)uVar540) * uVar283;
        uVar487 = ((short)uVar395 < (short)uVar544) * uVar544 |
                  ((short)uVar395 >= (short)uVar544) * uVar395;
        uVar92 = ((short)uVar291 < (short)uVar545) * uVar545 |
                 ((short)uVar291 >= (short)uVar545) * uVar291;
        uVar488 = ((short)uVar401 < (short)uVar546) * uVar546 |
                  ((short)uVar401 >= (short)uVar546) * uVar401;
        uVar489 = ((short)uVar407 < (short)uVar547) * uVar547 |
                  ((short)uVar407 >= (short)uVar547) * uVar407;
        uVar95 = ((short)uVar414 < (short)uVar548) * uVar548 |
                 ((short)uVar414 >= (short)uVar548) * uVar414;
        uVar490 = ((short)uVar421 < (short)uVar549) * uVar549 |
                  ((short)uVar421 >= (short)uVar549) * uVar421;
        uVar491 = ((short)uVar428 < (short)uVar550) * uVar550 |
                  ((short)uVar428 >= (short)uVar550) * uVar428;
        uVar369 = ((short)uVar245 < (short)uVar220) * uVar245 |
                  ((short)uVar245 >= (short)uVar220) * uVar220;
        uVar393 = ((short)uVar396 < (short)uVar249) * uVar396 |
                  ((short)uVar396 >= (short)uVar249) * uVar249;
        uVar257 = ((short)uVar267 < (short)uVar257) * uVar267 |
                  ((short)uVar267 >= (short)uVar257) * uVar257;
        uVar265 = ((short)uVar415 < (short)uVar265) * uVar415 |
                  ((short)uVar415 >= (short)uVar265) * uVar265;
        uVar412 = ((short)uVar292 < (short)uVar273) * uVar292 |
                  ((short)uVar292 >= (short)uVar273) * uVar273;
        uVar419 = ((short)uVar445 < (short)uVar281) * uVar445 |
                  ((short)uVar445 >= (short)uVar281) * uVar281;
        uVar426 = ((short)uVar451 < (short)uVar290) * uVar451 |
                  ((short)uVar451 >= (short)uVar290) * uVar290;
        uVar433 = ((short)uVar457 < (short)uVar298) * uVar457 |
                  ((short)uVar457 >= (short)uVar298) * uVar298;
        uVar245 = uVar245 & 0xbfff;
        uVar396 = uVar396 & 0xbfff;
        uVar267 = uVar267 & 0xbfff;
        uVar415 = uVar415 & 0xbfff;
        uVar292 = uVar292 & 0xbfff;
        uVar445 = uVar445 & 0xbfff;
        uVar451 = uVar451 & 0xbfff;
        uVar457 = uVar457 & 0xbfff;
        uVar283 = ((short)uVar245 < (short)uVar474) * uVar474 |
                  ((short)uVar245 >= (short)uVar474) * uVar245;
        uVar395 = ((short)uVar396 < (short)uVar477) * uVar477 |
                  ((short)uVar396 >= (short)uVar477) * uVar396;
        uVar291 = ((short)uVar267 < (short)uVar529) * uVar529 |
                  ((short)uVar267 >= (short)uVar529) * uVar267;
        uVar401 = ((short)uVar415 < (short)uVar530) * uVar530 |
                  ((short)uVar415 >= (short)uVar530) * uVar415;
        uVar407 = ((short)uVar292 < (short)uVar535) * uVar535 |
                  ((short)uVar292 >= (short)uVar535) * uVar292;
        uVar414 = ((short)uVar445 < (short)uVar202) * uVar202 |
                  ((short)uVar445 >= (short)uVar202) * uVar445;
        uVar421 = ((short)uVar451 < (short)uVar208) * uVar208 |
                  ((short)uVar451 >= (short)uVar208) * uVar451;
        uVar428 = ((short)uVar457 < (short)uVar214) * uVar214 |
                  ((short)uVar457 >= (short)uVar214) * uVar457;
        uVar283 = ((short)uVar283 < (short)uVar458) * uVar458 |
                  ((short)uVar283 >= (short)uVar458) * uVar283;
        uVar395 = ((short)uVar395 < (short)uVar481) * uVar481 |
                  ((short)uVar395 >= (short)uVar481) * uVar395;
        uVar291 = ((short)uVar291 < (short)uVar532) * uVar532 |
                  ((short)uVar291 >= (short)uVar532) * uVar291;
        uVar401 = ((short)uVar401 < (short)uVar127) * uVar127 |
                  ((short)uVar401 >= (short)uVar127) * uVar401;
        uVar407 = ((short)uVar407 < (short)uVar134) * uVar134 |
                  ((short)uVar407 >= (short)uVar134) * uVar407;
        uVar414 = ((short)uVar414 < (short)uVar141) * uVar141 |
                  ((short)uVar414 >= (short)uVar141) * uVar414;
        uVar421 = ((short)uVar421 < (short)uVar148) * uVar148 |
                  ((short)uVar421 >= (short)uVar148) * uVar421;
        uVar428 = ((short)uVar428 < (short)uVar155) * uVar155 |
                  ((short)uVar428 >= (short)uVar155) * uVar428;
        uVar458 = ((short)uVar219 < (short)uVar473) * uVar219 |
                  ((short)uVar219 >= (short)uVar473) * uVar473;
        uVar477 = ((short)uVar248 < (short)uVar476) * uVar248 |
                  ((short)uVar248 >= (short)uVar476) * uVar476;
        uVar481 = ((short)uVar255 < (short)uVar256) * uVar255 |
                  ((short)uVar255 >= (short)uVar256) * uVar256;
        uVar530 = ((short)uVar263 < (short)uVar264) * uVar263 |
                  ((short)uVar263 >= (short)uVar264) * uVar264;
        uVar532 = ((short)uVar271 < (short)uVar272) * uVar271 |
                  ((short)uVar271 >= (short)uVar272) * uVar272;
        uVar202 = ((short)uVar279 < (short)uVar280) * uVar279 |
                  ((short)uVar279 >= (short)uVar280) * uVar280;
        uVar127 = ((short)uVar288 < (short)uVar289) * uVar288 |
                  ((short)uVar288 >= (short)uVar289) * uVar289;
        uVar214 = ((short)uVar296 < (short)uVar297) * uVar296 |
                  ((short)uVar296 >= (short)uVar297) * uVar297;
        uVar219 = uVar219 & 0xbfff;
        uVar248 = uVar248 & 0xbfff;
        uVar255 = uVar255 & 0xbfff;
        uVar263 = uVar263 & 0xbfff;
        uVar271 = uVar271 & 0xbfff;
        uVar279 = uVar279 & 0xbfff;
        uVar288 = uVar288 & 0xbfff;
        uVar296 = uVar296 & 0xbfff;
        uVar473 = uVar473 & 0xbfff;
        uVar476 = uVar476 & 0xbfff;
        uVar256 = uVar256 & 0xbfff;
        uVar264 = uVar264 & 0xbfff;
        uVar272 = uVar272 & 0xbfff;
        uVar280 = uVar280 & 0xbfff;
        uVar289 = uVar289 & 0xbfff;
        uVar297 = uVar297 & 0xbfff;
        uVar245 = ((short)uVar473 < (short)uVar219) * uVar219 |
                  ((short)uVar473 >= (short)uVar219) * uVar473;
        uVar396 = ((short)uVar476 < (short)uVar248) * uVar248 |
                  ((short)uVar476 >= (short)uVar248) * uVar476;
        uVar267 = ((short)uVar256 < (short)uVar255) * uVar255 |
                  ((short)uVar256 >= (short)uVar255) * uVar256;
        uVar415 = ((short)uVar264 < (short)uVar263) * uVar263 |
                  ((short)uVar264 >= (short)uVar263) * uVar264;
        uVar292 = ((short)uVar272 < (short)uVar271) * uVar271 |
                  ((short)uVar272 >= (short)uVar271) * uVar272;
        uVar445 = ((short)uVar280 < (short)uVar279) * uVar279 |
                  ((short)uVar280 >= (short)uVar279) * uVar280;
        uVar451 = ((short)uVar289 < (short)uVar288) * uVar288 |
                  ((short)uVar289 >= (short)uVar288) * uVar289;
        uVar457 = ((short)uVar297 < (short)uVar296) * uVar296 |
                  ((short)uVar297 >= (short)uVar296) * uVar297;
        uVar134 = ((short)uVar303 < (short)uVar459) * uVar303 |
                  ((short)uVar303 >= (short)uVar459) * uVar459;
        uVar220 = ((short)uVar321 < (short)uVar470) * uVar321 |
                  ((short)uVar321 >= (short)uVar470) * uVar470;
        uVar326 = ((short)uVar325 < (short)uVar472) * uVar325 |
                  ((short)uVar325 >= (short)uVar472) * uVar472;
        uVar331 = ((short)uVar330 < (short)uVar475) * uVar330 |
                  ((short)uVar330 >= (short)uVar475) * uVar475;
        uVar141 = ((short)uVar335 < (short)uVar478) * uVar335 |
                  ((short)uVar335 >= (short)uVar478) * uVar478;
        uVar249 = ((short)uVar340 < (short)uVar480) * uVar340 |
                  ((short)uVar340 >= (short)uVar480) * uVar480;
        uVar347 = ((short)uVar345 < (short)uVar482) * uVar345 |
                  ((short)uVar345 >= (short)uVar482) * uVar482;
        uVar353 = ((short)uVar351 < (short)uVar484) * uVar351 |
                  ((short)uVar351 >= (short)uVar484) * uVar484;
        uVar303 = uVar303 & 0xbfff;
        uVar321 = uVar321 & 0xbfff;
        uVar325 = uVar325 & 0xbfff;
        uVar330 = uVar330 & 0xbfff;
        uVar335 = uVar335 & 0xbfff;
        uVar340 = uVar340 & 0xbfff;
        uVar345 = uVar345 & 0xbfff;
        uVar351 = uVar351 & 0xbfff;
        uVar459 = uVar459 & 0xbfff;
        uVar470 = uVar470 & 0xbfff;
        uVar472 = uVar472 & 0xbfff;
        uVar475 = uVar475 & 0xbfff;
        uVar478 = uVar478 & 0xbfff;
        uVar480 = uVar480 & 0xbfff;
        uVar482 = uVar482 & 0xbfff;
        uVar484 = uVar484 & 0xbfff;
        uVar474 = ((short)uVar459 < (short)uVar303) * uVar303 |
                  ((short)uVar459 >= (short)uVar303) * uVar459;
        uVar479 = ((short)uVar470 < (short)uVar321) * uVar321 |
                  ((short)uVar470 >= (short)uVar321) * uVar470;
        uVar529 = ((short)uVar472 < (short)uVar325) * uVar325 |
                  ((short)uVar472 >= (short)uVar325) * uVar472;
        uVar531 = ((short)uVar475 < (short)uVar330) * uVar330 |
                  ((short)uVar475 >= (short)uVar330) * uVar475;
        uVar535 = ((short)uVar478 < (short)uVar335) * uVar335 |
                  ((short)uVar478 >= (short)uVar335) * uVar478;
        uVar282 = ((short)uVar480 < (short)uVar340) * uVar340 |
                  ((short)uVar480 >= (short)uVar340) * uVar480;
        uVar208 = ((short)uVar482 < (short)uVar345) * uVar345 |
                  ((short)uVar482 >= (short)uVar345) * uVar482;
        uVar299 = ((short)uVar484 < (short)uVar351) * uVar351 |
                  ((short)uVar484 >= (short)uVar351) * uVar484;
        uVar148 = ((short)uVar216 < (short)uVar458) * uVar216 |
                  ((short)uVar216 >= (short)uVar458) * uVar458;
        uVar155 = ((short)uVar389 < (short)uVar477) * uVar389 |
                  ((short)uVar389 >= (short)uVar477) * uVar477;
        uVar473 = ((short)uVar259 < (short)uVar481) * uVar259 |
                  ((short)uVar259 >= (short)uVar481) * uVar481;
        uVar476 = ((short)uVar408 < (short)uVar530) * uVar408 |
                  ((short)uVar408 >= (short)uVar530) * uVar530;
        uVar532 = ((short)uVar284 < (short)uVar532) * uVar284 |
                  ((short)uVar284 >= (short)uVar532) * uVar532;
        uVar202 = ((short)uVar429 < (short)uVar202) * uVar429 |
                  ((short)uVar429 >= (short)uVar202) * uVar202;
        uVar127 = ((short)uVar447 < (short)uVar127) * uVar447 |
                  ((short)uVar447 >= (short)uVar127) * uVar127;
        uVar214 = ((short)uVar453 < (short)uVar214) * uVar453 |
                  ((short)uVar453 >= (short)uVar214) * uVar214;
        uVar216 = uVar216 & 0xbfff;
        uVar389 = uVar389 & 0xbfff;
        uVar259 = uVar259 & 0xbfff;
        uVar408 = uVar408 & 0xbfff;
        uVar284 = uVar284 & 0xbfff;
        uVar429 = uVar429 & 0xbfff;
        uVar447 = uVar447 & 0xbfff;
        uVar453 = uVar453 & 0xbfff;
        uVar458 = ((short)uVar216 < (short)uVar245) * uVar245 |
                  ((short)uVar216 >= (short)uVar245) * uVar216;
        uVar477 = ((short)uVar389 < (short)uVar396) * uVar396 |
                  ((short)uVar389 >= (short)uVar396) * uVar389;
        uVar481 = ((short)uVar259 < (short)uVar267) * uVar267 |
                  ((short)uVar259 >= (short)uVar267) * uVar259;
        uVar530 = ((short)uVar408 < (short)uVar415) * uVar415 |
                  ((short)uVar408 >= (short)uVar415) * uVar408;
        uVar284 = ((short)uVar284 < (short)uVar292) * uVar292 |
                  ((short)uVar284 >= (short)uVar292) * uVar284;
        uVar292 = ((short)uVar429 < (short)uVar445) * uVar445 |
                  ((short)uVar429 >= (short)uVar445) * uVar429;
        uVar429 = ((short)uVar447 < (short)uVar451) * uVar451 |
                  ((short)uVar447 >= (short)uVar451) * uVar447;
        uVar445 = ((short)uVar453 < (short)uVar457) * uVar457 |
                  ((short)uVar453 >= (short)uVar457) * uVar453;
        uVar134 = ((short)uVar471 < (short)uVar134) * uVar471 |
                  ((short)uVar471 >= (short)uVar134) * uVar134;
        uVar220 = ((short)uVar526 < (short)uVar220) * uVar526 |
                  ((short)uVar526 >= (short)uVar220) * uVar220;
        uVar326 = ((short)uVar534 < (short)uVar326) * uVar534 |
                  ((short)uVar534 >= (short)uVar326) * uVar326;
        uVar331 = ((short)uVar129 < (short)uVar331) * uVar129 |
                  ((short)uVar129 >= (short)uVar331) * uVar331;
        uVar141 = ((short)uVar136 < (short)uVar141) * uVar136 |
                  ((short)uVar136 >= (short)uVar141) * uVar141;
        uVar249 = ((short)uVar143 < (short)uVar249) * uVar143 |
                  ((short)uVar143 >= (short)uVar249) * uVar249;
        uVar347 = ((short)uVar150 < (short)uVar347) * uVar150 |
                  ((short)uVar150 >= (short)uVar347) * uVar347;
        uVar353 = ((short)uVar157 < (short)uVar353) * uVar157 |
                  ((short)uVar157 >= (short)uVar353) * uVar353;
        uVar471 = uVar471 & 0xbfff;
        uVar526 = uVar526 & 0xbfff;
        uVar534 = uVar534 & 0xbfff;
        uVar129 = uVar129 & 0xbfff;
        uVar136 = uVar136 & 0xbfff;
        uVar143 = uVar143 & 0xbfff;
        uVar150 = uVar150 & 0xbfff;
        uVar157 = uVar157 & 0xbfff;
        uVar216 = ((short)uVar471 < (short)uVar474) * uVar474 |
                  ((short)uVar471 >= (short)uVar474) * uVar471;
        uVar245 = ((short)uVar526 < (short)uVar479) * uVar479 |
                  ((short)uVar526 >= (short)uVar479) * uVar526;
        uVar389 = ((short)uVar534 < (short)uVar529) * uVar529 |
                  ((short)uVar534 >= (short)uVar529) * uVar534;
        uVar396 = ((short)uVar129 < (short)uVar531) * uVar531 |
                  ((short)uVar129 >= (short)uVar531) * uVar129;
        uVar259 = ((short)uVar136 < (short)uVar535) * uVar535 |
                  ((short)uVar136 >= (short)uVar535) * uVar136;
        uVar267 = ((short)uVar143 < (short)uVar282) * uVar282 |
                  ((short)uVar143 >= (short)uVar282) * uVar143;
        uVar408 = ((short)uVar150 < (short)uVar208) * uVar208 |
                  ((short)uVar150 >= (short)uVar208) * uVar150;
        uVar415 = ((short)uVar157 < (short)uVar299) * uVar299 |
                  ((short)uVar157 >= (short)uVar299) * uVar157;
        uVar447 = ((short)uVar365 < (short)uVar148) * uVar365 |
                  ((short)uVar365 >= (short)uVar148) * uVar148;
        uVar451 = ((short)uVar251 < (short)uVar155) * uVar251 |
                  ((short)uVar251 >= (short)uVar155) * uVar155;
        uVar453 = ((short)uVar402 < (short)uVar473) * uVar402 |
                  ((short)uVar402 >= (short)uVar473) * uVar473;
        uVar457 = ((short)uVar275 < (short)uVar476) * uVar275 |
                  ((short)uVar275 >= (short)uVar476) * uVar476;
        uVar471 = ((short)uVar422 < (short)uVar532) * uVar422 |
                  ((short)uVar422 >= (short)uVar532) * uVar532;
        uVar474 = ((short)uVar435 < (short)uVar202) * uVar435 |
                  ((short)uVar435 >= (short)uVar202) * uVar202;
        uVar479 = ((short)uVar449 < (short)uVar127) * uVar449 |
                  ((short)uVar449 >= (short)uVar127) * uVar127;
        uVar526 = ((short)uVar455 < (short)uVar214) * uVar455 |
                  ((short)uVar455 >= (short)uVar214) * uVar214;
        uVar365 = uVar365 & 0xbfff;
        uVar251 = uVar251 & 0xbfff;
        uVar402 = uVar402 & 0xbfff;
        uVar275 = uVar275 & 0xbfff;
        uVar422 = uVar422 & 0xbfff;
        uVar435 = uVar435 & 0xbfff;
        uVar449 = uVar449 & 0xbfff;
        uVar455 = uVar455 & 0xbfff;
        uVar365 = ((short)uVar365 < (short)uVar458) * uVar458 |
                  ((short)uVar365 >= (short)uVar458) * uVar365;
        uVar251 = ((short)uVar251 < (short)uVar477) * uVar477 |
                  ((short)uVar251 >= (short)uVar477) * uVar251;
        uVar402 = ((short)uVar402 < (short)uVar481) * uVar481 |
                  ((short)uVar402 >= (short)uVar481) * uVar402;
        uVar275 = ((short)uVar275 < (short)uVar530) * uVar530 |
                  ((short)uVar275 >= (short)uVar530) * uVar275;
        uVar284 = ((short)uVar422 < (short)uVar284) * uVar284 |
                  ((short)uVar422 >= (short)uVar284) * uVar422;
        uVar422 = ((short)uVar435 < (short)uVar292) * uVar292 |
                  ((short)uVar435 >= (short)uVar292) * uVar435;
        uVar292 = ((short)uVar449 < (short)uVar429) * uVar429 |
                  ((short)uVar449 >= (short)uVar429) * uVar449;
        uVar429 = ((short)uVar455 < (short)uVar445) * uVar445 |
                  ((short)uVar455 >= (short)uVar445) * uVar455;
        uVar486 = ((short)uVar365 < (short)uVar486) * uVar486 |
                  ((short)uVar365 >= (short)uVar486) * uVar365;
        uVar487 = ((short)uVar251 < (short)uVar487) * uVar487 |
                  ((short)uVar251 >= (short)uVar487) * uVar251;
        uVar92 = ((short)uVar402 < (short)uVar92) * uVar92 |
                 ((short)uVar402 >= (short)uVar92) * uVar402;
        uVar488 = ((short)uVar275 < (short)uVar488) * uVar488 |
                  ((short)uVar275 >= (short)uVar488) * uVar275;
        uVar489 = ((short)uVar284 < (short)uVar489) * uVar489 |
                  ((short)uVar284 >= (short)uVar489) * uVar284;
        uVar95 = ((short)uVar422 < (short)uVar95) * uVar95 |
                 ((short)uVar422 >= (short)uVar95) * uVar422;
        uVar490 = ((short)uVar292 < (short)uVar490) * uVar490 |
                  ((short)uVar292 >= (short)uVar490) * uVar292;
        uVar491 = ((short)uVar429 < (short)uVar491) * uVar491 |
                  ((short)uVar429 >= (short)uVar491) * uVar429;
        uVar275 = ((short)uVar367 < (short)uVar134) * uVar367 |
                  ((short)uVar367 >= (short)uVar134) * uVar134;
        uVar284 = ((short)uVar391 < (short)uVar220) * uVar391 |
                  ((short)uVar391 >= (short)uVar220) * uVar220;
        uVar422 = ((short)uVar398 < (short)uVar326) * uVar398 |
                  ((short)uVar398 >= (short)uVar326) * uVar326;
        uVar292 = ((short)uVar404 < (short)uVar331) * uVar404 |
                  ((short)uVar404 >= (short)uVar331) * uVar331;
        uVar429 = ((short)uVar410 < (short)uVar141) * uVar410 |
                  ((short)uVar410 >= (short)uVar141) * uVar141;
        uVar435 = ((short)uVar417 < (short)uVar249) * uVar417 |
                  ((short)uVar417 >= (short)uVar249) * uVar249;
        uVar445 = ((short)uVar424 < (short)uVar347) * uVar424 |
                  ((short)uVar424 >= (short)uVar347) * uVar347;
        uVar449 = ((short)uVar431 < (short)uVar353) * uVar431 |
                  ((short)uVar431 >= (short)uVar353) * uVar353;
        uVar367 = uVar367 & 0xbfff;
        uVar391 = uVar391 & 0xbfff;
        uVar398 = uVar398 & 0xbfff;
        uVar404 = uVar404 & 0xbfff;
        uVar410 = uVar410 & 0xbfff;
        uVar417 = uVar417 & 0xbfff;
        uVar424 = uVar424 & 0xbfff;
        uVar431 = uVar431 & 0xbfff;
        uVar216 = ((short)uVar367 < (short)uVar216) * uVar216 |
                  ((short)uVar367 >= (short)uVar216) * uVar367;
        uVar365 = ((short)uVar391 < (short)uVar245) * uVar245 |
                  ((short)uVar391 >= (short)uVar245) * uVar391;
        uVar245 = ((short)uVar398 < (short)uVar389) * uVar389 |
                  ((short)uVar398 >= (short)uVar389) * uVar398;
        uVar389 = ((short)uVar404 < (short)uVar396) * uVar396 |
                  ((short)uVar404 >= (short)uVar396) * uVar404;
        uVar251 = ((short)uVar410 < (short)uVar259) * uVar259 |
                  ((short)uVar410 >= (short)uVar259) * uVar410;
        uVar396 = ((short)uVar417 < (short)uVar267) * uVar267 |
                  ((short)uVar417 >= (short)uVar267) * uVar417;
        uVar259 = ((short)uVar424 < (short)uVar408) * uVar408 |
                  ((short)uVar424 >= (short)uVar408) * uVar424;
        uVar402 = ((short)uVar431 < (short)uVar415) * uVar415 |
                  ((short)uVar431 >= (short)uVar415) * uVar431;
        uVar283 = ((short)uVar216 < (short)uVar283) * uVar283 |
                  ((short)uVar216 >= (short)uVar283) * uVar216;
        uVar395 = ((short)uVar365 < (short)uVar395) * uVar395 |
                  ((short)uVar365 >= (short)uVar395) * uVar365;
        uVar291 = ((short)uVar245 < (short)uVar291) * uVar291 |
                  ((short)uVar245 >= (short)uVar291) * uVar245;
        uVar401 = ((short)uVar389 < (short)uVar401) * uVar401 |
                  ((short)uVar389 >= (short)uVar401) * uVar389;
        uVar216 = ((short)uVar251 < (short)uVar407) * uVar407 |
                  ((short)uVar251 >= (short)uVar407) * uVar251;
        uVar365 = ((short)uVar396 < (short)uVar414) * uVar414 |
                  ((short)uVar396 >= (short)uVar414) * uVar396;
        uVar245 = ((short)uVar259 < (short)uVar421) * uVar421 |
                  ((short)uVar259 >= (short)uVar421) * uVar259;
        uVar389 = ((short)uVar402 < (short)uVar428) * uVar428 |
                  ((short)uVar402 >= (short)uVar428) * uVar402;
        uVar251 = ((short)uVar215 < (short)uVar60) * uVar215 |
                  ((short)uVar215 >= (short)uVar60) * uVar60;
        uVar396 = ((short)uVar244 < (short)uVar81) * uVar244 |
                  ((short)uVar244 >= (short)uVar81) * uVar81;
        uVar259 = ((short)uVar250 < (short)uVar83) * uVar250 |
                  ((short)uVar250 >= (short)uVar83) * uVar83;
        uVar402 = ((short)uVar364 < (short)uVar85) * uVar364 |
                  ((short)uVar364 >= (short)uVar85) * uVar85;
        uVar267 = ((short)uVar258 < (short)uVar87) * uVar258 |
                  ((short)uVar258 >= (short)uVar87) * uVar87;
        uVar408 = ((short)uVar266 < (short)uVar89) * uVar266 |
                  ((short)uVar266 >= (short)uVar89) * uVar89;
        uVar415 = ((short)uVar388 < (short)uVar91) * uVar388 |
                  ((short)uVar388 >= (short)uVar91) * uVar91;
        uVar455 = ((short)uVar274 < (short)uVar94) * uVar274 |
                  ((short)uVar274 >= (short)uVar94) * uVar94;
        uVar215 = uVar215 & 0xbfff;
        uVar244 = uVar244 & 0xbfff;
        uVar250 = uVar250 & 0xbfff;
        uVar364 = uVar364 & 0xbfff;
        uVar258 = uVar258 & 0xbfff;
        uVar266 = uVar266 & 0xbfff;
        uVar388 = uVar388 & 0xbfff;
        uVar274 = uVar274 & 0xbfff;
        uVar60 = uVar60 & 0xbfff;
        uVar81 = uVar81 & 0xbfff;
        uVar83 = uVar83 & 0xbfff;
        uVar85 = uVar85 & 0xbfff;
        uVar87 = uVar87 & 0xbfff;
        uVar89 = uVar89 & 0xbfff;
        uVar91 = uVar91 & 0xbfff;
        uVar94 = uVar94 & 0xbfff;
        uVar60 = ((short)uVar60 < (short)uVar215) * uVar215 |
                 ((short)uVar60 >= (short)uVar215) * uVar60;
        uVar81 = ((short)uVar81 < (short)uVar244) * uVar244 |
                 ((short)uVar81 >= (short)uVar244) * uVar81;
        uVar83 = ((short)uVar83 < (short)uVar250) * uVar250 |
                 ((short)uVar83 >= (short)uVar250) * uVar83;
        uVar85 = ((short)uVar85 < (short)uVar364) * uVar364 |
                 ((short)uVar85 >= (short)uVar364) * uVar85;
        uVar87 = ((short)uVar87 < (short)uVar258) * uVar258 |
                 ((short)uVar87 >= (short)uVar258) * uVar87;
        uVar89 = ((short)uVar89 < (short)uVar266) * uVar266 |
                 ((short)uVar89 >= (short)uVar266) * uVar89;
        uVar91 = ((short)uVar91 < (short)uVar388) * uVar388 |
                 ((short)uVar91 >= (short)uVar388) * uVar91;
        uVar94 = ((short)uVar94 < (short)uVar274) * uVar274 |
                 ((short)uVar94 >= (short)uVar274) * uVar94;
        uVar407 = ((short)uVar60 < (short)uVar486) * uVar486 |
                  ((short)uVar60 >= (short)uVar486) * uVar60;
        uVar414 = ((short)uVar81 < (short)uVar487) * uVar487 |
                  ((short)uVar81 >= (short)uVar487) * uVar81;
        uVar421 = ((short)uVar83 < (short)uVar92) * uVar92 |
                  ((short)uVar83 >= (short)uVar92) * uVar83;
        uVar428 = ((short)uVar85 < (short)uVar488) * uVar488 |
                  ((short)uVar85 >= (short)uVar488) * uVar85;
        uVar215 = ((short)uVar87 < (short)uVar489) * uVar489 |
                  ((short)uVar87 >= (short)uVar489) * uVar87;
        uVar244 = ((short)uVar89 < (short)uVar95) * uVar95 |
                  ((short)uVar89 >= (short)uVar95) * uVar89;
        uVar250 = ((short)uVar91 < (short)uVar490) * uVar490 |
                  ((short)uVar91 >= (short)uVar490) * uVar91;
        uVar364 = ((short)uVar94 < (short)uVar491) * uVar491 |
                  ((short)uVar94 >= (short)uVar491) * uVar94;
        auVar243._0_2_ =
             ((short)uVar368 < (short)local_128) * uVar368 |
             ((short)uVar368 >= (short)local_128) * local_128;
        auVar243._2_2_ =
             ((short)uVar392 < (short)uStack_126) * uVar392 |
             ((short)uVar392 >= (short)uStack_126) * uStack_126;
        auVar243._4_2_ =
             ((short)uVar399 < (short)uStack_124) * uVar399 |
             ((short)uVar399 >= (short)uStack_124) * uStack_124;
        auVar243._6_2_ =
             ((short)uVar405 < (short)uStack_122) * uVar405 |
             ((short)uVar405 >= (short)uStack_122) * uStack_122;
        auVar243._8_2_ =
             ((short)uVar411 < (short)uStack_120) * uVar411 |
             ((short)uVar411 >= (short)uStack_120) * uStack_120;
        auVar243._10_2_ =
             ((short)uVar418 < (short)uStack_11e) * uVar418 |
             ((short)uVar418 >= (short)uStack_11e) * uStack_11e;
        auVar243._12_2_ =
             ((short)uVar425 < (short)uStack_11c) * uVar425 |
             ((short)uVar425 >= (short)uStack_11c) * uStack_11c;
        auVar243._14_2_ =
             ((short)uVar432 < (short)uStack_11a) * uVar432 |
             ((short)uVar432 >= (short)uStack_11a) * uStack_11a;
        uVar368 = uVar368 & 0xbfff;
        uVar392 = uVar392 & 0xbfff;
        uVar399 = uVar399 & 0xbfff;
        uVar405 = uVar405 & 0xbfff;
        uVar411 = uVar411 & 0xbfff;
        uVar418 = uVar418 & 0xbfff;
        uVar425 = uVar425 & 0xbfff;
        uVar432 = uVar432 & 0xbfff;
        local_128 = local_128 & 0xbfff;
        uStack_126 = uStack_126 & 0xbfff;
        uStack_124 = uStack_124 & 0xbfff;
        uStack_122 = uStack_122 & 0xbfff;
        uStack_120 = uStack_120 & 0xbfff;
        uStack_11e = uStack_11e & 0xbfff;
        uStack_11c = uStack_11c & 0xbfff;
        uStack_11a = uStack_11a & 0xbfff;
        uVar60 = ((short)local_128 < (short)uVar368) * uVar368 |
                 ((short)local_128 >= (short)uVar368) * local_128;
        uVar81 = ((short)uStack_126 < (short)uVar392) * uVar392 |
                 ((short)uStack_126 >= (short)uVar392) * uStack_126;
        uVar83 = ((short)uStack_124 < (short)uVar399) * uVar399 |
                 ((short)uStack_124 >= (short)uVar399) * uStack_124;
        uVar85 = ((short)uStack_122 < (short)uVar405) * uVar405 |
                 ((short)uStack_122 >= (short)uVar405) * uStack_122;
        uVar87 = ((short)uStack_120 < (short)uVar411) * uVar411 |
                 ((short)uStack_120 >= (short)uVar411) * uStack_120;
        uVar89 = ((short)uStack_11e < (short)uVar418) * uVar418 |
                 ((short)uStack_11e >= (short)uVar418) * uStack_11e;
        uVar91 = ((short)uStack_11c < (short)uVar425) * uVar425 |
                 ((short)uStack_11c >= (short)uVar425) * uStack_11c;
        uVar94 = ((short)uStack_11a < (short)uVar432) * uVar432 |
                 ((short)uStack_11a >= (short)uVar432) * uStack_11a;
        uVar258 = ((short)uVar60 < (short)uVar283) * uVar283 |
                  ((short)uVar60 >= (short)uVar283) * uVar60;
        uVar266 = ((short)uVar81 < (short)uVar395) * uVar395 |
                  ((short)uVar81 >= (short)uVar395) * uVar81;
        uVar388 = ((short)uVar83 < (short)uVar291) * uVar291 |
                  ((short)uVar83 >= (short)uVar291) * uVar83;
        uVar274 = ((short)uVar85 < (short)uVar401) * uVar401 |
                  ((short)uVar85 >= (short)uVar401) * uVar85;
        uVar283 = ((short)uVar87 < (short)uVar216) * uVar216 |
                  ((short)uVar87 >= (short)uVar216) * uVar87;
        uVar395 = ((short)uVar89 < (short)uVar365) * uVar365 |
                  ((short)uVar89 >= (short)uVar365) * uVar89;
        uVar291 = ((short)uVar91 < (short)uVar245) * uVar245 |
                  ((short)uVar91 >= (short)uVar245) * uVar91;
        uVar401 = ((short)uVar94 < (short)uVar389) * uVar389 |
                  ((short)uVar94 >= (short)uVar389) * uVar94;
        uVar60 = ((short)uVar469 < (short)in_XMM9._0_2_) * uVar469 |
                 ((short)uVar469 >= (short)in_XMM9._0_2_) * in_XMM9._0_2_;
        uVar81 = ((short)uVar483 < (short)in_XMM9._2_2_) * uVar483 |
                 ((short)uVar483 >= (short)in_XMM9._2_2_) * in_XMM9._2_2_;
        uVar83 = ((short)uVar533 < (short)in_XMM9._4_2_) * uVar533 |
                 ((short)uVar533 >= (short)in_XMM9._4_2_) * in_XMM9._4_2_;
        uVar85 = ((short)uVar128 < (short)in_XMM9._6_2_) * uVar128 |
                 ((short)uVar128 >= (short)in_XMM9._6_2_) * in_XMM9._6_2_;
        uVar87 = ((short)uVar135 < (short)in_XMM9._8_2_) * uVar135 |
                 ((short)uVar135 >= (short)in_XMM9._8_2_) * in_XMM9._8_2_;
        uVar89 = ((short)uVar142 < (short)in_XMM9._10_2_) * uVar142 |
                 ((short)uVar142 >= (short)in_XMM9._10_2_) * in_XMM9._10_2_;
        uVar91 = ((short)uVar149 < (short)in_XMM9._12_2_) * uVar149 |
                 ((short)uVar149 >= (short)in_XMM9._12_2_) * in_XMM9._12_2_;
        uVar94 = ((short)uVar156 < (short)in_XMM9._14_2_) * uVar156 |
                 ((short)uVar156 >= (short)in_XMM9._14_2_) * in_XMM9._14_2_;
        uVar486 = ((short)uVar161 < (short)uVar369) * uVar161 |
                  ((short)uVar161 >= (short)uVar369) * uVar369;
        uVar487 = ((short)uVar182 < (short)uVar393) * uVar182 |
                  ((short)uVar182 >= (short)uVar393) * uVar393;
        uVar92 = ((short)uVar186 < (short)uVar257) * uVar186 |
                 ((short)uVar186 >= (short)uVar257) * uVar257;
        uVar488 = ((short)uVar191 < (short)uVar265) * uVar191 |
                  ((short)uVar191 >= (short)uVar265) * uVar265;
        uVar489 = ((short)uVar196 < (short)uVar412) * uVar196 |
                  ((short)uVar196 >= (short)uVar412) * uVar412;
        uVar95 = ((short)uVar201 < (short)uVar419) * uVar201 |
                 ((short)uVar201 >= (short)uVar419) * uVar419;
        uVar490 = ((short)uVar207 < (short)uVar426) * uVar207 |
                  ((short)uVar207 >= (short)uVar426) * uVar426;
        uVar491 = ((short)uVar213 < (short)uVar433) * uVar213 |
                  ((short)uVar213 >= (short)uVar433) * uVar433;
        uVar60 = ((short)uVar60 < (short)uVar447) * uVar60 |
                 ((short)uVar60 >= (short)uVar447) * uVar447;
        uVar81 = ((short)uVar81 < (short)uVar451) * uVar81 |
                 ((short)uVar81 >= (short)uVar451) * uVar451;
        uVar83 = ((short)uVar83 < (short)uVar453) * uVar83 |
                 ((short)uVar83 >= (short)uVar453) * uVar453;
        uVar85 = ((short)uVar85 < (short)uVar457) * uVar85 |
                 ((short)uVar85 >= (short)uVar457) * uVar457;
        uVar87 = ((short)uVar87 < (short)uVar471) * uVar87 |
                 ((short)uVar87 >= (short)uVar471) * uVar471;
        uVar89 = ((short)uVar89 < (short)uVar474) * uVar89 |
                 ((short)uVar89 >= (short)uVar474) * uVar474;
        uVar91 = ((short)uVar91 < (short)uVar479) * uVar91 |
                 ((short)uVar91 >= (short)uVar479) * uVar479;
        uVar94 = ((short)uVar94 < (short)uVar526) * uVar94 |
                 ((short)uVar94 >= (short)uVar526) * uVar526;
        uVar486 = ((short)uVar486 < (short)uVar275) * uVar486 |
                  ((short)uVar486 >= (short)uVar275) * uVar275;
        uVar487 = ((short)uVar487 < (short)uVar284) * uVar487 |
                  ((short)uVar487 >= (short)uVar284) * uVar284;
        uVar92 = ((short)uVar92 < (short)uVar422) * uVar92 |
                 ((short)uVar92 >= (short)uVar422) * uVar422;
        uVar488 = ((short)uVar488 < (short)uVar292) * uVar488 |
                  ((short)uVar488 >= (short)uVar292) * uVar292;
        uVar489 = ((short)uVar489 < (short)uVar429) * uVar489 |
                  ((short)uVar489 >= (short)uVar429) * uVar429;
        uVar95 = ((short)uVar95 < (short)uVar435) * uVar95 |
                 ((short)uVar95 >= (short)uVar435) * uVar435;
        uVar490 = ((short)uVar490 < (short)uVar445) * uVar490 |
                  ((short)uVar490 >= (short)uVar445) * uVar445;
        uVar491 = ((short)uVar491 < (short)uVar449) * uVar491 |
                  ((short)uVar491 >= (short)uVar449) * uVar449;
        uVar60 = ((short)uVar60 < (short)uVar251) * uVar60 |
                 ((short)uVar60 >= (short)uVar251) * uVar251;
        uVar81 = ((short)uVar81 < (short)uVar396) * uVar81 |
                 ((short)uVar81 >= (short)uVar396) * uVar396;
        uVar83 = ((short)uVar83 < (short)uVar259) * uVar83 |
                 ((short)uVar83 >= (short)uVar259) * uVar259;
        uVar85 = ((short)uVar85 < (short)uVar402) * uVar85 |
                 ((short)uVar85 >= (short)uVar402) * uVar402;
        uVar87 = ((short)uVar87 < (short)uVar267) * uVar87 |
                 ((short)uVar87 >= (short)uVar267) * uVar267;
        uVar89 = ((short)uVar89 < (short)uVar408) * uVar89 |
                 ((short)uVar89 >= (short)uVar408) * uVar408;
        uVar91 = ((short)uVar91 < (short)uVar415) * uVar91 |
                 ((short)uVar91 >= (short)uVar415) * uVar415;
        uVar94 = ((short)uVar94 < (short)uVar455) * uVar94 |
                 ((short)uVar94 >= (short)uVar455) * uVar455;
        uVar486 = ((short)uVar486 < (short)auVar243._0_2_) * uVar486 |
                  ((short)uVar486 >= (short)auVar243._0_2_) * auVar243._0_2_;
        uVar487 = ((short)uVar487 < (short)auVar243._2_2_) * uVar487 |
                  ((short)uVar487 >= (short)auVar243._2_2_) * auVar243._2_2_;
        uVar92 = ((short)uVar92 < (short)auVar243._4_2_) * uVar92 |
                 ((short)uVar92 >= (short)auVar243._4_2_) * auVar243._4_2_;
        uVar488 = ((short)uVar488 < (short)auVar243._6_2_) * uVar488 |
                  ((short)uVar488 >= (short)auVar243._6_2_) * auVar243._6_2_;
        uVar489 = ((short)uVar489 < (short)auVar243._8_2_) * uVar489 |
                  ((short)uVar489 >= (short)auVar243._8_2_) * auVar243._8_2_;
        uVar95 = ((short)uVar95 < (short)auVar243._10_2_) * uVar95 |
                 ((short)uVar95 >= (short)auVar243._10_2_) * auVar243._10_2_;
        uVar490 = ((short)uVar490 < (short)auVar243._12_2_) * uVar490 |
                  ((short)uVar490 >= (short)auVar243._12_2_) * auVar243._12_2_;
        uVar491 = ((short)uVar491 < (short)auVar243._14_2_) * uVar491 |
                  ((short)uVar491 >= (short)auVar243._14_2_) * auVar243._14_2_;
        auVar26 = psraw(auVar354,0xf);
        auVar27 = pmovsxbw(auVar243,0x808080808080808);
        auVar222._0_2_ = auVar354._0_2_ + auVar27._0_2_ + auVar26._0_2_;
        auVar222._2_2_ = auVar354._2_2_ + auVar27._2_2_ + auVar26._2_2_;
        auVar222._4_2_ = auVar354._4_2_ + auVar27._4_2_ + auVar26._4_2_;
        auVar222._6_2_ = auVar354._6_2_ + auVar27._6_2_ + auVar26._6_2_;
        auVar222._8_2_ = auVar354._8_2_ + auVar27._8_2_ + auVar26._8_2_;
        auVar222._10_2_ = auVar354._10_2_ + auVar27._10_2_ + auVar26._10_2_;
        auVar222._12_2_ = auVar354._12_2_ + auVar27._12_2_ + auVar26._12_2_;
        auVar222._14_2_ = auVar354._14_2_ + auVar27._14_2_ + auVar26._14_2_;
        auVar26 = psraw(auVar375,0xf);
        auVar380._0_2_ = auVar375._0_2_ + auVar27._0_2_ + auVar26._0_2_;
        auVar380._2_2_ = auVar375._2_2_ + auVar27._2_2_ + auVar26._2_2_;
        auVar380._4_2_ = auVar375._4_2_ + auVar27._4_2_ + auVar26._4_2_;
        auVar380._6_2_ = auVar375._6_2_ + auVar27._6_2_ + auVar26._6_2_;
        auVar380._8_2_ = auVar375._8_2_ + auVar27._8_2_ + auVar26._8_2_;
        auVar380._10_2_ = auVar375._10_2_ + auVar27._10_2_ + auVar26._10_2_;
        auVar380._12_2_ = auVar375._12_2_ + auVar27._12_2_ + auVar26._12_2_;
        auVar380._14_2_ = auVar375._14_2_ + auVar27._14_2_ + auVar26._14_2_;
        auVar26 = psraw(auVar222,4);
        sVar21 = auVar26._0_2_ + sVar21;
        sVar510 = auVar26._2_2_ + sVar510;
        sVar36 = auVar26._4_2_ + sVar36;
        sVar519 = auVar26._6_2_ + sVar519;
        sVar39 = auVar26._8_2_ + sVar39;
        sVar160 = auVar26._10_2_ + sVar160;
        sVar190 = auVar26._12_2_ + sVar190;
        sVar206 = auVar26._14_2_ + sVar206;
        uVar60 = (sVar21 < (short)uVar60) * uVar60 | (ushort)(sVar21 >= (short)uVar60) * sVar21;
        uVar81 = (sVar510 < (short)uVar81) * uVar81 | (ushort)(sVar510 >= (short)uVar81) * sVar510;
        uVar83 = (sVar36 < (short)uVar83) * uVar83 | (ushort)(sVar36 >= (short)uVar83) * sVar36;
        uVar85 = (sVar519 < (short)uVar85) * uVar85 | (ushort)(sVar519 >= (short)uVar85) * sVar519;
        uVar87 = (sVar39 < (short)uVar87) * uVar87 | (ushort)(sVar39 >= (short)uVar87) * sVar39;
        uVar89 = (sVar160 < (short)uVar89) * uVar89 | (ushort)(sVar160 >= (short)uVar89) * sVar160;
        uVar91 = (sVar190 < (short)uVar91) * uVar91 | (ushort)(sVar190 >= (short)uVar91) * sVar190;
        uVar94 = (sVar206 < (short)uVar94) * uVar94 | (ushort)(sVar206 >= (short)uVar94) * sVar206;
        auVar26 = psraw(auVar380,4);
        *(ushort *)((long)dest + 8) =
             ((short)uVar215 < (short)uVar87) * uVar215 | ((short)uVar215 >= (short)uVar87) * uVar87
        ;
        *(ushort *)((long)dest + 10) =
             ((short)uVar244 < (short)uVar89) * uVar244 | ((short)uVar244 >= (short)uVar89) * uVar89
        ;
        *(ushort *)((long)dest + 0xc) =
             ((short)uVar250 < (short)uVar91) * uVar250 | ((short)uVar250 >= (short)uVar91) * uVar91
        ;
        *(ushort *)((long)dest + 0xe) =
             ((short)uVar364 < (short)uVar94) * uVar364 | ((short)uVar364 >= (short)uVar94) * uVar94
        ;
        sVar41 = auVar26._0_2_ + sVar41;
        sVar47 = auVar26._2_2_ + sVar47;
        sVar49 = auVar26._4_2_ + sVar49;
        sVar51 = auVar26._6_2_ + sVar51;
        sVar53 = auVar26._8_2_ + sVar53;
        sVar55 = auVar26._10_2_ + sVar55;
        sVar57 = auVar26._12_2_ + sVar57;
        sVar59 = auVar26._14_2_ + sVar59;
        uVar87 = (sVar41 < (short)uVar486) * uVar486 | (ushort)(sVar41 >= (short)uVar486) * sVar41;
        uVar89 = (sVar47 < (short)uVar487) * uVar487 | (ushort)(sVar47 >= (short)uVar487) * sVar47;
        uVar91 = (sVar49 < (short)uVar92) * uVar92 | (ushort)(sVar49 >= (short)uVar92) * sVar49;
        uVar94 = (sVar51 < (short)uVar488) * uVar488 | (ushort)(sVar51 >= (short)uVar488) * sVar51;
        uVar215 = (sVar53 < (short)uVar489) * uVar489 | (ushort)(sVar53 >= (short)uVar489) * sVar53;
        uVar244 = (sVar55 < (short)uVar95) * uVar95 | (ushort)(sVar55 >= (short)uVar95) * sVar55;
        uVar250 = (sVar57 < (short)uVar490) * uVar490 | (ushort)(sVar57 >= (short)uVar490) * sVar57;
        uVar364 = (sVar59 < (short)uVar491) * uVar491 | (ushort)(sVar59 >= (short)uVar491) * sVar59;
        puVar1 = (ushort *)((long)dest + lVar10 * 2);
        *puVar1 = ((short)uVar407 < (short)uVar60) * uVar407 |
                  ((short)uVar407 >= (short)uVar60) * uVar60;
        puVar1[1] = ((short)uVar414 < (short)uVar81) * uVar414 |
                    ((short)uVar414 >= (short)uVar81) * uVar81;
        puVar1[2] = ((short)uVar421 < (short)uVar83) * uVar421 |
                    ((short)uVar421 >= (short)uVar83) * uVar83;
        puVar1[3] = ((short)uVar428 < (short)uVar85) * uVar428 |
                    ((short)uVar428 >= (short)uVar85) * uVar85;
        *(ushort *)((long)dest + lVar10 * 4 + 8) =
             ((short)uVar283 < (short)uVar215) * uVar283 |
             ((short)uVar283 >= (short)uVar215) * uVar215;
        *(ushort *)((long)dest + lVar10 * 4 + 10) =
             ((short)uVar395 < (short)uVar244) * uVar395 |
             ((short)uVar395 >= (short)uVar244) * uVar244;
        *(ushort *)((long)dest + lVar10 * 4 + 0xc) =
             ((short)uVar291 < (short)uVar250) * uVar291 |
             ((short)uVar291 >= (short)uVar250) * uVar250;
        *(ushort *)((long)dest + lVar10 * 4 + 0xe) =
             ((short)uVar401 < (short)uVar364) * uVar401 |
             ((short)uVar401 >= (short)uVar364) * uVar364;
        puVar1 = (ushort *)((long)dest + lVar10 * 6);
        *puVar1 = ((short)uVar258 < (short)uVar87) * uVar258 |
                  ((short)uVar258 >= (short)uVar87) * uVar87;
        puVar1[1] = ((short)uVar266 < (short)uVar89) * uVar266 |
                    ((short)uVar266 >= (short)uVar89) * uVar89;
        puVar1[2] = ((short)uVar388 < (short)uVar91) * uVar388 |
                    ((short)uVar388 >= (short)uVar91) * uVar91;
        puVar1[3] = ((short)uVar274 < (short)uVar94) * uVar274 |
                    ((short)uVar274 >= (short)uVar94) * uVar94;
        uVar9 = uVar9 + 4;
        in = in + 0x240;
        dest = (void *)((long)dest + lVar10 * 8);
      } while (uVar9 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_0)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}